

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O3

int main(void)

{
  uint64_t val;
  undefined1 auVar1 [16];
  uint3 uVar2;
  uint7 uVar3;
  undefined4 uVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  float fVar8;
  int iVar9;
  uint condition;
  byte *pbVar10;
  ulong uVar11;
  char *pcVar12;
  double dVar13;
  size_t sVar14;
  ulong uVar15;
  FILE *__stream;
  size_t sVar16;
  long lVar17;
  long lVar18;
  char cVar19;
  uint uVar20;
  int iVar21;
  char *begin;
  byte *pbVar22;
  mp_type *pmVar23;
  int64_t iVar24;
  char *pcVar25;
  char *pcVar26;
  size_t lim;
  char *pcVar27;
  char *begin_2;
  ulong uVar28;
  char **data_b;
  char *begin_1;
  mp_type *pmVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  char *local_590;
  char *local_588;
  char *local_580;
  size_t local_578;
  long local_570;
  long local_568;
  ulong local_560;
  char *d4;
  char local_550 [248];
  undefined1 local_458;
  undefined4 local_457;
  undefined1 local_453;
  undefined7 local_452;
  undefined4 uStack_44b;
  undefined1 local_447;
  undefined2 local_446;
  char mp_nums_a [16] [16];
  
  _plan(0x1b,true);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","main");
  test_uints();
  test_ints();
  _plan(0x1b,true);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","test_bools");
  buf[1] = -0x3d;
  d4 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("bool true",9,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(byte)buf[1]] == MP_BOOL) {
    iVar6 = 1;
    _ok(1,"mp_check_bool(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x12a,"mp_check_bool(true) == 0");
    if (buf[1] != -0x3d) {
      if (buf[1] != -0x3e) goto LAB_00112698;
      iVar6 = 0;
    }
    _ok(iVar6,"mp_decode_bool(&d2 COMPLEX(COMMA &ext_type)) == (true)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x12a,"mp_decode(mp_encode(true)) == true");
    pbVar22 = (byte *)(buf + 1);
    iVar24 = 1;
    do {
      pbVar10 = pbVar22 + 1;
      lVar17 = (long)""[*pbVar22];
      if (lVar17 < 0) {
        if (*pbVar22 == 0xd9) {
          pbVar10 = pbVar22 + (ulong)pbVar22[1] + 2;
        }
        else {
          if ((byte)""[*pbVar22] < 0xe1) {
            mp_nums_a[0][0] = (char)pbVar22;
            mp_nums_a[0][1] = (char)((ulong)pbVar22 >> 8);
            mp_nums_a[0][2] = (char)((ulong)pbVar22 >> 0x10);
            mp_nums_a[0][3] = (char)((ulong)pbVar22 >> 0x18);
            mp_nums_a[0]._4_4_ = (undefined4)((ulong)pbVar22 >> 0x20);
            mp_next_slowpath((char **)mp_nums_a,iVar24);
            pbVar10 = (byte *)CONCAT44(mp_nums_a[0]._4_4_,
                                       CONCAT13(mp_nums_a[0][3],
                                                CONCAT12(mp_nums_a[0][2],
                                                         CONCAT11(mp_nums_a[0][1],mp_nums_a[0][0])))
                                      );
            goto LAB_0010859c;
          }
          iVar24 = iVar24 - lVar17;
        }
      }
      else {
        pbVar10 = pbVar10 + lVar17;
      }
      bVar30 = 1 < iVar24;
      pbVar22 = pbVar10;
      iVar24 = iVar24 + -1;
    } while (bVar30);
    mp_nums_a[0][0] = (char)pbVar10;
    mp_nums_a[0][1] = (char)((ulong)pbVar10 >> 8);
    mp_nums_a[0][2] = (char)((ulong)pbVar10 >> 0x10);
    mp_nums_a[0][3] = (char)((ulong)pbVar10 >> 0x18);
    mp_nums_a[0]._4_4_ = (undefined4)((ulong)pbVar10 >> 0x20);
LAB_0010859c:
    iVar6 = mp_check(&d4,(char *)(pbVar10 + 1));
    iVar9 = 0;
    _ok((uint)(iVar6 == 0),"!mp_check(&d4, d3 + 1)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x12a,"mp_check(true)");
    _ok(1,"(d1 - data) == (1)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x12a,"len(mp_encode_bool(true)");
    _ok(1,"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x12a,"len(mp_decode_bool(true))");
    _ok((uint)((char *)CONCAT44(mp_nums_a[0]._4_4_,
                                CONCAT13(mp_nums_a[0][3],
                                         CONCAT12(mp_nums_a[0][2],
                                                  CONCAT11(mp_nums_a[0][1],mp_nums_a[0][0])))) ==
              buf + 2),"d1 == d3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x12a,"len(mp_next_bool(true))");
    _ok((uint)(d4 == buf + 2),"d1 == d4",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x12a,"len(mp_check_bool(true))");
    _ok(1,"mp_sizeof_bool(true) == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x12a,"mp_sizeof_bool(true)");
    _ok((uint)(buf[1] == -0x3d),"memcmp(data, (\"\\xc3\"), (1)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x12a,"mp_encode(true) == \"\\xc3\"");
    buf[1] = -0x3e;
    d4 = buf + 1;
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("bool false",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] == MP_BOOL) {
      _ok(1,"mp_check_bool(data, d1) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          299,"mp_check_bool(false) == 0");
      if (buf[1] != -0x3d) {
        if (buf[1] != -0x3e) {
LAB_00112698:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                        ,0xaf5,"bool mp_decode_bool(const char **)");
        }
        iVar9 = 1;
      }
      _ok(iVar9,"mp_decode_bool(&d2 COMPLEX(COMMA &ext_type)) == (false)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          299,"mp_decode(mp_encode(false)) == false");
      iVar24 = 1;
      pbVar22 = (byte *)(buf + 1);
      do {
        pbVar10 = pbVar22 + 1;
        lVar17 = (long)""[*pbVar22];
        if (lVar17 < 0) {
          if (*pbVar22 == 0xd9) {
            pbVar10 = pbVar22 + (ulong)pbVar22[1] + 2;
          }
          else {
            if ((byte)""[*pbVar22] < 0xe1) {
              mp_nums_a[0][0] = (char)pbVar22;
              mp_nums_a[0][1] = (char)((ulong)pbVar22 >> 8);
              mp_nums_a[0][2] = (char)((ulong)pbVar22 >> 0x10);
              mp_nums_a[0][3] = (char)((ulong)pbVar22 >> 0x18);
              mp_nums_a[0]._4_4_ = (undefined4)((ulong)pbVar22 >> 0x20);
              mp_next_slowpath((char **)mp_nums_a,iVar24);
              pbVar10 = (byte *)CONCAT44(mp_nums_a[0]._4_4_,
                                         CONCAT13(mp_nums_a[0][3],
                                                  CONCAT12(mp_nums_a[0][2],
                                                           CONCAT11(mp_nums_a[0][1],mp_nums_a[0][0])
                                                          )));
              goto LAB_001087f9;
            }
            iVar24 = iVar24 - lVar17;
          }
        }
        else {
          pbVar10 = pbVar10 + lVar17;
        }
        bVar30 = 1 < iVar24;
        iVar24 = iVar24 + -1;
        pbVar22 = pbVar10;
      } while (bVar30);
      mp_nums_a[0][0] = (char)pbVar10;
      mp_nums_a[0][1] = (char)((ulong)pbVar10 >> 8);
      mp_nums_a[0][2] = (char)((ulong)pbVar10 >> 0x10);
      mp_nums_a[0][3] = (char)((ulong)pbVar10 >> 0x18);
      mp_nums_a[0]._4_4_ = (undefined4)((ulong)pbVar10 >> 0x20);
LAB_001087f9:
      iVar6 = mp_check(&d4,(char *)(pbVar10 + 1));
      _ok((uint)(iVar6 == 0),"!mp_check(&d4, d3 + 1)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          299,"mp_check(false)");
      _ok(1,"(d1 - data) == (1)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          299,"len(mp_encode_bool(false)");
      _ok(1,"d1 == d2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          299,"len(mp_decode_bool(false))");
      _ok((uint)((char *)CONCAT44(mp_nums_a[0]._4_4_,
                                  CONCAT13(mp_nums_a[0][3],
                                           CONCAT12(mp_nums_a[0][2],
                                                    CONCAT11(mp_nums_a[0][1],mp_nums_a[0][0])))) ==
                buf + 2),"d1 == d3",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          299,"len(mp_next_bool(false))");
      _ok((uint)(d4 == buf + 2),"d1 == d4",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          299,"len(mp_check_bool(false))");
      _ok(1,"mp_sizeof_bool(false) == 1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          299,"mp_sizeof_bool(false)");
      _ok((uint)(buf[1] == -0x3e),"memcmp(data, (\"\\xc2\"), (1)) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          299,"mp_encode(false) == \"\\xc2\"");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fwrite("bool_safe",9,1,_stdout);
      fputc(10,_stdout);
      _ok(1,"-sz == (1)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x12d,"size after mp_encode_bool_safe(NULL, &sz)");
      _ok(1,"d == NULL",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x12d,"mp_encode_bool_safe(NULL, &sz)");
      buf[1] = -0x3d;
      _ok(1,"sz == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x12d,"size after mp_encode_bool_safe(buf, &sz)");
      _ok(1,"(d - data) == (1)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x12d,"len of mp_encode_bool_safe(buf, &sz)");
      _ok((uint)(buf[1] == -0x3d),"memcmp(data, (\"\\xc3\"), (1)) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x12d,"mp_encode_bool_safe(buf, &sz)");
      _ok(1,"sz == -1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x12d,"size after mp_encode_bool_safe(buf, &sz) overflow");
      _ok(1,"d == data",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x12d,"mp_encode_bool_safe(buf, &sz) overflow");
      buf[1] = -0x3d;
      _ok(1,"(d - data) == (1)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x12d,"len of mp_encode_bool_safe(buf, NULL)");
      _ok((uint)(buf[1] == -0x3d),"memcmp(data, (\"\\xc3\"), (1)) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x12d,"mp_encode_bool_safe(buf, NULL)");
      _space((FILE *)_stdout);
      printf("# *** %s: done ***\n","test_bools");
      check_plan();
      _plan(0x24,true);
      _space((FILE *)_stdout);
      printf("# *** %s ***\n","test_floats");
      buf[1] = -0x36;
      buf[2] = '?';
      buf[3] = -0x80;
      buf[4] = '\0';
      buf[5] = '\0';
      d4 = buf + 1;
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fwrite("float (float) 1.0",0x11,1,_stdout);
      fputc(10,_stdout);
      if (mp_type_hint[(byte)buf[1]] != MP_FLOAT) {
LAB_0011261c:
        __assert_fail("mp_typeof(*cur) == MP_FLOAT",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x94a,"ptrdiff_t mp_check_float(const char *, const char *)");
      }
      _ok(1,"mp_check_float(data, d1) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x139,"mp_check_float((float) 1.0) == 0");
      if (buf[1] == -0x36) {
        uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
        _ok(-(uint)((float)((uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                           CONCAT13(buf[5],uVar2) << 0x18) == 1.0) & 1,
            "mp_decode_float(&d2 COMPLEX(COMMA &ext_type)) == ((float) 1.0)",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x139,"mp_decode(mp_encode((float) 1.0)) == (float) 1.0");
        pbVar22 = (byte *)(buf + 1);
        iVar24 = 1;
        do {
          pbVar10 = pbVar22 + 1;
          lVar17 = (long)""[*pbVar22];
          if (lVar17 < 0) {
            if (*pbVar22 == 0xd9) {
              pbVar10 = pbVar22 + (ulong)pbVar22[1] + 2;
            }
            else {
              if ((byte)""[*pbVar22] < 0xe1) {
                mp_nums_a[0][0] = (char)pbVar22;
                mp_nums_a[0][1] = (char)((ulong)pbVar22 >> 8);
                mp_nums_a[0][2] = (char)((ulong)pbVar22 >> 0x10);
                mp_nums_a[0][3] = (char)((ulong)pbVar22 >> 0x18);
                mp_nums_a[0]._4_4_ = (undefined4)((ulong)pbVar22 >> 0x20);
                mp_next_slowpath((char **)mp_nums_a,iVar24);
                pbVar10 = (byte *)CONCAT44(mp_nums_a[0]._4_4_,
                                           CONCAT13(mp_nums_a[0][3],
                                                    CONCAT12(mp_nums_a[0][2],
                                                             CONCAT11(mp_nums_a[0][1],
                                                                      mp_nums_a[0][0]))));
                goto LAB_00108c4a;
              }
              iVar24 = iVar24 - lVar17;
            }
          }
          else {
            pbVar10 = pbVar10 + lVar17;
          }
          bVar30 = 1 < iVar24;
          pbVar22 = pbVar10;
          iVar24 = iVar24 + -1;
        } while (bVar30);
        mp_nums_a[0][0] = (char)pbVar10;
        mp_nums_a[0][1] = (char)((ulong)pbVar10 >> 8);
        mp_nums_a[0][2] = (char)((ulong)pbVar10 >> 0x10);
        mp_nums_a[0][3] = (char)((ulong)pbVar10 >> 0x18);
        mp_nums_a[0]._4_4_ = (undefined4)((ulong)pbVar10 >> 0x20);
LAB_00108c4a:
        iVar6 = mp_check(&d4,(char *)(pbVar10 + 5));
        _ok((uint)(iVar6 == 0),"!mp_check(&d4, d3 + 5)",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x139,"mp_check((float) 1.0)");
        _ok(1,"(d1 - data) == (5)",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x139,"len(mp_encode_float((float) 1.0)");
        _ok(1,"d1 == d2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x139,"len(mp_decode_float((float) 1.0))");
        _ok((uint)((char *)CONCAT44(mp_nums_a[0]._4_4_,
                                    CONCAT13(mp_nums_a[0][3],
                                             CONCAT12(mp_nums_a[0][2],
                                                      CONCAT11(mp_nums_a[0][1],mp_nums_a[0][0]))))
                  == buf + 6),"d1 == d3",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x139,"len(mp_next_float((float) 1.0))");
        _ok((uint)(d4 == buf + 6),"d1 == d4",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x139,"len(mp_check_float((float) 1.0))");
        _ok(1,"mp_sizeof_float((float) 1.0) == 5",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x139,"mp_sizeof_float((float) 1.0)");
        _ok((uint)(buf[5] == '\0' &&
                  CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0x803fca),
            "memcmp(data, (\"\\xca\\x3f\\x80\\x00\\x00\"), (5)) == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x139,"mp_encode((float) 1.0) == \"\\xca\\x3f\\x80\\x00\\x00\"");
        buf[1] = -0x36;
        buf[2] = '@';
        buf[3] = 'I';
        buf[4] = '\x0f';
        buf[5] = -0x24;
        d4 = buf + 1;
        _space((FILE *)_stdout);
        fwrite("# ",2,1,_stdout);
        fwrite("float (float) 3.141593",0x16,1,_stdout);
        fputc(10,_stdout);
        if (mp_type_hint[(byte)buf[1]] != MP_FLOAT) goto LAB_0011261c;
        _ok(1,"mp_check_float(data, d1) == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x13a,"mp_check_float((float) 3.141593) == 0");
        if (buf[1] == -0x36) {
          uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
          _ok(-(uint)((float)((uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                             CONCAT13(buf[5],uVar2) << 0x18) == 3.141593) & 1,
              "mp_decode_float(&d2 COMPLEX(COMMA &ext_type)) == ((float) 3.141593)",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x13a,"mp_decode(mp_encode((float) 3.141593)) == (float) 3.141593");
          pbVar22 = (byte *)(buf + 1);
          iVar24 = 1;
          do {
            pbVar10 = pbVar22 + 1;
            lVar17 = (long)""[*pbVar22];
            if (lVar17 < 0) {
              if (*pbVar22 == 0xd9) {
                pbVar10 = pbVar22 + (ulong)pbVar22[1] + 2;
              }
              else {
                if ((byte)""[*pbVar22] < 0xe1) {
                  mp_nums_a[0][0] = (char)pbVar22;
                  mp_nums_a[0][1] = (char)((ulong)pbVar22 >> 8);
                  mp_nums_a[0][2] = (char)((ulong)pbVar22 >> 0x10);
                  mp_nums_a[0][3] = (char)((ulong)pbVar22 >> 0x18);
                  mp_nums_a[0]._4_4_ = (undefined4)((ulong)pbVar22 >> 0x20);
                  mp_next_slowpath((char **)mp_nums_a,iVar24);
                  pbVar10 = (byte *)CONCAT44(mp_nums_a[0]._4_4_,
                                             CONCAT13(mp_nums_a[0][3],
                                                      CONCAT12(mp_nums_a[0][2],
                                                               CONCAT11(mp_nums_a[0][1],
                                                                        mp_nums_a[0][0]))));
                  goto LAB_00108ec4;
                }
                iVar24 = iVar24 - lVar17;
              }
            }
            else {
              pbVar10 = pbVar10 + lVar17;
            }
            bVar30 = 1 < iVar24;
            pbVar22 = pbVar10;
            iVar24 = iVar24 + -1;
          } while (bVar30);
          mp_nums_a[0][0] = (char)pbVar10;
          mp_nums_a[0][1] = (char)((ulong)pbVar10 >> 8);
          mp_nums_a[0][2] = (char)((ulong)pbVar10 >> 0x10);
          mp_nums_a[0][3] = (char)((ulong)pbVar10 >> 0x18);
          mp_nums_a[0]._4_4_ = (undefined4)((ulong)pbVar10 >> 0x20);
LAB_00108ec4:
          iVar6 = mp_check(&d4,(char *)(pbVar10 + 5));
          _ok((uint)(iVar6 == 0),"!mp_check(&d4, d3 + 5)",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x13a,"mp_check((float) 3.141593)");
          _ok(1,"(d1 - data) == (5)",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x13a,"len(mp_encode_float((float) 3.141593)");
          _ok(1,"d1 == d2",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x13a,"len(mp_decode_float((float) 3.141593))");
          _ok((uint)((char *)CONCAT44(mp_nums_a[0]._4_4_,
                                      CONCAT13(mp_nums_a[0][3],
                                               CONCAT12(mp_nums_a[0][2],
                                                        CONCAT11(mp_nums_a[0][1],mp_nums_a[0][0]))))
                    == buf + 6),"d1 == d3",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x13a,"len(mp_next_float((float) 3.141593))");
          _ok((uint)(d4 == buf + 6),"d1 == d4",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x13a,"len(mp_check_float((float) 3.141593))");
          _ok(1,"mp_sizeof_float((float) 3.141593) == 5",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x13a,"mp_sizeof_float((float) 3.141593)");
          _ok((uint)(buf[5] == -0x24 &&
                    CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0xf4940ca),
              "memcmp(data, (\"\\xca\\x40\\x49\\x0f\\xdc\"), (5)) == 0",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x13a,"mp_encode((float) 3.141593) == \"\\xca\\x40\\x49\\x0f\\xdc\"");
          buf[1] = -0x36;
          buf[2] = -2;
          buf[3] = -0x6a;
          buf[4] = 'v';
          buf[5] = -0x67;
          d4 = buf + 1;
          _space((FILE *)_stdout);
          fwrite("# ",2,1,_stdout);
          fwrite("float (float) -1e38f",0x14,1,_stdout);
          fputc(10,_stdout);
          if (mp_type_hint[(byte)buf[1]] != MP_FLOAT) goto LAB_0011261c;
          _ok(1,"mp_check_float(data, d1) == 0",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x13b,"mp_check_float((float) -1e38f) == 0");
          if (buf[1] == -0x36) {
            uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
            _ok(-(uint)((float)((uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8
                               | CONCAT13(buf[5],uVar2) << 0x18) == -1e+38) & 1,
                "mp_decode_float(&d2 COMPLEX(COMMA &ext_type)) == ((float) -1e38f)",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x13b,"mp_decode(mp_encode((float) -1e38f)) == (float) -1e38f");
            pbVar22 = (byte *)(buf + 1);
            iVar24 = 1;
            do {
              pbVar10 = pbVar22 + 1;
              lVar17 = (long)""[*pbVar22];
              if (lVar17 < 0) {
                if (*pbVar22 == 0xd9) {
                  pbVar10 = pbVar22 + (ulong)pbVar22[1] + 2;
                }
                else {
                  if ((byte)""[*pbVar22] < 0xe1) {
                    mp_nums_a[0][0] = (char)pbVar22;
                    mp_nums_a[0][1] = (char)((ulong)pbVar22 >> 8);
                    mp_nums_a[0][2] = (char)((ulong)pbVar22 >> 0x10);
                    mp_nums_a[0][3] = (char)((ulong)pbVar22 >> 0x18);
                    mp_nums_a[0]._4_4_ = (undefined4)((ulong)pbVar22 >> 0x20);
                    mp_next_slowpath((char **)mp_nums_a,iVar24);
                    pbVar10 = (byte *)CONCAT44(mp_nums_a[0]._4_4_,
                                               CONCAT13(mp_nums_a[0][3],
                                                        CONCAT12(mp_nums_a[0][2],
                                                                 CONCAT11(mp_nums_a[0][1],
                                                                          mp_nums_a[0][0]))));
                    goto LAB_0010913d;
                  }
                  iVar24 = iVar24 - lVar17;
                }
              }
              else {
                pbVar10 = pbVar10 + lVar17;
              }
              bVar30 = 1 < iVar24;
              pbVar22 = pbVar10;
              iVar24 = iVar24 + -1;
            } while (bVar30);
            mp_nums_a[0][0] = (char)pbVar10;
            mp_nums_a[0][1] = (char)((ulong)pbVar10 >> 8);
            mp_nums_a[0][2] = (char)((ulong)pbVar10 >> 0x10);
            mp_nums_a[0][3] = (char)((ulong)pbVar10 >> 0x18);
            mp_nums_a[0]._4_4_ = (undefined4)((ulong)pbVar10 >> 0x20);
LAB_0010913d:
            iVar6 = mp_check(&d4,(char *)(pbVar10 + 5));
            _ok((uint)(iVar6 == 0),"!mp_check(&d4, d3 + 5)",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x13b,"mp_check((float) -1e38f)");
            _ok(1,"(d1 - data) == (5)",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x13b,"len(mp_encode_float((float) -1e38f)");
            _ok(1,"d1 == d2",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x13b,"len(mp_decode_float((float) -1e38f))");
            _ok((uint)((char *)CONCAT44(mp_nums_a[0]._4_4_,
                                        CONCAT13(mp_nums_a[0][3],
                                                 CONCAT12(mp_nums_a[0][2],
                                                          CONCAT11(mp_nums_a[0][1],mp_nums_a[0][0]))
                                                )) == buf + 6),"d1 == d3",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x13b,"len(mp_next_float((float) -1e38f))");
            _ok((uint)(d4 == buf + 6),"d1 == d4",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x13b,"len(mp_check_float((float) -1e38f))");
            _ok(1,"mp_sizeof_float((float) -1e38f) == 5",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x13b,"mp_sizeof_float((float) -1e38f)");
            _ok((uint)(buf[5] == -0x67 &&
                      CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0x7696feca),
                "memcmp(data, (\"\\xca\\xfe\\x96\\x76\\x99\"), (5)) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x13b,"mp_encode((float) -1e38f) == \"\\xca\\xfe\\x96\\x76\\x99\"");
            _space((FILE *)_stdout);
            fwrite("# ",2,1,_stdout);
            fwrite("float_safe",10,1,_stdout);
            fputc(10,_stdout);
            _ok(1,"-sz == (5)",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x13d,"size after mp_encode_float_safe(NULL, &sz)");
            _ok(1,"d == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x13d,"mp_encode_float_safe(NULL, &sz)");
            buf[1] = -0x36;
            buf[2] = '@';
            buf[3] = 'I';
            buf[4] = '\x0f';
            buf[5] = -0x24;
            _ok(1,"sz == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x13d,"size after mp_encode_float_safe(buf, &sz)");
            _ok(1,"(d - data) == (5)",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x13d,"len of mp_encode_float_safe(buf, &sz)");
            _ok((uint)(buf[5] == -0x24 &&
                      CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0xf4940ca),
                "memcmp(data, (\"\\xca\\x40\\x49\\x0f\\xdc\"), (5)) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x13d,"mp_encode_float_safe(buf, &sz)");
            _ok(1,"sz == -1",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x13d,"size after mp_encode_float_safe(buf, &sz) overflow");
            _ok(1,"d == data",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x13d,"mp_encode_float_safe(buf, &sz) overflow");
            buf[1] = -0x36;
            buf[2] = '@';
            buf[3] = 'I';
            buf[4] = '\x0f';
            buf[5] = -0x24;
            _ok(1,"(d - data) == (5)",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x13d,"len of mp_encode_float_safe(buf, NULL)");
            _ok((uint)(buf[5] == -0x24 &&
                      CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0xf4940ca),
                "memcmp(data, (\"\\xca\\x40\\x49\\x0f\\xdc\"), (5)) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x13d,"mp_encode_float_safe(buf, NULL)");
            _space((FILE *)_stdout);
            printf("# *** %s: done ***\n","test_floats");
            check_plan();
            _plan(0x24,true);
            _space((FILE *)_stdout);
            printf("# *** %s ***\n","test_doubles");
            buf[1] = -0x35;
            buf[2] = '?';
            buf[3] = -0x10;
            buf[4] = '\0';
            buf[5] = '\0';
            buf[6] = '\0';
            buf[7] = '\0';
            buf[8] = '\0';
            buf[9] = '\0';
            d4 = buf + 1;
            _space((FILE *)_stdout);
            fwrite("# ",2,1,_stdout);
            fwrite("double (double) 1.0",0x13,1,_stdout);
            fputc(10,_stdout);
            if (mp_type_hint[(byte)buf[1]] != MP_DOUBLE) {
LAB_0011263b:
              __assert_fail("mp_typeof(*cur) == MP_DOUBLE",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                            ,0x952,"ptrdiff_t mp_check_double(const char *, const char *)");
            }
            _ok(1,"mp_check_double(data, d1) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x14a,"mp_check_double((double) 1.0) == 0");
            if (buf[1] == -0x35) {
              uVar3 = CONCAT16(buf[8],CONCAT15(buf[7],CONCAT14(buf[6],CONCAT13(buf[5],CONCAT12(buf[4
                                                  ],CONCAT11(buf[3],buf[2]))))));
              _ok(-(uint)((double)((ulong)(byte)buf[9] | ((ulong)uVar3 & 0xff000000000000) >> 0x28 |
                                   ((ulong)uVar3 & 0xff0000000000) >> 0x18 |
                                   ((ulong)uVar3 & 0xff00000000) >> 8 |
                                   ((ulong)uVar3 & 0xff000000) << 8 |
                                   ((ulong)uVar3 & 0xff0000) << 0x18 |
                                   ((ulong)uVar3 & 0xff00) << 0x28 | CONCAT17(buf[9],uVar3) << 0x38)
                         == 1.0) & 1,
                  "mp_decode_double(&d2 COMPLEX(COMMA &ext_type)) == ((double) 1.0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x14a,"mp_decode(mp_encode((double) 1.0)) == (double) 1.0");
              pbVar22 = (byte *)(buf + 1);
              iVar24 = 1;
              do {
                pbVar10 = pbVar22 + 1;
                lVar17 = (long)""[*pbVar22];
                if (lVar17 < 0) {
                  if (*pbVar22 == 0xd9) {
                    pbVar10 = pbVar22 + (ulong)pbVar22[1] + 2;
                  }
                  else {
                    if ((byte)""[*pbVar22] < 0xe1) {
                      mp_nums_a[0][0] = (char)pbVar22;
                      mp_nums_a[0][1] = (char)((ulong)pbVar22 >> 8);
                      mp_nums_a[0][2] = (char)((ulong)pbVar22 >> 0x10);
                      mp_nums_a[0][3] = (char)((ulong)pbVar22 >> 0x18);
                      mp_nums_a[0]._4_4_ = (undefined4)((ulong)pbVar22 >> 0x20);
                      mp_next_slowpath((char **)mp_nums_a,iVar24);
                      pbVar10 = (byte *)CONCAT44(mp_nums_a[0]._4_4_,
                                                 CONCAT13(mp_nums_a[0][3],
                                                          CONCAT12(mp_nums_a[0][2],
                                                                   CONCAT11(mp_nums_a[0][1],
                                                                            mp_nums_a[0][0]))));
                      goto LAB_001095e5;
                    }
                    iVar24 = iVar24 - lVar17;
                  }
                }
                else {
                  pbVar10 = pbVar10 + lVar17;
                }
                bVar30 = 1 < iVar24;
                pbVar22 = pbVar10;
                iVar24 = iVar24 + -1;
              } while (bVar30);
              mp_nums_a[0][0] = (char)pbVar10;
              mp_nums_a[0][1] = (char)((ulong)pbVar10 >> 8);
              mp_nums_a[0][2] = (char)((ulong)pbVar10 >> 0x10);
              mp_nums_a[0][3] = (char)((ulong)pbVar10 >> 0x18);
              mp_nums_a[0]._4_4_ = (undefined4)((ulong)pbVar10 >> 0x20);
LAB_001095e5:
              iVar6 = mp_check(&d4,(char *)(pbVar10 + 9));
              _ok((uint)(iVar6 == 0),"!mp_check(&d4, d3 + 9)",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x14a,"mp_check((double) 1.0)");
              _ok(1,"(d1 - data) == (9)",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x14a,"len(mp_encode_double((double) 1.0)");
              _ok(1,"d1 == d2",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x14a,"len(mp_decode_double((double) 1.0))");
              _ok((uint)((char *)CONCAT44(mp_nums_a[0]._4_4_,
                                          CONCAT13(mp_nums_a[0][3],
                                                   CONCAT12(mp_nums_a[0][2],
                                                            CONCAT11(mp_nums_a[0][1],mp_nums_a[0][0]
                                                                    )))) == buf + 10),"d1 == d3",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x14a,"len(mp_next_double((double) 1.0))");
              _ok((uint)(d4 == buf + 10),"d1 == d4",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x14a,"len(mp_check_double((double) 1.0))");
              _ok(1,"mp_sizeof_double((double) 1.0) == 9",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x14a,"mp_sizeof_double((double) 1.0)");
              _ok((uint)(buf[9] == '\0' &&
                        CONCAT17(buf[8],CONCAT16(buf[7],CONCAT15(buf[6],CONCAT14(buf[5],CONCAT13(buf
                                                  [4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1])))))))
                        == 0xf03fcb),
                  "memcmp(data, (\"\\xcb\\x3f\\xf0\\x00\\x00\\x00\\x00\\x00\\x00\"), (9)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x14a,
                  "mp_encode((double) 1.0) == \"\\xcb\\x3f\\xf0\\x00\\x00\\x00\\x00\\x00\\x00\"");
              buf[1] = -0x35;
              buf[2] = '@';
              buf[3] = '\t';
              buf[4] = '!';
              buf[5] = -5;
              buf[6] = 'T';
              buf[7] = 'D';
              buf[8] = '-';
              buf[9] = '\x18';
              d4 = buf + 1;
              _space((FILE *)_stdout);
              fwrite("# ",2,1,_stdout);
              fwrite("double (double) 3.141592653589793",0x21,1,_stdout);
              fputc(10,_stdout);
              if (mp_type_hint[(byte)buf[1]] != MP_DOUBLE) goto LAB_0011263b;
              _ok(1,"mp_check_double(data, d1) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x14c,"mp_check_double((double) 3.141592653589793) == 0");
              if (buf[1] == -0x35) {
                uVar3 = CONCAT16(buf[8],CONCAT15(buf[7],CONCAT14(buf[6],CONCAT13(buf[5],CONCAT12(buf
                                                  [4],CONCAT11(buf[3],buf[2]))))));
                _ok(-(uint)((double)((ulong)(byte)buf[9] | ((ulong)uVar3 & 0xff000000000000) >> 0x28
                                     | ((ulong)uVar3 & 0xff0000000000) >> 0x18 |
                                     ((ulong)uVar3 & 0xff00000000) >> 8 |
                                     ((ulong)uVar3 & 0xff000000) << 8 |
                                     ((ulong)uVar3 & 0xff0000) << 0x18 |
                                     ((ulong)uVar3 & 0xff00) << 0x28 |
                                    CONCAT17(buf[9],uVar3) << 0x38) == 3.141592653589793) & 1,
                    "mp_decode_double(&d2 COMPLEX(COMMA &ext_type)) == ((double) 3.141592653589793)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x14c,
                    "mp_decode(mp_encode((double) 3.141592653589793)) == (double) 3.141592653589793"
                   );
                pbVar22 = (byte *)(buf + 1);
                iVar24 = 1;
                do {
                  pbVar10 = pbVar22 + 1;
                  lVar17 = (long)""[*pbVar22];
                  if (lVar17 < 0) {
                    if (*pbVar22 == 0xd9) {
                      pbVar10 = pbVar22 + (ulong)pbVar22[1] + 2;
                    }
                    else {
                      if ((byte)""[*pbVar22] < 0xe1) {
                        mp_nums_a[0][0] = (char)pbVar22;
                        mp_nums_a[0][1] = (char)((ulong)pbVar22 >> 8);
                        mp_nums_a[0][2] = (char)((ulong)pbVar22 >> 0x10);
                        mp_nums_a[0][3] = (char)((ulong)pbVar22 >> 0x18);
                        mp_nums_a[0]._4_4_ = (undefined4)((ulong)pbVar22 >> 0x20);
                        mp_next_slowpath((char **)mp_nums_a,iVar24);
                        pbVar10 = (byte *)CONCAT44(mp_nums_a[0]._4_4_,
                                                   CONCAT13(mp_nums_a[0][3],
                                                            CONCAT12(mp_nums_a[0][2],
                                                                     CONCAT11(mp_nums_a[0][1],
                                                                              mp_nums_a[0][0]))));
                        goto LAB_0010986c;
                      }
                      iVar24 = iVar24 - lVar17;
                    }
                  }
                  else {
                    pbVar10 = pbVar10 + lVar17;
                  }
                  bVar30 = 1 < iVar24;
                  pbVar22 = pbVar10;
                  iVar24 = iVar24 + -1;
                } while (bVar30);
                mp_nums_a[0][0] = (char)pbVar10;
                mp_nums_a[0][1] = (char)((ulong)pbVar10 >> 8);
                mp_nums_a[0][2] = (char)((ulong)pbVar10 >> 0x10);
                mp_nums_a[0][3] = (char)((ulong)pbVar10 >> 0x18);
                mp_nums_a[0]._4_4_ = (undefined4)((ulong)pbVar10 >> 0x20);
LAB_0010986c:
                iVar6 = mp_check(&d4,(char *)(pbVar10 + 9));
                _ok((uint)(iVar6 == 0),"!mp_check(&d4, d3 + 9)",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x14c,"mp_check((double) 3.141592653589793)");
                _ok(1,"(d1 - data) == (9)",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x14c,"len(mp_encode_double((double) 3.141592653589793)");
                _ok(1,"d1 == d2",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x14c,"len(mp_decode_double((double) 3.141592653589793))");
                _ok((uint)((char *)CONCAT44(mp_nums_a[0]._4_4_,
                                            CONCAT13(mp_nums_a[0][3],
                                                     CONCAT12(mp_nums_a[0][2],
                                                              CONCAT11(mp_nums_a[0][1],
                                                                       mp_nums_a[0][0])))) ==
                          buf + 10),"d1 == d3",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x14c,"len(mp_next_double((double) 3.141592653589793))");
                _ok((uint)(d4 == buf + 10),"d1 == d4",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x14c,"len(mp_check_double((double) 3.141592653589793))");
                _ok(1,"mp_sizeof_double((double) 3.141592653589793) == 9",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x14c,"mp_sizeof_double((double) 3.141592653589793)");
                _ok((uint)(buf[9] == '\x18' &&
                          CONCAT17(buf[8],CONCAT16(buf[7],CONCAT15(buf[6],CONCAT14(buf[5],CONCAT13(
                                                  buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1])))))
                                                  )) == 0x2d4454fb210940cb),
                    "memcmp(data, (\"\\xcb\\x40\\x09\\x21\\xfb\\x54\\x44\\x2d\\x18\"), (9)) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x14c,
                    "mp_encode((double) 3.141592653589793) == \"\\xcb\\x40\\x09\\x21\\xfb\\x54\\x44\\x2d\\x18\""
                   );
                buf[1] = -0x35;
                buf[2] = -0x2c;
                buf[3] = '}';
                buf[4] = 'B';
                buf[5] = -0x52;
                buf[6] = -0x5e;
                buf[7] = -0x79;
                buf[8] = -0x61;
                buf[9] = '.';
                d4 = buf + 1;
                _space((FILE *)_stdout);
                fwrite("# ",2,1,_stdout);
                fwrite("double (double) -1e99",0x15,1,_stdout);
                fputc(10,_stdout);
                if (mp_type_hint[(byte)buf[1]] != MP_DOUBLE) goto LAB_0011263b;
                _ok(1,"mp_check_double(data, d1) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x14e,"mp_check_double((double) -1e99) == 0");
                if (buf[1] == -0x35) {
                  uVar3 = CONCAT16(buf[8],CONCAT15(buf[7],CONCAT14(buf[6],CONCAT13(buf[5],CONCAT12(
                                                  buf[4],CONCAT11(buf[3],buf[2]))))));
                  _ok(-(uint)((double)((ulong)(byte)buf[9] |
                                       ((ulong)uVar3 & 0xff000000000000) >> 0x28 |
                                       ((ulong)uVar3 & 0xff0000000000) >> 0x18 |
                                       ((ulong)uVar3 & 0xff00000000) >> 8 |
                                       ((ulong)uVar3 & 0xff000000) << 8 |
                                       ((ulong)uVar3 & 0xff0000) << 0x18 |
                                       ((ulong)uVar3 & 0xff00) << 0x28 |
                                      CONCAT17(buf[9],uVar3) << 0x38) == -1e+99) & 1,
                      "mp_decode_double(&d2 COMPLEX(COMMA &ext_type)) == ((double) -1e99)",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x14e,"mp_decode(mp_encode((double) -1e99)) == (double) -1e99");
                  iVar24 = 1;
                  pbVar22 = (byte *)(buf + 1);
                  do {
                    pbVar10 = pbVar22 + 1;
                    lVar17 = (long)""[*pbVar22];
                    if (lVar17 < 0) {
                      if (*pbVar22 == 0xd9) {
                        pbVar10 = pbVar22 + (ulong)pbVar22[1] + 2;
                      }
                      else {
                        if ((byte)""[*pbVar22] < 0xe1) {
                          mp_nums_a[0][0] = (char)pbVar22;
                          mp_nums_a[0][1] = (char)((ulong)pbVar22 >> 8);
                          mp_nums_a[0][2] = (char)((ulong)pbVar22 >> 0x10);
                          mp_nums_a[0][3] = (char)((ulong)pbVar22 >> 0x18);
                          mp_nums_a[0]._4_4_ = (undefined4)((ulong)pbVar22 >> 0x20);
                          mp_next_slowpath((char **)mp_nums_a,iVar24);
                          pbVar10 = (byte *)CONCAT44(mp_nums_a[0]._4_4_,
                                                     CONCAT13(mp_nums_a[0][3],
                                                              CONCAT12(mp_nums_a[0][2],
                                                                       CONCAT11(mp_nums_a[0][1],
                                                                                mp_nums_a[0][0]))));
                          goto LAB_00109afa;
                        }
                        iVar24 = iVar24 - lVar17;
                      }
                    }
                    else {
                      pbVar10 = pbVar10 + lVar17;
                    }
                    bVar30 = 1 < iVar24;
                    iVar24 = iVar24 + -1;
                    pbVar22 = pbVar10;
                  } while (bVar30);
                  mp_nums_a[0][0] = (char)pbVar10;
                  mp_nums_a[0][1] = (char)((ulong)pbVar10 >> 8);
                  mp_nums_a[0][2] = (char)((ulong)pbVar10 >> 0x10);
                  mp_nums_a[0][3] = (char)((ulong)pbVar10 >> 0x18);
                  mp_nums_a[0]._4_4_ = (undefined4)((ulong)pbVar10 >> 0x20);
LAB_00109afa:
                  iVar6 = mp_check(&d4,(char *)(pbVar10 + 9));
                  _ok((uint)(iVar6 == 0),"!mp_check(&d4, d3 + 9)",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x14e,"mp_check((double) -1e99)");
                  _ok(1,"(d1 - data) == (9)",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x14e,"len(mp_encode_double((double) -1e99)");
                  _ok(1,"d1 == d2",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x14e,"len(mp_decode_double((double) -1e99))");
                  _ok((uint)((char *)CONCAT44(mp_nums_a[0]._4_4_,
                                              CONCAT13(mp_nums_a[0][3],
                                                       CONCAT12(mp_nums_a[0][2],
                                                                CONCAT11(mp_nums_a[0][1],
                                                                         mp_nums_a[0][0])))) ==
                            buf + 10),"d1 == d3",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x14e,"len(mp_next_double((double) -1e99))");
                  _ok((uint)(d4 == buf + 10),"d1 == d4",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x14e,"len(mp_check_double((double) -1e99))");
                  _ok(1,"mp_sizeof_double((double) -1e99) == 9",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x14e,"mp_sizeof_double((double) -1e99)");
                  _ok((uint)(buf[9] == '.' &&
                            CONCAT17(buf[8],CONCAT16(buf[7],CONCAT15(buf[6],CONCAT14(buf[5],CONCAT13
                                                  (buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))))
                                                  ))) == -0x60785d51bd822b35),
                      "memcmp(data, (\"\\xcb\\xd4\\x7d\\x42\\xae\\xa2\\x87\\x9f\\x2e\"), (9)) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x14e,
                      "mp_encode((double) -1e99) == \"\\xcb\\xd4\\x7d\\x42\\xae\\xa2\\x87\\x9f\\x2e\""
                     );
                  _space((FILE *)_stdout);
                  uVar28 = 1;
                  fwrite("# ",2,1,_stdout);
                  fwrite("double_safe",0xb,1,_stdout);
                  fputc(10,_stdout);
                  _ok(1,"-sz == (9)",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x151,"size after mp_encode_double_safe(NULL, &sz)");
                  _ok(1,"d == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x151,"mp_encode_double_safe(NULL, &sz)");
                  buf[1] = -0x35;
                  buf[2] = '@';
                  buf[3] = '\t';
                  buf[4] = '!';
                  buf[5] = -5;
                  buf[6] = 'T';
                  buf[7] = 'D';
                  buf[8] = '-';
                  buf[9] = '\x18';
                  _ok(1,"sz == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x151,"size after mp_encode_double_safe(buf, &sz)");
                  _ok(1,"(d - data) == (9)",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x151,"len of mp_encode_double_safe(buf, &sz)");
                  _ok((uint)(buf[9] == '\x18' &&
                            CONCAT17(buf[8],CONCAT16(buf[7],CONCAT15(buf[6],CONCAT14(buf[5],CONCAT13
                                                  (buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))))
                                                  ))) == 0x2d4454fb210940cb),
                      "memcmp(data, (\"\\xcb\\x40\\x09\\x21\\xfb\\x54\\x44\\x2d\\x18\"), (9)) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x151,"mp_encode_double_safe(buf, &sz)");
                  _ok(1,"sz == -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x151,"size after mp_encode_double_safe(buf, &sz) overflow");
                  _ok(1,"d == data",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x151,"mp_encode_double_safe(buf, &sz) overflow");
                  buf[1] = -0x35;
                  buf[2] = '@';
                  buf[3] = '\t';
                  buf[4] = '!';
                  buf[5] = -5;
                  buf[6] = 'T';
                  buf[7] = 'D';
                  buf[8] = '-';
                  buf[9] = '\x18';
                  _ok(1,"(d - data) == (9)",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x151,"len of mp_encode_double_safe(buf, NULL)");
                  _ok((uint)(buf[9] == '\x18' &&
                            CONCAT17(buf[8],CONCAT16(buf[7],CONCAT15(buf[6],CONCAT14(buf[5],CONCAT13
                                                  (buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))))
                                                  ))) == 0x2d4454fb210940cb),
                      "memcmp(data, (\"\\xcb\\x40\\x09\\x21\\xfb\\x54\\x44\\x2d\\x18\"), (9)) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x151,"mp_encode_double_safe(buf, NULL)");
                  _space((FILE *)_stdout);
                  printf("# *** %s: done ***\n","test_doubles");
                  check_plan();
                  _plan(0xf,true);
                  _space((FILE *)_stdout);
                  printf("# *** %s ***\n","test_nils");
                  buf[1] = -0x40;
                  d4 = buf + 1;
                  _space((FILE *)_stdout);
                  fwrite("# ",2,1,_stdout);
                  fwrite("nil",3,1,_stdout);
                  fputc(10,_stdout);
                  if (buf[1] != -0x40) {
LAB_0011265a:
                    __assert_fail("c == 0xc0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                                  ,0xac7,"void mp_decode_nil(const char **)");
                  }
                  uVar11 = 0xc0;
                  pbVar22 = (byte *)(buf + 1);
                  do {
                    bVar5 = ""[uVar11];
                    lVar17 = 1;
                    if ((char)bVar5 < '\0') {
                      pbVar10 = pbVar22 + 1;
                      if ((char)uVar11 == -0x27) {
                        bVar5 = *pbVar10;
                        lVar17 = 2;
                        goto LAB_00109eef;
                      }
                      if (bVar5 < 0xe1) {
                        mp_nums_a[0][0] = (char)pbVar22;
                        mp_nums_a[0][1] = (char)((ulong)pbVar22 >> 8);
                        mp_nums_a[0][2] = (char)((ulong)pbVar22 >> 0x10);
                        mp_nums_a[0][3] = (char)((ulong)pbVar22 >> 0x18);
                        mp_nums_a[0]._4_4_ = (undefined4)((ulong)pbVar22 >> 0x20);
                        mp_next_slowpath((char **)mp_nums_a,uVar28);
                        pbVar10 = (byte *)CONCAT44(mp_nums_a[0]._4_4_,
                                                   CONCAT13(mp_nums_a[0][3],
                                                            CONCAT12(mp_nums_a[0][2],
                                                                     CONCAT11(mp_nums_a[0][1],
                                                                              mp_nums_a[0][0]))));
                        goto LAB_00109f39;
                      }
                      uVar11 = (ulong)(byte)~bVar5;
                    }
                    else {
LAB_00109eef:
                      pbVar10 = pbVar22 + (ulong)bVar5 + lVar17;
                      uVar11 = 0xffffffffffffffff;
                      if (uVar28 < 2) goto LAB_00109f31;
                    }
                    uVar28 = uVar28 + uVar11;
                    uVar11 = (ulong)*pbVar10;
                    pbVar22 = pbVar10;
                  } while( true );
                }
              }
            }
LAB_001125fd:
            __assert_fail("c == 0xcb",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                          ,0x987,"double mp_decode_double(const char **)");
          }
        }
      }
LAB_001125de:
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
  }
  __assert_fail("mp_typeof(*cur) == MP_BOOL",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                ,0xae7,"ptrdiff_t mp_check_bool(const char *, const char *)");
LAB_00112099:
  main_cold_23();
LAB_0011209e:
  pcVar27 = "Test value on step %d";
  main_cold_7();
  pmVar29 = (mp_type *)pcVar25;
LAB_001120a3:
  main_cold_1();
  goto LAB_0010d353;
LAB_00109f31:
  mp_nums_a[0][0] = (char)pbVar10;
  mp_nums_a[0][1] = (char)((ulong)pbVar10 >> 8);
  mp_nums_a[0][2] = (char)((ulong)pbVar10 >> 0x10);
  mp_nums_a[0][3] = (char)((ulong)pbVar10 >> 0x18);
  mp_nums_a[0]._4_4_ = (undefined4)((ulong)pbVar10 >> 0x20);
LAB_00109f39:
  iVar6 = mp_check(&d4,(char *)(pbVar10 + 1));
  _ok((uint)(iVar6 == 0),"!mp_check(&d4, d3 + 1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x164,
      "mp_check_nil()");
  uVar7 = 1;
  _ok(1,"(d1 - data) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x165,
      "len(mp_encode_nil() == 1");
  _ok(1,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x166,
      "len(mp_decode_nil()) == 1");
  _ok((uint)((char *)CONCAT44(mp_nums_a[0]._4_4_,
                              CONCAT13(mp_nums_a[0][3],
                                       CONCAT12(mp_nums_a[0][2],
                                                CONCAT11(mp_nums_a[0][1],mp_nums_a[0][0])))) ==
            buf + 2),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x167,
      "len(mp_next_nil()) == 1");
  _ok((uint)(d4 == buf + 2),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x168,
      "len(mp_check_nil()) == 1");
  _ok(1,"mp_sizeof_nil() == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x169,
      "mp_sizeof_nil() == 1");
  _ok(1,"-sz == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x16d,
      "size after mp_encode_nil_safe(NULL, &sz)");
  _ok(1,"d1 == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x16e,
      "mp_encode_nil_safe(NULL, &sz)");
  buf[1] = -0x40;
  _ok(1,"sz == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x172,
      "size after mp_encode_nil_safe(buf, &sz)");
  _ok(1,"d1 - data == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x173,
      "len of mp_encode_nil_safe(buf, &sz)");
  _ok((uint)(buf[1] == -0x40),"(unsigned char)data[0] == 0xc0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x174,
      "mp_encode_nil_safe(buf, &sz)");
  _ok(1,"sz == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x178,
      "size after mp_encode_nil_safe(buf, &sz) overflow");
  _ok(1,"d1 == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x179,
      "mp_encode_nil_safe(buf, &sz) overflow");
  buf[1] = -0x40;
  _ok(1,"d1 - data == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x17c,
      "len of mp_encode_nil_safe(buf, NULL)");
  _ok((uint)(buf[1] == -0x40),"(unsigned char)data[0] == 0xc0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x17d,
      "mp_encode_nil_safe(buf, NULL)");
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","test_nils");
  check_plan();
  _plan(0x57,true);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","test_strls");
  buf[1] = -0x60;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("strl 0x00U",10,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(uint)(byte)buf[1]] != MP_STR) goto LAB_00112505;
  if (((byte)buf[1] & 0xffffffe0) != 0xa0) {
    if (2 < (byte)(buf[1] + 0x27U)) goto LAB_00112524;
    uVar7 = (uint)((buf[1] & 3U) == 0);
  }
  iVar6 = 0;
  _ok(uVar7,"mp_check_strl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b5,
      "mp_check_strl(0x00U) == 0");
  uVar7 = (uint)(byte)buf[1];
  if (uVar7 != 0xdb) {
    if (uVar7 == 0xda) {
      uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
LAB_0010a2c0:
      iVar6 = 0;
      goto LAB_0010a2e4;
    }
    if (uVar7 == 0xd9) {
      uVar7 = (uint)(byte)buf[2];
      goto LAB_0010a2c0;
    }
    if (0xdf < (byte)(buf[1] + 0x40U)) {
      uVar7 = uVar7 & 0x1f;
      iVar6 = 1;
      goto LAB_0010a2e4;
    }
LAB_0011247e:
    main_cold_46();
LAB_00112483:
    main_cold_45();
LAB_00112488:
    main_cold_44();
LAB_0011248d:
    main_cold_43();
LAB_00112492:
    main_cold_42();
LAB_00112497:
    main_cold_41();
LAB_0011249c:
    main_cold_40();
LAB_001124a1:
    main_cold_39();
LAB_001124a6:
    main_cold_38();
LAB_001124ab:
    main_cold_37();
LAB_001124b0:
    main_cold_36();
LAB_001124b5:
    main_cold_35();
LAB_001124ba:
    main_cold_34();
LAB_001124bf:
    main_cold_17();
LAB_001124c4:
    main_cold_16();
LAB_001124c9:
    main_cold_15();
LAB_001124ce:
    main_cold_12();
LAB_001124d3:
    main_cold_22();
LAB_001124d8:
    main_cold_21();
LAB_001124dd:
    main_cold_20();
LAB_001124e2:
    main_cold_19();
LAB_001124e7:
    main_cold_14();
LAB_001124ec:
    main_cold_13();
LAB_001124f1:
    main_cold_11();
LAB_001124f6:
    main_cold_10();
LAB_001124fb:
    main_cold_9();
LAB_00112500:
    main_cold_8();
LAB_00112505:
    __assert_fail("mp_typeof(*cur) == MP_STR",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                  ,0xa30,"ptrdiff_t mp_check_strl(const char *, const char *)");
  }
  uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
  uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
          CONCAT13(buf[5],uVar2) << 0x18;
LAB_0010a2e4:
  _ok((uint)(uVar7 == 0),"mp_decode_strl(&d2 COMPLEX(COMMA &ext_type)) == (0x00U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b5,
      "mp_decode(mp_encode(0x00U)) == 0x00U");
  uVar7 = 1;
  _ok(1,"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b5,
      "len(mp_encode_strl(0x00U)");
  _ok(iVar6,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b5,
      "len(mp_decode_strl(0x00U))");
  _ok(1,"mp_sizeof_strl(0x00U) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b5,
      "mp_sizeof_strl(0x00U)");
  _ok((uint)(buf[1] == -0x60),"memcmp(data, (\"\\xa0\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b5,
      "mp_encode(0x00U) == \"\\xa0\"");
  buf[1] = -0x5f;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("strl 0x01U",10,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(uint)(byte)buf[1]] != MP_STR) goto LAB_00112505;
  if (((byte)buf[1] & 0xffffffe0) != 0xa0) {
    if (2 < (byte)(buf[1] + 0x27U)) goto LAB_00112524;
    uVar7 = (uint)((buf[1] & 3U) == 0);
  }
  iVar6 = 0;
  _ok(uVar7,"mp_check_strl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b6,
      "mp_check_strl(0x01U) == 0");
  uVar7 = (uint)(byte)buf[1];
  if (uVar7 == 0xdb) {
    uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
            CONCAT13(buf[5],uVar2) << 0x18;
  }
  else {
    if (uVar7 == 0xda) {
      uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    }
    else {
      if (uVar7 != 0xd9) {
        if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00112483;
        uVar7 = uVar7 & 0x1f;
        iVar6 = 1;
        goto LAB_0010a4a8;
      }
      uVar7 = (uint)(byte)buf[2];
    }
    iVar6 = 0;
  }
LAB_0010a4a8:
  _ok((uint)(uVar7 == 1),"mp_decode_strl(&d2 COMPLEX(COMMA &ext_type)) == (0x01U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b6,
      "mp_decode(mp_encode(0x01U)) == 0x01U");
  uVar7 = 1;
  _ok(1,"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b6,
      "len(mp_encode_strl(0x01U)");
  _ok(iVar6,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b6,
      "len(mp_decode_strl(0x01U))");
  _ok(1,"mp_sizeof_strl(0x01U) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b6,
      "mp_sizeof_strl(0x01U)");
  _ok((uint)(buf[1] == -0x5f),"memcmp(data, (\"\\xa1\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b6,
      "mp_encode(0x01U) == \"\\xa1\"");
  buf[1] = -0x42;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("strl 0x1eU",10,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(uint)(byte)buf[1]] != MP_STR) goto LAB_00112505;
  if (((byte)buf[1] & 0xffffffe0) != 0xa0) {
    if (2 < (byte)(buf[1] + 0x27U)) goto LAB_00112524;
    uVar7 = (uint)((buf[1] & 3U) == 0);
  }
  iVar6 = 0;
  _ok(uVar7,"mp_check_strl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b7,
      "mp_check_strl(0x1eU) == 0");
  uVar7 = (uint)(byte)buf[1];
  if (uVar7 == 0xdb) {
    uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
            CONCAT13(buf[5],uVar2) << 0x18;
  }
  else {
    if (uVar7 == 0xda) {
      uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    }
    else {
      if (uVar7 != 0xd9) {
        if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00112488;
        uVar7 = uVar7 & 0x1f;
        iVar6 = 1;
        goto LAB_0010a665;
      }
      uVar7 = (uint)(byte)buf[2];
    }
    iVar6 = 0;
  }
LAB_0010a665:
  _ok((uint)(uVar7 == 0x1e),"mp_decode_strl(&d2 COMPLEX(COMMA &ext_type)) == (0x1eU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b7,
      "mp_decode(mp_encode(0x1eU)) == 0x1eU");
  uVar7 = 1;
  _ok(1,"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b7,
      "len(mp_encode_strl(0x1eU)");
  _ok(iVar6,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b7,
      "len(mp_decode_strl(0x1eU))");
  _ok(1,"mp_sizeof_strl(0x1eU) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b7,
      "mp_sizeof_strl(0x1eU)");
  _ok((uint)(buf[1] == -0x42),"memcmp(data, (\"\\xbe\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b7,
      "mp_encode(0x1eU) == \"\\xbe\"");
  buf[1] = -0x41;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("strl 0x1fU",10,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(uint)(byte)buf[1]] != MP_STR) goto LAB_00112505;
  if (((byte)buf[1] & 0xffffffe0) != 0xa0) {
    if (2 < (byte)(buf[1] + 0x27U)) goto LAB_00112524;
    uVar7 = (uint)((buf[1] & 3U) == 0);
  }
  iVar6 = 0;
  _ok(uVar7,"mp_check_strl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b8,
      "mp_check_strl(0x1fU) == 0");
  uVar7 = (uint)(byte)buf[1];
  if (uVar7 == 0xdb) {
    uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
            CONCAT13(buf[5],uVar2) << 0x18;
  }
  else {
    if (uVar7 == 0xda) {
      uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    }
    else {
      if (uVar7 != 0xd9) {
        if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_0011248d;
        uVar7 = uVar7 & 0x1f;
        iVar6 = 1;
        goto LAB_0010a822;
      }
      uVar7 = (uint)(byte)buf[2];
    }
    iVar6 = 0;
  }
LAB_0010a822:
  uVar20 = 0;
  _ok((uint)(uVar7 == 0x1f),"mp_decode_strl(&d2 COMPLEX(COMMA &ext_type)) == (0x1fU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b8,
      "mp_decode(mp_encode(0x1fU)) == 0x1fU");
  _ok(1,"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b8,
      "len(mp_encode_strl(0x1fU)");
  _ok(iVar6,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b8,
      "len(mp_decode_strl(0x1fU))");
  _ok(1,"mp_sizeof_strl(0x1fU) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b8,
      "mp_sizeof_strl(0x1fU)");
  _ok((uint)(buf[1] == -0x41),"memcmp(data, (\"\\xbf\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1b8,
      "mp_encode(0x1fU) == \"\\xbf\"");
  buf[1] = -0x27;
  buf[2] = ' ';
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("strl 0x20U",10,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(uint)(byte)buf[1]] != MP_STR) goto LAB_00112505;
  if (((byte)buf[1] & 0xffffffe0) != 0xa0) {
    if (2 < (byte)(buf[1] + 0x27U)) goto LAB_00112524;
    uVar20 = (uint)((1 << (buf[1] & 3U) & 0xfffffffeU) == 2);
  }
  iVar6 = 0;
  _ok(uVar20,"mp_check_strl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1ba,
      "mp_check_strl(0x20U) == 0");
  uVar7 = (uint)(byte)buf[1];
  if (uVar7 == 0xdb) {
    uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
            CONCAT13(buf[5],uVar2) << 0x18;
  }
  else {
    if (uVar7 == 0xda) {
      uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    }
    else {
      if (uVar7 == 0xd9) {
        uVar7 = (uint)(byte)buf[2];
        iVar6 = 1;
        goto LAB_0010a9ea;
      }
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00112492;
      uVar7 = uVar7 & 0x1f;
    }
    iVar6 = 0;
  }
LAB_0010a9ea:
  uVar20 = 0;
  _ok((uint)(uVar7 == 0x20),"mp_decode_strl(&d2 COMPLEX(COMMA &ext_type)) == (0x20U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1ba,
      "mp_decode(mp_encode(0x20U)) == 0x20U");
  _ok(1,"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1ba,
      "len(mp_encode_strl(0x20U)");
  _ok(iVar6,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1ba,
      "len(mp_decode_strl(0x20U))");
  _ok(1,"mp_sizeof_strl(0x20U) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1ba,
      "mp_sizeof_strl(0x20U)");
  _ok((uint)(CONCAT11(buf[2],buf[1]) == 0x20d9),"memcmp(data, (\"\\xd9\\x20\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1ba,
      "mp_encode(0x20U) == \"\\xd9\\x20\"");
  buf[1] = -0x27;
  buf[2] = -2;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("strl 0xfeU",10,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(uint)(byte)buf[1]] != MP_STR) goto LAB_00112505;
  if (((byte)buf[1] & 0xffffffe0) != 0xa0) {
    if (2 < (byte)(buf[1] + 0x27U)) goto LAB_00112524;
    uVar20 = (uint)((1 << (buf[1] & 3U) & 0xfffffffeU) == 2);
  }
  iVar6 = 0;
  _ok(uVar20,"mp_check_strl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1bb,
      "mp_check_strl(0xfeU) == 0");
  uVar7 = (uint)(byte)buf[1];
  if (uVar7 == 0xdb) {
    uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
            CONCAT13(buf[5],uVar2) << 0x18;
  }
  else {
    if (uVar7 == 0xda) {
      uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    }
    else {
      if (uVar7 == 0xd9) {
        uVar7 = (uint)(byte)buf[2];
        iVar6 = 1;
        goto LAB_0010abb4;
      }
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00112497;
      uVar7 = uVar7 & 0x1f;
    }
    iVar6 = 0;
  }
LAB_0010abb4:
  uVar20 = 0;
  _ok((uint)(uVar7 == 0xfe),"mp_decode_strl(&d2 COMPLEX(COMMA &ext_type)) == (0xfeU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1bb,
      "mp_decode(mp_encode(0xfeU)) == 0xfeU");
  _ok(1,"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1bb,
      "len(mp_encode_strl(0xfeU)");
  _ok(iVar6,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1bb,
      "len(mp_decode_strl(0xfeU))");
  _ok(1,"mp_sizeof_strl(0xfeU) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1bb,
      "mp_sizeof_strl(0xfeU)");
  _ok((uint)(CONCAT11(buf[2],buf[1]) == -0x127),"memcmp(data, (\"\\xd9\\xfe\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1bb,
      "mp_encode(0xfeU) == \"\\xd9\\xfe\"");
  buf[1] = -0x27;
  buf[2] = -1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("strl 0xffU",10,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(uint)(byte)buf[1]] != MP_STR) goto LAB_00112505;
  if (((byte)buf[1] & 0xffffffe0) != 0xa0) {
    if (2 < (byte)(buf[1] + 0x27U)) goto LAB_00112524;
    uVar20 = (uint)((1 << (buf[1] & 3U) & 0xfffffffeU) == 2);
  }
  iVar6 = 0;
  _ok(uVar20,"mp_check_strl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1bc,
      "mp_check_strl(0xffU) == 0");
  uVar7 = (uint)(byte)buf[1];
  if (uVar7 == 0xdb) {
    uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
            CONCAT13(buf[5],uVar2) << 0x18;
  }
  else {
    if (uVar7 == 0xda) {
      uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    }
    else {
      if (uVar7 == 0xd9) {
        uVar7 = (uint)(byte)buf[2];
        iVar6 = 1;
        goto LAB_0010ad80;
      }
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_0011249c;
      uVar7 = uVar7 & 0x1f;
    }
    iVar6 = 0;
  }
LAB_0010ad80:
  uVar20 = 0;
  _ok((uint)(uVar7 == 0xff),"mp_decode_strl(&d2 COMPLEX(COMMA &ext_type)) == (0xffU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1bc,
      "mp_decode(mp_encode(0xffU)) == 0xffU");
  _ok(1,"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1bc,
      "len(mp_encode_strl(0xffU)");
  _ok(iVar6,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1bc,
      "len(mp_decode_strl(0xffU))");
  _ok(1,"mp_sizeof_strl(0xffU) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1bc,
      "mp_sizeof_strl(0xffU)");
  _ok((uint)(CONCAT11(buf[2],buf[1]) == -0x27),"memcmp(data, (\"\\xd9\\xff\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1bc,
      "mp_encode(0xffU) == \"\\xd9\\xff\"");
  buf[1] = -0x26;
  buf[2] = '\x01';
  buf[3] = '\0';
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("strl 0x0100U",0xc,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(uint)(byte)buf[1]] != MP_STR) goto LAB_00112505;
  if (((byte)buf[1] & 0xffffffe0) != 0xa0) {
    if (2 < (byte)(buf[1] + 0x27U)) goto LAB_00112524;
    uVar20 = (uint)((1 << (buf[1] & 3U) & 0xfffffffeU) == 4);
  }
  iVar6 = 0;
  _ok(uVar20,"mp_check_strl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1be,
      "mp_check_strl(0x0100U) == 0");
  uVar7 = (uint)(byte)buf[1];
  if (uVar7 == 0xdb) {
    uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
            CONCAT13(buf[5],uVar2) << 0x18;
  }
  else if (uVar7 == 0xda) {
    uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    iVar6 = 1;
  }
  else {
    if (uVar7 == 0xd9) {
      uVar7 = (uint)(byte)buf[2];
    }
    else {
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_001124a1;
      uVar7 = uVar7 & 0x1f;
    }
    iVar6 = 0;
  }
  uVar20 = 0;
  _ok((uint)(uVar7 == 0x100),"mp_decode_strl(&d2 COMPLEX(COMMA &ext_type)) == (0x0100U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1be,
      "mp_decode(mp_encode(0x0100U)) == 0x0100U");
  _ok(1,"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1be,
      "len(mp_encode_strl(0x0100U)");
  _ok(iVar6,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1be,
      "len(mp_decode_strl(0x0100U))");
  _ok(1,"mp_sizeof_strl(0x0100U) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1be,
      "mp_sizeof_strl(0x0100U)");
  _ok((uint)(buf[3] == '\0' && CONCAT11(buf[2],buf[1]) == 0x1da),
      "memcmp(data, (\"\\xda\\x01\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1be,
      "mp_encode(0x0100U) == \"\\xda\\x01\\x00\"");
  buf[1] = -0x26;
  buf[2] = -1;
  buf[3] = -2;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("strl 0xfffeU",0xc,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(uint)(byte)buf[1]] != MP_STR) goto LAB_00112505;
  if (((byte)buf[1] & 0xffffffe0) != 0xa0) {
    if (2 < (byte)(buf[1] + 0x27U)) goto LAB_00112524;
    uVar20 = (uint)((1 << (buf[1] & 3U) & 0xfffffffeU) == 4);
  }
  iVar6 = 0;
  _ok(uVar20,"mp_check_strl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1bf,
      "mp_check_strl(0xfffeU) == 0");
  uVar7 = (uint)(byte)buf[1];
  if (uVar7 == 0xdb) {
    uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
            CONCAT13(buf[5],uVar2) << 0x18;
  }
  else if (uVar7 == 0xda) {
    uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    iVar6 = 1;
  }
  else {
    if (uVar7 == 0xd9) {
      uVar7 = (uint)(byte)buf[2];
    }
    else {
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_001124a6;
      uVar7 = uVar7 & 0x1f;
    }
    iVar6 = 0;
  }
  uVar20 = 0;
  _ok((uint)(uVar7 == 0xfffe),"mp_decode_strl(&d2 COMPLEX(COMMA &ext_type)) == (0xfffeU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1bf,
      "mp_decode(mp_encode(0xfffeU)) == 0xfffeU");
  _ok(1,"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1bf,
      "len(mp_encode_strl(0xfffeU)");
  _ok(iVar6,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1bf,
      "len(mp_decode_strl(0xfffeU))");
  _ok(1,"mp_sizeof_strl(0xfffeU) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1bf,
      "mp_sizeof_strl(0xfffeU)");
  _ok((uint)(buf[3] == -2 && CONCAT11(buf[2],buf[1]) == -0x26),
      "memcmp(data, (\"\\xda\\xff\\xfe\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1bf,
      "mp_encode(0xfffeU) == \"\\xda\\xff\\xfe\"");
  buf[1] = -0x26;
  buf[2] = -1;
  buf[3] = -1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("strl 0xffffU",0xc,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(uint)(byte)buf[1]] != MP_STR) goto LAB_00112505;
  if (((byte)buf[1] & 0xffffffe0) != 0xa0) {
    if (2 < (byte)(buf[1] + 0x27U)) goto LAB_00112524;
    uVar20 = (uint)((1 << (buf[1] & 3U) & 0xfffffffeU) == 4);
  }
  iVar6 = 0;
  _ok(uVar20,"mp_check_strl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c0,
      "mp_check_strl(0xffffU) == 0");
  uVar7 = (uint)(byte)buf[1];
  if (uVar7 == 0xdb) {
    uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
            CONCAT13(buf[5],uVar2) << 0x18;
  }
  else if (uVar7 == 0xda) {
    uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    iVar6 = 1;
  }
  else {
    if (uVar7 == 0xd9) {
      uVar7 = (uint)(byte)buf[2];
    }
    else {
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_001124ab;
      uVar7 = uVar7 & 0x1f;
    }
    iVar6 = 0;
  }
  uVar20 = 0;
  _ok((uint)(uVar7 == 0xffff),"mp_decode_strl(&d2 COMPLEX(COMMA &ext_type)) == (0xffffU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c0,
      "mp_decode(mp_encode(0xffffU)) == 0xffffU");
  _ok(1,"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c0,
      "len(mp_encode_strl(0xffffU)");
  _ok(iVar6,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c0,
      "len(mp_decode_strl(0xffffU))");
  _ok(1,"mp_sizeof_strl(0xffffU) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c0,
      "mp_sizeof_strl(0xffffU)");
  _ok((uint)(buf[3] == -1 && CONCAT11(buf[2],buf[1]) == -0x26),
      "memcmp(data, (\"\\xda\\xff\\xff\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c0,
      "mp_encode(0xffffU) == \"\\xda\\xff\\xff\"");
  buf[1] = -0x25;
  buf[2] = '\0';
  buf[3] = '\x01';
  buf[4] = '\0';
  buf[5] = '\0';
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("strl 0x00010000U",0x10,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(uint)(byte)buf[1]] != MP_STR) goto LAB_00112505;
  if (((byte)buf[1] & 0xffffffe0) != 0xa0) {
    if (2 < (byte)(buf[1] + 0x27U)) goto LAB_00112524;
    uVar20 = (uint)((1 << (buf[1] & 3U) & 0xfffffffeU) == 8);
  }
  iVar6 = 0;
  _ok(uVar20,"mp_check_strl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c2,
      "mp_check_strl(0x00010000U) == 0");
  if ((byte)buf[1] - 0xd9 < 2) {
    uVar7 = 0;
  }
  else if (buf[1] == -0x25) {
    uVar7 = (uint)(CONCAT13(buf[5],CONCAT12(buf[4],CONCAT11(buf[3],buf[2]))) == 0x100);
    iVar6 = 1;
  }
  else {
    uVar7 = 0;
    if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_001124b0;
  }
  uVar20 = 0;
  _ok(uVar7,"mp_decode_strl(&d2 COMPLEX(COMMA &ext_type)) == (0x00010000U)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c2,
      "mp_decode(mp_encode(0x00010000U)) == 0x00010000U");
  _ok(1,"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c2,
      "len(mp_encode_strl(0x00010000U)");
  _ok(iVar6,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c2,
      "len(mp_decode_strl(0x00010000U))");
  _ok(1,"mp_sizeof_strl(0x00010000U) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c2,
      "mp_sizeof_strl(0x00010000U)");
  _ok((uint)(buf[5] == '\0' && CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0x100db)
      ,"memcmp(data, (\"\\xdb\\x00\\x01\\x00\\x00\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c2,
      "mp_encode(0x00010000U) == \"\\xdb\\x00\\x01\\x00\\x00\"");
  buf[1] = -0x25;
  buf[2] = -1;
  buf[3] = -1;
  buf[4] = -1;
  buf[5] = -2;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("strl 0xfffffffeU",0x10,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(uint)(byte)buf[1]] != MP_STR) goto LAB_00112505;
  if (((byte)buf[1] & 0xffffffe0) != 0xa0) {
    if (2 < (byte)(buf[1] + 0x27U)) goto LAB_00112524;
    uVar20 = (uint)((1 << (buf[1] & 3U) & 0xfffffffeU) == 8);
  }
  iVar6 = 0;
  _ok(uVar20,"mp_check_strl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c3,
      "mp_check_strl(0xfffffffeU) == 0");
  if ((byte)buf[1] - 0xd9 < 2) {
    uVar7 = 0;
  }
  else if (buf[1] == -0x25) {
    uVar7 = (uint)(CONCAT13(buf[5],CONCAT12(buf[4],CONCAT11(buf[3],buf[2]))) == -0x1000001);
    iVar6 = 1;
  }
  else {
    uVar7 = 0;
    if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_001124b5;
  }
  uVar20 = 0;
  _ok(uVar7,"mp_decode_strl(&d2 COMPLEX(COMMA &ext_type)) == (0xfffffffeU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c3,
      "mp_decode(mp_encode(0xfffffffeU)) == 0xfffffffeU");
  _ok(1,"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c3,
      "len(mp_encode_strl(0xfffffffeU)");
  _ok(iVar6,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c3,
      "len(mp_decode_strl(0xfffffffeU))");
  _ok(1,"mp_sizeof_strl(0xfffffffeU) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c3,
      "mp_sizeof_strl(0xfffffffeU)");
  _ok((uint)(buf[5] == -2 && CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == -0x25),
      "memcmp(data, (\"\\xdb\\xff\\xff\\xff\\xfe\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c3,
      "mp_encode(0xfffffffeU) == \"\\xdb\\xff\\xff\\xff\\xfe\"");
  buf[1] = -0x25;
  buf[2] = -1;
  buf[3] = -1;
  buf[4] = -1;
  buf[5] = -1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("strl 0xffffffffU",0x10,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(uint)(byte)buf[1]] != MP_STR) goto LAB_00112505;
  if (((byte)buf[1] & 0xffffffe0) != 0xa0) {
    if (2 < (byte)(buf[1] + 0x27U)) {
LAB_00112524:
      __assert_fail("c >= 0xd9 && c <= 0xdb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0xa36,"ptrdiff_t mp_check_strl(const char *, const char *)");
    }
    uVar20 = (uint)((1 << (buf[1] & 3U) & 0xfffffffeU) == 8);
  }
  iVar6 = 0;
  _ok(uVar20,"mp_check_strl(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c4,
      "mp_check_strl(0xffffffffU) == 0");
  if ((byte)buf[1] - 0xd9 < 2) {
    uVar7 = 0;
  }
  else if (buf[1] == -0x25) {
    uVar7 = (uint)(CONCAT13(buf[5],CONCAT12(buf[4],CONCAT11(buf[3],buf[2]))) == -1);
    iVar6 = 1;
  }
  else {
    uVar7 = 0;
    if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_001124ba;
  }
  _ok(uVar7,"mp_decode_strl(&d2 COMPLEX(COMMA &ext_type)) == (0xffffffffU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c4,
      "mp_decode(mp_encode(0xffffffffU)) == 0xffffffffU");
  _ok(1,"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c4,
      "len(mp_encode_strl(0xffffffffU)");
  _ok(iVar6,"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c4,
      "len(mp_decode_strl(0xffffffffU))");
  _ok(1,"mp_sizeof_strl(0xffffffffU) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c4,
      "mp_sizeof_strl(0xffffffffU)");
  _ok((uint)(buf[5] == -1 && CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == -0x25),
      "memcmp(data, (\"\\xdb\\xff\\xff\\xff\\xff\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c4,
      "mp_encode(0xffffffffU) == \"\\xdb\\xff\\xff\\xff\\xff\"");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("strl_safe",9,1,_stdout);
  fputc(10,_stdout);
  _ok(1,"-sz == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c6,
      "size after mp_encode_strl_safe(NULL, &sz)");
  _ok(1,"d == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c6,
      "mp_encode_strl_safe(NULL, &sz)");
  buf[1] = -0x27;
  buf[2] = ' ';
  _ok(1,"sz == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c6,
      "size after mp_encode_strl_safe(buf, &sz)");
  _ok(1,"(d - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c6,
      "len of mp_encode_strl_safe(buf, &sz)");
  _ok((uint)(CONCAT11(buf[2],buf[1]) == 0x20d9),"memcmp(data, (\"\\xd9\\x20\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c6,
      "mp_encode_strl_safe(buf, &sz)");
  _ok(1,"sz == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c6,
      "size after mp_encode_strl_safe(buf, &sz) overflow");
  _ok(1,"d == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c6,
      "mp_encode_strl_safe(buf, &sz) overflow");
  buf[1] = -0x27;
  buf[2] = ' ';
  _ok(1,"(d - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c6,
      "len of mp_encode_strl_safe(buf, NULL)");
  _ok((uint)(CONCAT11(buf[2],buf[1]) == 0x20d9),"memcmp(data, (\"\\xd9\\x20\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1c6,
      "mp_encode_strl_safe(buf, NULL)");
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","test_strls");
  check_plan();
  _plan(0x57,true);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","test_binls");
  buf[1] = -0x3c;
  buf[2] = '\0';
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("binl 0x00U",10,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(byte)buf[1]] != MP_BIN) {
LAB_00112543:
    __assert_fail("mp_typeof(c) == MP_BIN",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                  ,0xa40,"ptrdiff_t mp_check_binl(const char *, const char *)");
  }
  if ((byte)(buf[1] + 0x3cU) < 3) {
    iVar6 = 0;
    _ok((uint)((buf[1] & 3U) == 0),"mp_check_binl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d2,"mp_check_binl(0x00U) == 0");
    if (buf[1] == -0x3a) {
      uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar2) << 0x18;
    }
    else if (buf[1] == -0x3b) {
      uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      iVar6 = 0;
    }
    else {
      if (buf[1] != -0x3c) goto LAB_001125bf;
      uVar7 = (uint)(byte)buf[2];
      iVar6 = 1;
    }
    _ok((uint)(uVar7 == 0),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0x00U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d2,"mp_decode(mp_encode(0x00U)) == 0x00U");
    _ok(1,"(d1 - data) == (2)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d2,"len(mp_encode_binl(0x00U)");
    _ok(iVar6,"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d2,"len(mp_decode_binl(0x00U))");
    _ok(1,"mp_sizeof_binl(0x00U) == 2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d2,"mp_sizeof_binl(0x00U)");
    _ok((uint)(CONCAT11(buf[2],buf[1]) == 0xc4),"memcmp(data, (\"\\xc4\\x00\"), (2)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d2,"mp_encode(0x00U) == \"\\xc4\\x00\"");
    buf[1] = -0x3c;
    buf[2] = '\x01';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("binl 0x01U",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_BIN) goto LAB_00112543;
    if (2 < (byte)(buf[1] + 0x3cU)) goto LAB_00112562;
    iVar6 = 0;
    _ok((uint)((buf[1] & 3U) == 0),"mp_check_binl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d3,"mp_check_binl(0x01U) == 0");
    if (buf[1] == -0x3a) {
      uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar2) << 0x18;
    }
    else if (buf[1] == -0x3b) {
      uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      iVar6 = 0;
    }
    else {
      if (buf[1] != -0x3c) goto LAB_001125bf;
      uVar7 = (uint)(byte)buf[2];
      iVar6 = 1;
    }
    _ok((uint)(uVar7 == 1),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0x01U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d3,"mp_decode(mp_encode(0x01U)) == 0x01U");
    _ok(1,"(d1 - data) == (2)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d3,"len(mp_encode_binl(0x01U)");
    _ok(iVar6,"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d3,"len(mp_decode_binl(0x01U))");
    _ok(1,"mp_sizeof_binl(0x01U) == 2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d3,"mp_sizeof_binl(0x01U)");
    _ok((uint)(CONCAT11(buf[2],buf[1]) == 0x1c4),"memcmp(data, (\"\\xc4\\x01\"), (2)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d3,"mp_encode(0x01U) == \"\\xc4\\x01\"");
    buf[1] = -0x3c;
    buf[2] = '\x1e';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("binl 0x1eU",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_BIN) goto LAB_00112543;
    if (2 < (byte)(buf[1] + 0x3cU)) goto LAB_00112562;
    iVar6 = 0;
    _ok((uint)((buf[1] & 3U) == 0),"mp_check_binl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d4,"mp_check_binl(0x1eU) == 0");
    if (buf[1] == -0x3a) {
      uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar2) << 0x18;
    }
    else if (buf[1] == -0x3b) {
      uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      iVar6 = 0;
    }
    else {
      if (buf[1] != -0x3c) goto LAB_001125bf;
      uVar7 = (uint)(byte)buf[2];
      iVar6 = 1;
    }
    _ok((uint)(uVar7 == 0x1e),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0x1eU)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d4,"mp_decode(mp_encode(0x1eU)) == 0x1eU");
    _ok(1,"(d1 - data) == (2)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d4,"len(mp_encode_binl(0x1eU)");
    _ok(iVar6,"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d4,"len(mp_decode_binl(0x1eU))");
    _ok(1,"mp_sizeof_binl(0x1eU) == 2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d4,"mp_sizeof_binl(0x1eU)");
    _ok((uint)(CONCAT11(buf[2],buf[1]) == 0x1ec4),"memcmp(data, (\"\\xc4\\x1e\"), (2)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d4,"mp_encode(0x1eU) == \"\\xc4\\x1e\"");
    buf[1] = -0x3c;
    buf[2] = '\x1f';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("binl 0x1fU",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_BIN) goto LAB_00112543;
    if (2 < (byte)(buf[1] + 0x3cU)) goto LAB_00112562;
    iVar6 = 0;
    _ok((uint)((buf[1] & 3U) == 0),"mp_check_binl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d5,"mp_check_binl(0x1fU) == 0");
    if (buf[1] == -0x3a) {
      uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar2) << 0x18;
    }
    else if (buf[1] == -0x3b) {
      uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      iVar6 = 0;
    }
    else {
      if (buf[1] != -0x3c) goto LAB_001125bf;
      uVar7 = (uint)(byte)buf[2];
      iVar6 = 1;
    }
    _ok((uint)(uVar7 == 0x1f),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0x1fU)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d5,"mp_decode(mp_encode(0x1fU)) == 0x1fU");
    _ok(1,"(d1 - data) == (2)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d5,"len(mp_encode_binl(0x1fU)");
    _ok(iVar6,"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d5,"len(mp_decode_binl(0x1fU))");
    _ok(1,"mp_sizeof_binl(0x1fU) == 2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d5,"mp_sizeof_binl(0x1fU)");
    _ok((uint)(CONCAT11(buf[2],buf[1]) == 0x1fc4),"memcmp(data, (\"\\xc4\\x1f\"), (2)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d5,"mp_encode(0x1fU) == \"\\xc4\\x1f\"");
    buf[1] = -0x3c;
    buf[2] = ' ';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("binl 0x20U",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_BIN) goto LAB_00112543;
    if (2 < (byte)(buf[1] + 0x3cU)) goto LAB_00112562;
    iVar6 = 0;
    _ok((uint)((buf[1] & 3U) == 0),"mp_check_binl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d7,"mp_check_binl(0x20U) == 0");
    if (buf[1] == -0x3a) {
      uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar2) << 0x18;
    }
    else if (buf[1] == -0x3b) {
      uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      iVar6 = 0;
    }
    else {
      if (buf[1] != -0x3c) goto LAB_001125bf;
      uVar7 = (uint)(byte)buf[2];
      iVar6 = 1;
    }
    _ok((uint)(uVar7 == 0x20),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0x20U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d7,"mp_decode(mp_encode(0x20U)) == 0x20U");
    _ok(1,"(d1 - data) == (2)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d7,"len(mp_encode_binl(0x20U)");
    _ok(iVar6,"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d7,"len(mp_decode_binl(0x20U))");
    _ok(1,"mp_sizeof_binl(0x20U) == 2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d7,"mp_sizeof_binl(0x20U)");
    _ok((uint)(CONCAT11(buf[2],buf[1]) == 0x20c4),"memcmp(data, (\"\\xc4\\x20\"), (2)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d7,"mp_encode(0x20U) == \"\\xc4\\x20\"");
    buf[1] = -0x3c;
    buf[2] = -2;
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("binl 0xfeU",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_BIN) goto LAB_00112543;
    if (2 < (byte)(buf[1] + 0x3cU)) goto LAB_00112562;
    iVar6 = 0;
    _ok((uint)((buf[1] & 3U) == 0),"mp_check_binl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d8,"mp_check_binl(0xfeU) == 0");
    if (buf[1] == -0x3a) {
      uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar2) << 0x18;
    }
    else if (buf[1] == -0x3b) {
      uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      iVar6 = 0;
    }
    else {
      if (buf[1] != -0x3c) goto LAB_001125bf;
      uVar7 = (uint)(byte)buf[2];
      iVar6 = 1;
    }
    _ok((uint)(uVar7 == 0xfe),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0xfeU)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d8,"mp_decode(mp_encode(0xfeU)) == 0xfeU");
    _ok(1,"(d1 - data) == (2)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d8,"len(mp_encode_binl(0xfeU)");
    _ok(iVar6,"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d8,"len(mp_decode_binl(0xfeU))");
    _ok(1,"mp_sizeof_binl(0xfeU) == 2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d8,"mp_sizeof_binl(0xfeU)");
    _ok((uint)(CONCAT11(buf[2],buf[1]) == -0x13c),"memcmp(data, (\"\\xc4\\xfe\"), (2)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d8,"mp_encode(0xfeU) == \"\\xc4\\xfe\"");
    buf[1] = -0x3c;
    buf[2] = -1;
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("binl 0xffU",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_BIN) goto LAB_00112543;
    if (2 < (byte)(buf[1] + 0x3cU)) goto LAB_00112562;
    iVar6 = 0;
    _ok((uint)((buf[1] & 3U) == 0),"mp_check_binl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d9,"mp_check_binl(0xffU) == 0");
    if (buf[1] == -0x3a) {
      uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar2) << 0x18;
    }
    else if (buf[1] == -0x3b) {
      uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      iVar6 = 0;
    }
    else {
      if (buf[1] != -0x3c) goto LAB_001125bf;
      uVar7 = (uint)(byte)buf[2];
      iVar6 = 1;
    }
    _ok((uint)(uVar7 == 0xff),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0xffU)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d9,"mp_decode(mp_encode(0xffU)) == 0xffU");
    _ok(1,"(d1 - data) == (2)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d9,"len(mp_encode_binl(0xffU)");
    _ok(iVar6,"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d9,"len(mp_decode_binl(0xffU))");
    _ok(1,"mp_sizeof_binl(0xffU) == 2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d9,"mp_sizeof_binl(0xffU)");
    _ok((uint)(CONCAT11(buf[2],buf[1]) == -0x3c),"memcmp(data, (\"\\xc4\\xff\"), (2)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1d9,"mp_encode(0xffU) == \"\\xc4\\xff\"");
    buf[1] = -0x3b;
    buf[2] = '\x01';
    buf[3] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("binl 0x0100U",0xc,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_BIN) goto LAB_00112543;
    if (2 < (byte)(buf[1] + 0x3cU)) goto LAB_00112562;
    iVar6 = 0;
    _ok((uint)((buf[1] & 3U) == 1),"mp_check_binl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1db,"mp_check_binl(0x0100U) == 0");
    if (buf[1] == -0x3a) {
      uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar2) << 0x18;
    }
    else if (buf[1] == -0x3b) {
      uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      iVar6 = 1;
    }
    else {
      if (buf[1] != -0x3c) goto LAB_001125bf;
      uVar7 = (uint)(byte)buf[2];
      iVar6 = 0;
    }
    _ok((uint)(uVar7 == 0x100),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0x0100U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1db,"mp_decode(mp_encode(0x0100U)) == 0x0100U");
    _ok(1,"(d1 - data) == (3)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1db,"len(mp_encode_binl(0x0100U)");
    _ok(iVar6,"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1db,"len(mp_decode_binl(0x0100U))");
    _ok(1,"mp_sizeof_binl(0x0100U) == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1db,"mp_sizeof_binl(0x0100U)");
    _ok((uint)(buf[3] == '\0' && CONCAT11(buf[2],buf[1]) == 0x1c5),
        "memcmp(data, (\"\\xc5\\x01\\x00\"), (3)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1db,"mp_encode(0x0100U) == \"\\xc5\\x01\\x00\"");
    buf[1] = -0x3b;
    buf[2] = -1;
    buf[3] = -2;
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("binl 0xfffeU",0xc,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_BIN) goto LAB_00112543;
    if (2 < (byte)(buf[1] + 0x3cU)) goto LAB_00112562;
    iVar6 = 0;
    _ok((uint)((buf[1] & 3U) == 1),"mp_check_binl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1dc,"mp_check_binl(0xfffeU) == 0");
    if (buf[1] == -0x3a) {
      uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar2) << 0x18;
    }
    else if (buf[1] == -0x3b) {
      uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      iVar6 = 1;
    }
    else {
      if (buf[1] != -0x3c) goto LAB_001125bf;
      uVar7 = (uint)(byte)buf[2];
      iVar6 = 0;
    }
    _ok((uint)(uVar7 == 0xfffe),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0xfffeU)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1dc,"mp_decode(mp_encode(0xfffeU)) == 0xfffeU");
    _ok(1,"(d1 - data) == (3)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1dc,"len(mp_encode_binl(0xfffeU)");
    _ok(iVar6,"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1dc,"len(mp_decode_binl(0xfffeU))");
    _ok(1,"mp_sizeof_binl(0xfffeU) == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1dc,"mp_sizeof_binl(0xfffeU)");
    _ok((uint)(buf[3] == -2 && CONCAT11(buf[2],buf[1]) == -0x3b),
        "memcmp(data, (\"\\xc5\\xff\\xfe\"), (3)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1dc,"mp_encode(0xfffeU) == \"\\xc5\\xff\\xfe\"");
    buf[1] = -0x3b;
    buf[2] = -1;
    buf[3] = -1;
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("binl 0xffffU",0xc,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_BIN) goto LAB_00112543;
    if (2 < (byte)(buf[1] + 0x3cU)) goto LAB_00112562;
    iVar6 = 0;
    _ok((uint)((buf[1] & 3U) == 1),"mp_check_binl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1dd,"mp_check_binl(0xffffU) == 0");
    if (buf[1] == -0x3a) {
      uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar2) << 0x18;
    }
    else if (buf[1] == -0x3b) {
      uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      iVar6 = 1;
    }
    else {
      if (buf[1] != -0x3c) goto LAB_001125bf;
      uVar7 = (uint)(byte)buf[2];
      iVar6 = 0;
    }
    _ok((uint)(uVar7 == 0xffff),"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0xffffU)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1dd,"mp_decode(mp_encode(0xffffU)) == 0xffffU");
    _ok(1,"(d1 - data) == (3)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1dd,"len(mp_encode_binl(0xffffU)");
    _ok(iVar6,"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1dd,"len(mp_decode_binl(0xffffU))");
    _ok(1,"mp_sizeof_binl(0xffffU) == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1dd,"mp_sizeof_binl(0xffffU)");
    _ok((uint)(buf[3] == -1 && CONCAT11(buf[2],buf[1]) == -0x3b),
        "memcmp(data, (\"\\xc5\\xff\\xff\"), (3)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1dd,"mp_encode(0xffffU) == \"\\xc5\\xff\\xff\"");
    buf[1] = -0x3a;
    buf[2] = '\0';
    buf[3] = '\x01';
    buf[4] = '\0';
    buf[5] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("binl 0x00010000U",0x10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_BIN) goto LAB_00112543;
    if (2 < (byte)(buf[1] + 0x3cU)) goto LAB_00112562;
    iVar6 = 0;
    _ok((uint)((buf[1] & 3U) == 2),"mp_check_binl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1df,"mp_check_binl(0x00010000U) == 0");
    uVar7 = 0;
    if (1 < (byte)buf[1] - 0xc4) {
      if ((byte)buf[1] != 0xc6) goto LAB_001125bf;
      uVar7 = (uint)(CONCAT13(buf[5],CONCAT12(buf[4],CONCAT11(buf[3],buf[2]))) == 0x100);
      iVar6 = 1;
    }
    _ok(uVar7,"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0x00010000U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1df,"mp_decode(mp_encode(0x00010000U)) == 0x00010000U");
    _ok(1,"(d1 - data) == (5)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1df,"len(mp_encode_binl(0x00010000U)");
    _ok(iVar6,"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1df,"len(mp_decode_binl(0x00010000U))");
    _ok(1,"mp_sizeof_binl(0x00010000U) == 5",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1df,"mp_sizeof_binl(0x00010000U)");
    _ok((uint)(buf[5] == '\0' &&
              CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0x100c6),
        "memcmp(data, (\"\\xc6\\x00\\x01\\x00\\x00\"), (5)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1df,"mp_encode(0x00010000U) == \"\\xc6\\x00\\x01\\x00\\x00\"");
    buf[1] = -0x3a;
    buf[2] = -1;
    buf[3] = -1;
    buf[4] = -1;
    buf[5] = -2;
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("binl 0xfffffffeU",0x10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_BIN) goto LAB_00112543;
    if (2 < (byte)(buf[1] + 0x3cU)) goto LAB_00112562;
    iVar6 = 0;
    _ok((uint)((buf[1] & 3U) == 2),"mp_check_binl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1e0,"mp_check_binl(0xfffffffeU) == 0");
    uVar7 = 0;
    if (1 < (byte)buf[1] - 0xc4) {
      if ((byte)buf[1] != 0xc6) goto LAB_001125bf;
      uVar7 = (uint)(CONCAT13(buf[5],CONCAT12(buf[4],CONCAT11(buf[3],buf[2]))) == -0x1000001);
      iVar6 = 1;
    }
    _ok(uVar7,"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0xfffffffeU)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1e0,"mp_decode(mp_encode(0xfffffffeU)) == 0xfffffffeU");
    _ok(1,"(d1 - data) == (5)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1e0,"len(mp_encode_binl(0xfffffffeU)");
    _ok(iVar6,"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1e0,"len(mp_decode_binl(0xfffffffeU))");
    _ok(1,"mp_sizeof_binl(0xfffffffeU) == 5",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1e0,"mp_sizeof_binl(0xfffffffeU)");
    _ok((uint)(buf[5] == -2 && CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == -0x3a),
        "memcmp(data, (\"\\xc6\\xff\\xff\\xff\\xfe\"), (5)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1e0,"mp_encode(0xfffffffeU) == \"\\xc6\\xff\\xff\\xff\\xfe\"");
    buf[1] = -0x3a;
    buf[2] = -1;
    buf[3] = -1;
    buf[4] = -1;
    buf[5] = -1;
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("binl 0xffffffffU",0x10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_BIN) goto LAB_00112543;
    if ((byte)(buf[1] + 0x3cU) < 3) {
      iVar6 = 0;
      _ok((uint)((buf[1] & 3U) == 2),"mp_check_binl(data, d1) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x1e1,"mp_check_binl(0xffffffffU) == 0");
      uVar7 = 0;
      if (1 < (byte)buf[1] - 0xc4) {
        if ((byte)buf[1] != 0xc6) {
LAB_001125bf:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                        ,0xa71,"uint32_t mp_decode_binl(const char **)");
        }
        uVar7 = (uint)(CONCAT13(buf[5],CONCAT12(buf[4],CONCAT11(buf[3],buf[2]))) == -1);
        iVar6 = 1;
      }
      _ok(uVar7,"mp_decode_binl(&d2 COMPLEX(COMMA &ext_type)) == (0xffffffffU)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x1e1,"mp_decode(mp_encode(0xffffffffU)) == 0xffffffffU");
      _ok(1,"(d1 - data) == (5)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x1e1,"len(mp_encode_binl(0xffffffffU)");
      _ok(iVar6,"d1 == d2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x1e1,"len(mp_decode_binl(0xffffffffU))");
      _ok(1,"mp_sizeof_binl(0xffffffffU) == 5",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x1e1,"mp_sizeof_binl(0xffffffffU)");
      _ok((uint)(buf[5] == -1 && CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == -0x3a)
          ,"memcmp(data, (\"\\xc6\\xff\\xff\\xff\\xff\"), (5)) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x1e1,"mp_encode(0xffffffffU) == \"\\xc6\\xff\\xff\\xff\\xff\"");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fwrite("binl_safe",9,1,_stdout);
      fputc(10,_stdout);
      _ok(1,"-sz == (5)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x1e3,"size after mp_encode_binl_safe(NULL, &sz)");
      _ok(1,"d == NULL",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x1e3,"mp_encode_binl_safe(NULL, &sz)");
      buf[1] = -0x3a;
      buf[2] = '\0';
      buf[3] = '\x01';
      buf[4] = '\0';
      buf[5] = '\0';
      _ok(1,"sz == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x1e3,"size after mp_encode_binl_safe(buf, &sz)");
      _ok(1,"(d - data) == (5)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x1e3,"len of mp_encode_binl_safe(buf, &sz)");
      _ok((uint)(buf[5] == '\0' &&
                CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0x100c6),
          "memcmp(data, (\"\\xc6\\x00\\x01\\x00\\x00\"), (5)) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x1e3,"mp_encode_binl_safe(buf, &sz)");
      _ok(1,"sz == -1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x1e3,"size after mp_encode_binl_safe(buf, &sz) overflow");
      _ok(1,"d == data",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x1e3,"mp_encode_binl_safe(buf, &sz) overflow");
      buf[1] = -0x3a;
      buf[2] = '\0';
      buf[3] = '\x01';
      buf[4] = '\0';
      buf[5] = '\0';
      pcVar27 = &stdout;
      _ok(1,"(d - data) == (5)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x1e3,"len of mp_encode_binl_safe(buf, NULL)");
      _ok((uint)(buf[5] == '\0' &&
                CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0x100c6),
          "memcmp(data, (\"\\xc6\\x00\\x01\\x00\\x00\"), (5)) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x1e3,"mp_encode_binl_safe(buf, NULL)");
      _space((FILE *)_stdout);
      printf("# *** %s: done ***\n","test_binls");
      check_plan();
      test_extls();
      test_strs();
      test_bins();
      test_exts();
      _plan(0x3f,true);
      _space((FILE *)_stdout);
      printf("# *** %s ***\n","test_arrays");
      buf[1] = -0x70;
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fwrite("array 0",7,1,_stdout);
      fputc(10,_stdout);
      pcVar26 = (char *)(ulong)(byte)buf[1];
      pmVar29 = mp_type_hint;
      if (mp_type_hint[(long)pcVar26] != MP_ARRAY) {
LAB_00112581:
        __assert_fail("mp_typeof(*cur) == MP_ARRAY",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x792,"ptrdiff_t mp_check_array(const char *, const char *)");
      }
      if ((buf[1] & 0x40U) != 0) goto LAB_001120a3;
LAB_0010d353:
      _ok((uint)(((ulong)pcVar26 & 0x40) == 0),"mp_check_array(data, d1) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x189,"mp_check_array(0) == 0");
      uVar7 = (uint)(byte)buf[1];
      if ((buf[1] & 0x40U) == 0) {
        uVar20 = uVar7 & 0xf;
      }
      else if ((buf[1] & 1U) == 0) {
        uVar20 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      }
      else {
        uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
        uVar20 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                 CONCAT13(buf[5],uVar2) << 0x18;
      }
      _ok((uint)(uVar20 == 0),"mp_decode_array(&d2 COMPLEX(COMMA &ext_type)) == (0)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x189,"mp_decode(mp_encode(0)) == 0");
      _ok(1,"(d1 - data) == (1)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x189,"len(mp_encode_array(0)");
      _ok((uVar7 & 0x40) >> 6 ^ 1,"d1 == d2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x189,"len(mp_decode_array(0))");
      _ok(1,"mp_sizeof_array(0) == 1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x189,"mp_sizeof_array(0)");
      _ok((uint)(buf[1] == -0x70),"memcmp(data, (\"\\x90\"), (1)) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x189,"mp_encode(0) == \"\\x90\"");
      buf[1] = -0x6f;
      _space(*(FILE **)pcVar27);
      fwrite("# ",2,1,*(FILE **)pcVar27);
      fwrite("array 1",7,1,*(FILE **)pcVar27);
      fputc(10,*(FILE **)pcVar27);
      cVar19 = buf[1];
      if (pmVar29[(byte)buf[1]] == MP_ARRAY) {
        if ((buf[1] & 0x40U) != 0) {
          main_cold_2();
        }
        _ok((uint)((cVar19 & 0x40U) == 0),"mp_check_array(data, d1) == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x18a,"mp_check_array(1) == 0");
        uVar7 = (uint)(byte)buf[1];
        if ((buf[1] & 0x40U) == 0) {
          uVar20 = uVar7 & 0xf;
        }
        else if ((buf[1] & 1U) == 0) {
          uVar20 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
        }
        else {
          uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
          uVar20 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                   CONCAT13(buf[5],uVar2) << 0x18;
        }
        _ok((uint)(uVar20 == 1),"mp_decode_array(&d2 COMPLEX(COMMA &ext_type)) == (1)",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x18a,"mp_decode(mp_encode(1)) == 1");
        _ok(1,"(d1 - data) == (1)",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x18a,"len(mp_encode_array(1)");
        _ok((uVar7 & 0x40) >> 6 ^ 1,"d1 == d2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x18a,"len(mp_decode_array(1))");
        _ok(1,"mp_sizeof_array(1) == 1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x18a,"mp_sizeof_array(1)");
        _ok((uint)(buf[1] == -0x6f),"memcmp(data, (\"\\x91\"), (1)) == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x18a,"mp_encode(1) == \"\\x91\"");
        buf[1] = -0x61;
        _space(*(FILE **)pcVar27);
        fwrite("# ",2,1,*(FILE **)pcVar27);
        fwrite("array 15",8,1,*(FILE **)pcVar27);
        fputc(10,*(FILE **)pcVar27);
        cVar19 = buf[1];
        if (pmVar29[(byte)buf[1]] == MP_ARRAY) {
          if ((buf[1] & 0x40U) != 0) {
            main_cold_3();
          }
          _ok((uint)((cVar19 & 0x40U) == 0),"mp_check_array(data, d1) == 0",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x18b,"mp_check_array(15) == 0");
          uVar7 = (uint)(byte)buf[1];
          if ((buf[1] & 0x40U) == 0) {
            uVar20 = uVar7 & 0xf;
          }
          else if ((buf[1] & 1U) == 0) {
            uVar20 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
          }
          else {
            uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
            uVar20 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                     CONCAT13(buf[5],uVar2) << 0x18;
          }
          condition = 0;
          _ok((uint)(uVar20 == 0xf),"mp_decode_array(&d2 COMPLEX(COMMA &ext_type)) == (15)",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x18b,"mp_decode(mp_encode(15)) == 15");
          _ok(1,"(d1 - data) == (1)",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x18b,"len(mp_encode_array(15)");
          _ok((uVar7 & 0x40) >> 6 ^ 1,"d1 == d2",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x18b,"len(mp_decode_array(15))");
          _ok(1,"mp_sizeof_array(15) == 1",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x18b,"mp_sizeof_array(15)");
          _ok((uint)(buf[1] == -0x61),"memcmp(data, (\"\\x9f\"), (1)) == 0",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x18b,"mp_encode(15) == \"\\x9f\"");
          buf[1] = -0x24;
          buf[2] = '\0';
          buf[3] = '\x10';
          _space(*(FILE **)pcVar27);
          fwrite("# ",2,1,*(FILE **)pcVar27);
          fwrite("array 16",8,1,*(FILE **)pcVar27);
          fputc(10,*(FILE **)pcVar27);
          if (pmVar29[(uint)(byte)buf[1]] == MP_ARRAY) {
            if ((buf[1] & 0x40U) != 0) {
              if ((buf[1] & 0xfeU) != 0xdc) goto LAB_001127b2;
              condition = ~(uint)(byte)buf[1] & 1;
            }
            iVar6 = 0;
            _ok(condition,"mp_check_array(data, d1) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x18c,"mp_check_array(16) == 0");
            if ((buf[1] & 0x40U) == 0) {
              uVar7 = (byte)buf[1] & 0xf;
            }
            else if ((buf[1] & 1U) == 0) {
              uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
              iVar6 = 1;
            }
            else {
              uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
              uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                      CONCAT13(buf[5],uVar2) << 0x18;
              iVar6 = 0;
            }
            uVar20 = 0;
            _ok((uint)(uVar7 == 0x10),"mp_decode_array(&d2 COMPLEX(COMMA &ext_type)) == (16)",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x18c,"mp_decode(mp_encode(16)) == 16");
            _ok(1,"(d1 - data) == (3)",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x18c,"len(mp_encode_array(16)");
            _ok(iVar6,"d1 == d2",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x18c,"len(mp_decode_array(16))");
            _ok(1,"mp_sizeof_array(16) == 3",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x18c,"mp_sizeof_array(16)");
            _ok((uint)(buf[3] == '\x10' && CONCAT11(buf[2],buf[1]) == 0xdc),
                "memcmp(data, (\"\\xdc\\x00\\x10\"), (3)) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x18c,"mp_encode(16) == \"\\xdc\\x00\\x10\"");
            buf[1] = -0x24;
            buf[2] = -1;
            buf[3] = -2;
            _space(*(FILE **)pcVar27);
            fwrite("# ",2,1,*(FILE **)pcVar27);
            fwrite("array 0xfffe",0xc,1,*(FILE **)pcVar27);
            fputc(10,*(FILE **)pcVar27);
            if (pmVar29[(uint)(byte)buf[1]] == MP_ARRAY) {
              if ((buf[1] & 0x40U) != 0) {
                if ((buf[1] & 0xfeU) != 0xdc) goto LAB_001127b2;
                uVar20 = ~(uint)(byte)buf[1] & 1;
              }
              iVar6 = 0;
              _ok(uVar20,"mp_check_array(data, d1) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x18d,"mp_check_array(0xfffe) == 0");
              if ((buf[1] & 0x40U) == 0) {
                uVar7 = (byte)buf[1] & 0xf;
              }
              else if ((buf[1] & 1U) == 0) {
                uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
                iVar6 = 1;
              }
              else {
                uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                        CONCAT13(buf[5],uVar2) << 0x18;
                iVar6 = 0;
              }
              uVar20 = 0;
              _ok((uint)(uVar7 == 0xfffe),
                  "mp_decode_array(&d2 COMPLEX(COMMA &ext_type)) == (0xfffe)",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x18d,"mp_decode(mp_encode(0xfffe)) == 0xfffe");
              _ok(1,"(d1 - data) == (3)",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x18d,"len(mp_encode_array(0xfffe)");
              _ok(iVar6,"d1 == d2",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x18d,"len(mp_decode_array(0xfffe))");
              _ok(1,"mp_sizeof_array(0xfffe) == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x18d,"mp_sizeof_array(0xfffe)");
              _ok((uint)(buf[3] == -2 && CONCAT11(buf[2],buf[1]) == -0x24),
                  "memcmp(data, (\"\\xdc\\xff\\xfe\"), (3)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x18d,"mp_encode(0xfffe) == \"\\xdc\\xff\\xfe\"");
              buf[1] = -0x24;
              buf[2] = -1;
              buf[3] = -1;
              _space(*(FILE **)pcVar27);
              fwrite("# ",2,1,*(FILE **)pcVar27);
              fwrite("array 0xffff",0xc,1,*(FILE **)pcVar27);
              fputc(10,*(FILE **)pcVar27);
              if (pmVar29[(uint)(byte)buf[1]] == MP_ARRAY) {
                if ((buf[1] & 0x40U) != 0) {
                  if ((buf[1] & 0xfeU) != 0xdc) goto LAB_001127b2;
                  uVar20 = ~(uint)(byte)buf[1] & 1;
                }
                iVar6 = 0;
                _ok(uVar20,"mp_check_array(data, d1) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x18e,"mp_check_array(0xffff) == 0");
                if ((buf[1] & 0x40U) == 0) {
                  uVar7 = (byte)buf[1] & 0xf;
                }
                else if ((buf[1] & 1U) == 0) {
                  uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
                  iVar6 = 1;
                }
                else {
                  uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                  uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                          CONCAT13(buf[5],uVar2) << 0x18;
                  iVar6 = 0;
                }
                uVar20 = 0;
                _ok((uint)(uVar7 == 0xffff),
                    "mp_decode_array(&d2 COMPLEX(COMMA &ext_type)) == (0xffff)",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x18e,"mp_decode(mp_encode(0xffff)) == 0xffff");
                _ok(1,"(d1 - data) == (3)",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x18e,"len(mp_encode_array(0xffff)");
                _ok(iVar6,"d1 == d2",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x18e,"len(mp_decode_array(0xffff))");
                _ok(1,"mp_sizeof_array(0xffff) == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x18e,"mp_sizeof_array(0xffff)");
                _ok((uint)(buf[3] == -1 && CONCAT11(buf[2],buf[1]) == -0x24),
                    "memcmp(data, (\"\\xdc\\xff\\xff\"), (3)) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x18e,"mp_encode(0xffff) == \"\\xdc\\xff\\xff\"");
                buf[1] = -0x23;
                buf[2] = '\0';
                buf[3] = '\x01';
                buf[4] = '\0';
                buf[5] = '\0';
                _space(*(FILE **)pcVar27);
                fwrite("# ",2,1,*(FILE **)pcVar27);
                fwrite("array 0x10000",0xd,1,*(FILE **)pcVar27);
                fputc(10,*(FILE **)pcVar27);
                if (pmVar29[(uint)(byte)buf[1]] == MP_ARRAY) {
                  if ((buf[1] & 0x40U) != 0) {
                    if ((buf[1] & 0xfeU) != 0xdc) goto LAB_001127b2;
                    uVar20 = (byte)buf[1] & 1;
                  }
                  iVar6 = 0;
                  _ok(uVar20,"mp_check_array(data, d1) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,399,"mp_check_array(0x10000) == 0");
                  if ((buf[1] & 0x40U) == 0) {
                    uVar7 = 0;
                  }
                  else {
                    uVar7 = 0;
                    if ((buf[1] & 1U) != 0) {
                      uVar7 = (uint)(CONCAT13(buf[5],CONCAT12(buf[4],CONCAT11(buf[3],buf[2]))) ==
                                    0x100);
                      iVar6 = 1;
                    }
                  }
                  uVar20 = 0;
                  _ok(uVar7,"mp_decode_array(&d2 COMPLEX(COMMA &ext_type)) == (0x10000)",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,399,"mp_decode(mp_encode(0x10000)) == 0x10000");
                  _ok(1,"(d1 - data) == (5)",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,399,"len(mp_encode_array(0x10000)");
                  _ok(iVar6,"d1 == d2",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,399,"len(mp_decode_array(0x10000))");
                  _ok(1,"mp_sizeof_array(0x10000) == 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,399,"mp_sizeof_array(0x10000)");
                  _ok((uint)(buf[5] == '\0' &&
                            CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0x100dd),
                      "memcmp(data, (\"\\xdd\\x00\\x01\\x00\\x00\"), (5)) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,399,"mp_encode(0x10000) == \"\\xdd\\x00\\x01\\x00\\x00\"");
                  buf[1] = -0x23;
                  buf[2] = -1;
                  buf[3] = -1;
                  buf[4] = -1;
                  buf[5] = -2;
                  _space(*(FILE **)pcVar27);
                  fwrite("# ",2,1,*(FILE **)pcVar27);
                  fwrite("array 0xfffffffeU",0x11,1,*(FILE **)pcVar27);
                  fputc(10,*(FILE **)pcVar27);
                  if (pmVar29[(uint)(byte)buf[1]] == MP_ARRAY) {
                    if ((buf[1] & 0x40U) != 0) {
                      if ((buf[1] & 0xfeU) != 0xdc) goto LAB_001127b2;
                      uVar20 = (byte)buf[1] & 1;
                    }
                    iVar6 = 0;
                    _ok(uVar20,"mp_check_array(data, d1) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                        ,400,"mp_check_array(0xfffffffeU) == 0");
                    if ((buf[1] & 0x40U) == 0) {
                      uVar7 = 0;
                    }
                    else {
                      uVar7 = 0;
                      if ((buf[1] & 1U) != 0) {
                        uVar7 = (uint)(CONCAT13(buf[5],CONCAT12(buf[4],CONCAT11(buf[3],buf[2]))) ==
                                      -0x1000001);
                        iVar6 = 1;
                      }
                    }
                    uVar20 = 0;
                    _ok(uVar7,"mp_decode_array(&d2 COMPLEX(COMMA &ext_type)) == (0xfffffffeU)",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                        ,400,"mp_decode(mp_encode(0xfffffffeU)) == 0xfffffffeU");
                    _ok(1,"(d1 - data) == (5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                        ,400,"len(mp_encode_array(0xfffffffeU)");
                    _ok(iVar6,"d1 == d2",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                        ,400,"len(mp_decode_array(0xfffffffeU))");
                    _ok(1,"mp_sizeof_array(0xfffffffeU) == 5",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                        ,400,"mp_sizeof_array(0xfffffffeU)");
                    _ok((uint)(buf[5] == -2 &&
                              CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == -0x23),
                        "memcmp(data, (\"\\xdd\\xff\\xff\\xff\\xfe\"), (5)) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                        ,400,"mp_encode(0xfffffffeU) == \"\\xdd\\xff\\xff\\xff\\xfe\"");
                    buf[1] = -0x23;
                    buf[2] = -1;
                    buf[3] = -1;
                    buf[4] = -1;
                    buf[5] = -1;
                    _space(*(FILE **)pcVar27);
                    fwrite("# ",2,1,*(FILE **)pcVar27);
                    fwrite("array 0xffffffffU",0x11,1,*(FILE **)pcVar27);
                    fputc(10,*(FILE **)pcVar27);
                    if (pmVar29[(uint)(byte)buf[1]] == MP_ARRAY) {
                      if ((buf[1] & 0x40U) != 0) {
                        if ((buf[1] & 0xfeU) != 0xdc) {
LAB_001127b2:
                          __assert_fail("c >= 0xdc && c <= 0xdd",
                                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                                        ,0x797,
                                        "ptrdiff_t mp_check_array(const char *, const char *)");
                        }
                        uVar20 = (byte)buf[1] & 1;
                      }
                      iVar6 = 0;
                      _ok(uVar20,"mp_check_array(data, d1) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x191,"mp_check_array(0xffffffffU) == 0");
                      if ((buf[1] & 0x40U) == 0) {
                        uVar7 = 0;
                      }
                      else {
                        uVar7 = 0;
                        if ((buf[1] & 1U) != 0) {
                          uVar7 = (uint)(CONCAT13(buf[5],CONCAT12(buf[4],CONCAT11(buf[3],buf[2])))
                                        == -1);
                          iVar6 = 1;
                        }
                      }
                      _ok(uVar7,"mp_decode_array(&d2 COMPLEX(COMMA &ext_type)) == (0xffffffffU)",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x191,"mp_decode(mp_encode(0xffffffffU)) == 0xffffffffU");
                      _ok(1,"(d1 - data) == (5)",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x191,"len(mp_encode_array(0xffffffffU)");
                      _ok(iVar6,"d1 == d2",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x191,"len(mp_decode_array(0xffffffffU))");
                      _ok(1,"mp_sizeof_array(0xffffffffU) == 5",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x191,"mp_sizeof_array(0xffffffffU)");
                      _ok((uint)(buf[5] == -1 &&
                                CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == -0x23),
                          "memcmp(data, (\"\\xdd\\xff\\xff\\xff\\xff\"), (5)) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x191,"mp_encode(0xffffffffU) == \"\\xdd\\xff\\xff\\xff\\xff\"");
                      _space(*(FILE **)pcVar27);
                      fwrite("# ",2,1,*(FILE **)pcVar27);
                      fwrite("array_safe",10,1,*(FILE **)pcVar27);
                      fputc(10,*(FILE **)pcVar27);
                      _ok(1,"-sz == (3)",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x193,"size after mp_encode_array_safe(NULL, &sz)");
                      _ok(1,"d == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x193,"mp_encode_array_safe(NULL, &sz)");
                      buf[1] = -0x24;
                      buf[2] = -1;
                      buf[3] = -1;
                      _ok(1,"sz == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x193,"size after mp_encode_array_safe(buf, &sz)");
                      _ok(1,"(d - data) == (3)",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x193,"len of mp_encode_array_safe(buf, &sz)");
                      _ok((uint)(buf[3] == -1 && CONCAT11(buf[2],buf[1]) == -0x24),
                          "memcmp(data, (\"\\xdc\\xff\\xff\"), (3)) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x193,"mp_encode_array_safe(buf, &sz)");
                      _ok(1,"sz == -1",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x193,"size after mp_encode_array_safe(buf, &sz) overflow");
                      _ok(1,"d == data",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x193,"mp_encode_array_safe(buf, &sz) overflow");
                      buf[1] = -0x24;
                      buf[2] = -1;
                      buf[3] = -1;
                      _ok(1,"(d - data) == (3)",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x193,"len of mp_encode_array_safe(buf, NULL)");
                      _ok((uint)(buf[3] == -1 && CONCAT11(buf[2],buf[1]) == -0x24),
                          "memcmp(data, (\"\\xdc\\xff\\xff\"), (3)) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x193,"mp_encode_array_safe(buf, NULL)");
                      _space((FILE *)_stdout);
                      printf("# *** %s: done ***\n","test_arrays");
                      check_plan();
                      _plan(0x3f,true);
                      _space((FILE *)_stdout);
                      printf("# *** %s ***\n","test_maps");
                      buf[1] = -0x80;
                      _space((FILE *)_stdout);
                      fwrite("# ",2,1,_stdout);
                      fwrite("map 0",5,1,_stdout);
                      fputc(10,_stdout);
                      if (mp_type_hint[(byte)buf[1]] != MP_MAP) goto LAB_001125a0;
                      if ((buf[1] & 0xf0U) != 0x80) {
                        main_cold_4();
                      }
                      iVar6 = 0;
                      _ok(0,"mp_check_map(data, d1) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x19f,"mp_check_map(0) == 0");
                      uVar7 = (uint)(byte)buf[1];
                      if (uVar7 == 0xdf) {
                        uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                        uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8
                                | CONCAT13(buf[5],uVar2) << 0x18;
LAB_0010e305:
                        _ok((uint)(uVar7 == 0),"mp_decode_map(&d2 COMPLEX(COMMA &ext_type)) == (0)",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x19f,"mp_decode(mp_encode(0)) == 0");
                        _ok(1,"(d1 - data) == (1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x19f,"len(mp_encode_map(0)");
                        _ok(iVar6,"d1 == d2",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x19f,"len(mp_decode_map(0))");
                        _ok(1,"mp_sizeof_map(0) == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x19f,"mp_sizeof_map(0)");
                        _ok((uint)(buf[1] == -0x80),"memcmp(data, (\"\\x80\"), (1)) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x19f,"mp_encode(0) == \"\\x80\"");
                        buf[1] = -0x7f;
                        _space((FILE *)_stdout);
                        fwrite("# ",2,1,_stdout);
                        fwrite("map 1",5,1,_stdout);
                        fputc(10,_stdout);
                        if (mp_type_hint[(byte)buf[1]] != MP_MAP) goto LAB_001125a0;
                        if ((buf[1] & 0xf0U) != 0x80) {
                          main_cold_5();
                        }
                        iVar6 = 0;
                        _ok(0,"mp_check_map(data, d1) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a0,"mp_check_map(1) == 0");
                        uVar7 = (uint)(byte)buf[1];
                        if (uVar7 == 0xdf) {
                          uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                          uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 |
                                  (uVar2 & 0xff00) << 8 | CONCAT13(buf[5],uVar2) << 0x18;
                        }
                        else if (uVar7 == 0xde) {
                          uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]
                                                );
                          iVar6 = 0;
                        }
                        else {
                          if (-0x71 < buf[1]) goto LAB_00112451;
                          uVar7 = uVar7 & 0xf;
                          iVar6 = 1;
                        }
                        _ok((uint)(uVar7 == 1),"mp_decode_map(&d2 COMPLEX(COMMA &ext_type)) == (1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a0,"mp_decode(mp_encode(1)) == 1");
                        _ok(1,"(d1 - data) == (1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a0,"len(mp_encode_map(1)");
                        _ok(iVar6,"d1 == d2",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a0,"len(mp_decode_map(1))");
                        _ok(1,"mp_sizeof_map(1) == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a0,"mp_sizeof_map(1)");
                        _ok((uint)(buf[1] == -0x7f),"memcmp(data, (\"\\x81\"), (1)) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a0,"mp_encode(1) == \"\\x81\"");
                        buf[1] = -0x71;
                        _space((FILE *)_stdout);
                        fwrite("# ",2,1,_stdout);
                        fwrite("map 15",6,1,_stdout);
                        fputc(10,_stdout);
                        if (mp_type_hint[(byte)buf[1]] != MP_MAP) goto LAB_001125a0;
                        if ((buf[1] & 0xf0U) != 0x80) {
                          main_cold_6();
                        }
                        iVar6 = 0;
                        _ok(0,"mp_check_map(data, d1) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a1,"mp_check_map(15) == 0");
                        uVar7 = (uint)(byte)buf[1];
                        if (uVar7 == 0xdf) {
                          uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                          uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 |
                                  (uVar2 & 0xff00) << 8 | CONCAT13(buf[5],uVar2) << 0x18;
                        }
                        else if (uVar7 == 0xde) {
                          uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]
                                                );
                          iVar6 = 0;
                        }
                        else {
                          if (-0x71 < buf[1]) goto LAB_00112456;
                          uVar7 = uVar7 & 0xf;
                          iVar6 = 1;
                        }
                        uVar20 = 0;
                        _ok((uint)(uVar7 == 0xf),
                            "mp_decode_map(&d2 COMPLEX(COMMA &ext_type)) == (15)",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a1,"mp_decode(mp_encode(15)) == 15");
                        _ok(1,"(d1 - data) == (1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a1,"len(mp_encode_map(15)");
                        _ok(iVar6,"d1 == d2",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a1,"len(mp_decode_map(15))");
                        _ok(1,"mp_sizeof_map(15) == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a1,"mp_sizeof_map(15)");
                        _ok((uint)(buf[1] == -0x71),"memcmp(data, (\"\\x8f\"), (1)) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a1,"mp_encode(15) == \"\\x8f\"");
                        buf[1] = -0x22;
                        buf[2] = '\0';
                        buf[3] = '\x10';
                        _space((FILE *)_stdout);
                        fwrite("# ",2,1,_stdout);
                        fwrite("map 16",6,1,_stdout);
                        fputc(10,_stdout);
                        uVar7 = (uint)(byte)buf[1];
                        if (mp_type_hint[uVar7] != MP_MAP) goto LAB_001125a0;
                        if ((uVar7 & 0xfffffff0) != 0x80) {
                          if ((buf[1] & 0xfeU) != 0xde) goto LAB_001127d1;
                          uVar20 = ~uVar7 & 1;
                        }
                        iVar6 = 0;
                        _ok(uVar20,"mp_check_map(data, d1) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a2,"mp_check_map(16) == 0");
                        uVar7 = (uint)(byte)buf[1];
                        if (uVar7 == 0xdf) {
                          uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                          uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 |
                                  (uVar2 & 0xff00) << 8 | CONCAT13(buf[5],uVar2) << 0x18;
                        }
                        else if (uVar7 == 0xde) {
                          uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]
                                                );
                          iVar6 = 1;
                        }
                        else {
                          if (-0x71 < buf[1]) goto LAB_0011245b;
                          uVar7 = uVar7 & 0xf;
                          iVar6 = 0;
                        }
                        uVar20 = 0;
                        _ok((uint)(uVar7 == 0x10),
                            "mp_decode_map(&d2 COMPLEX(COMMA &ext_type)) == (16)",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a2,"mp_decode(mp_encode(16)) == 16");
                        _ok(1,"(d1 - data) == (3)",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a2,"len(mp_encode_map(16)");
                        _ok(iVar6,"d1 == d2",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a2,"len(mp_decode_map(16))");
                        _ok(1,"mp_sizeof_map(16) == 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a2,"mp_sizeof_map(16)");
                        _ok((uint)(buf[3] == '\x10' && CONCAT11(buf[2],buf[1]) == 0xde),
                            "memcmp(data, (\"\\xde\\x00\\x10\"), (3)) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a2,"mp_encode(16) == \"\\xde\\x00\\x10\"");
                        buf[1] = -0x22;
                        buf[2] = -1;
                        buf[3] = -2;
                        _space((FILE *)_stdout);
                        fwrite("# ",2,1,_stdout);
                        fwrite("map 0xfffe",10,1,_stdout);
                        fputc(10,_stdout);
                        uVar7 = (uint)(byte)buf[1];
                        if (mp_type_hint[uVar7] != MP_MAP) goto LAB_001125a0;
                        if ((uVar7 & 0xfffffff0) != 0x80) {
                          if ((buf[1] & 0xfeU) != 0xde) goto LAB_001127d1;
                          uVar20 = ~uVar7 & 1;
                        }
                        iVar6 = 0;
                        _ok(uVar20,"mp_check_map(data, d1) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a3,"mp_check_map(0xfffe) == 0");
                        uVar7 = (uint)(byte)buf[1];
                        if (uVar7 == 0xdf) {
                          uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                          uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 |
                                  (uVar2 & 0xff00) << 8 | CONCAT13(buf[5],uVar2) << 0x18;
                        }
                        else if (uVar7 == 0xde) {
                          uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]
                                                );
                          iVar6 = 1;
                        }
                        else {
                          if (-0x71 < buf[1]) goto LAB_00112460;
                          uVar7 = uVar7 & 0xf;
                          iVar6 = 0;
                        }
                        uVar20 = 0;
                        _ok((uint)(uVar7 == 0xfffe),
                            "mp_decode_map(&d2 COMPLEX(COMMA &ext_type)) == (0xfffe)",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a3,"mp_decode(mp_encode(0xfffe)) == 0xfffe");
                        _ok(1,"(d1 - data) == (3)",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a3,"len(mp_encode_map(0xfffe)");
                        _ok(iVar6,"d1 == d2",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a3,"len(mp_decode_map(0xfffe))");
                        _ok(1,"mp_sizeof_map(0xfffe) == 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a3,"mp_sizeof_map(0xfffe)");
                        _ok((uint)(buf[3] == -2 && CONCAT11(buf[2],buf[1]) == -0x22),
                            "memcmp(data, (\"\\xde\\xff\\xfe\"), (3)) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a3,"mp_encode(0xfffe) == \"\\xde\\xff\\xfe\"");
                        buf[1] = -0x22;
                        buf[2] = -1;
                        buf[3] = -1;
                        _space((FILE *)_stdout);
                        fwrite("# ",2,1,_stdout);
                        fwrite("map 0xffff",10,1,_stdout);
                        fputc(10,_stdout);
                        uVar7 = (uint)(byte)buf[1];
                        if (mp_type_hint[uVar7] != MP_MAP) goto LAB_001125a0;
                        if ((uVar7 & 0xfffffff0) != 0x80) {
                          if ((buf[1] & 0xfeU) != 0xde) goto LAB_001127d1;
                          uVar20 = ~uVar7 & 1;
                        }
                        iVar6 = 0;
                        _ok(uVar20,"mp_check_map(data, d1) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a4,"mp_check_map(0xffff) == 0");
                        uVar7 = (uint)(byte)buf[1];
                        if (uVar7 == 0xdf) {
                          uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                          uVar7 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 |
                                  (uVar2 & 0xff00) << 8 | CONCAT13(buf[5],uVar2) << 0x18;
                        }
                        else if (uVar7 == 0xde) {
                          uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]
                                                );
                          iVar6 = 1;
                        }
                        else {
                          if (-0x71 < buf[1]) goto LAB_00112465;
                          uVar7 = uVar7 & 0xf;
                          iVar6 = 0;
                        }
                        uVar20 = 0;
                        _ok((uint)(uVar7 == 0xffff),
                            "mp_decode_map(&d2 COMPLEX(COMMA &ext_type)) == (0xffff)",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a4,"mp_decode(mp_encode(0xffff)) == 0xffff");
                        _ok(1,"(d1 - data) == (3)",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a4,"len(mp_encode_map(0xffff)");
                        _ok(iVar6,"d1 == d2",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a4,"len(mp_decode_map(0xffff))");
                        _ok(1,"mp_sizeof_map(0xffff) == 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a4,"mp_sizeof_map(0xffff)");
                        _ok((uint)(buf[3] == -1 && CONCAT11(buf[2],buf[1]) == -0x22),
                            "memcmp(data, (\"\\xde\\xff\\xff\"), (3)) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a4,"mp_encode(0xffff) == \"\\xde\\xff\\xff\"");
                        buf[1] = -0x21;
                        buf[2] = '\0';
                        buf[3] = '\x01';
                        buf[4] = '\0';
                        buf[5] = '\0';
                        _space((FILE *)_stdout);
                        fwrite("# ",2,1,_stdout);
                        fwrite("map 0x10000",0xb,1,_stdout);
                        fputc(10,_stdout);
                        uVar7 = (uint)(byte)buf[1];
                        if (mp_type_hint[uVar7] != MP_MAP) goto LAB_001125a0;
                        if ((uVar7 & 0xfffffff0) != 0x80) {
                          if ((buf[1] & 0xfeU) != 0xde) goto LAB_001127d1;
                          uVar20 = uVar7 & 1;
                        }
                        iVar6 = 0;
                        _ok(uVar20,"mp_check_map(data, d1) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a5,"mp_check_map(0x10000) == 0");
                        if (buf[1] == -0x22) {
                          uVar7 = 0;
                        }
                        else if (buf[1] == -0x21) {
                          uVar7 = (uint)(CONCAT13(buf[5],CONCAT12(buf[4],CONCAT11(buf[3],buf[2])))
                                        == 0x100);
                          iVar6 = 1;
                        }
                        else {
                          uVar7 = 0;
                          if (-0x71 < buf[1]) goto LAB_0011246a;
                        }
                        uVar20 = 0;
                        _ok(uVar7,"mp_decode_map(&d2 COMPLEX(COMMA &ext_type)) == (0x10000)",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a5,"mp_decode(mp_encode(0x10000)) == 0x10000");
                        _ok(1,"(d1 - data) == (5)",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a5,"len(mp_encode_map(0x10000)");
                        _ok(iVar6,"d1 == d2",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a5,"len(mp_decode_map(0x10000))");
                        _ok(1,"mp_sizeof_map(0x10000) == 5",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a5,"mp_sizeof_map(0x10000)");
                        _ok((uint)(buf[5] == '\0' &&
                                  CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) ==
                                  0x100df),"memcmp(data, (\"\\xdf\\x00\\x01\\x00\\x00\"), (5)) == 0"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a5,"mp_encode(0x10000) == \"\\xdf\\x00\\x01\\x00\\x00\"");
                        buf[1] = -0x21;
                        buf[2] = -1;
                        buf[3] = -1;
                        buf[4] = -1;
                        buf[5] = -2;
                        _space((FILE *)_stdout);
                        fwrite("# ",2,1,_stdout);
                        fwrite("map 0xfffffffeU",0xf,1,_stdout);
                        fputc(10,_stdout);
                        uVar7 = (uint)(byte)buf[1];
                        if (mp_type_hint[uVar7] != MP_MAP) goto LAB_001125a0;
                        if ((uVar7 & 0xfffffff0) != 0x80) {
                          if ((buf[1] & 0xfeU) != 0xde) goto LAB_001127d1;
                          uVar20 = uVar7 & 1;
                        }
                        iVar6 = 0;
                        _ok(uVar20,"mp_check_map(data, d1) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a6,"mp_check_map(0xfffffffeU) == 0");
                        if (buf[1] == -0x22) {
                          uVar7 = 0;
                        }
                        else if (buf[1] == -0x21) {
                          uVar7 = (uint)(CONCAT13(buf[5],CONCAT12(buf[4],CONCAT11(buf[3],buf[2])))
                                        == -0x1000001);
                          iVar6 = 1;
                        }
                        else {
                          uVar7 = 0;
                          if (-0x71 < buf[1]) goto LAB_0011246f;
                        }
                        uVar20 = 0;
                        _ok(uVar7,"mp_decode_map(&d2 COMPLEX(COMMA &ext_type)) == (0xfffffffeU)",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a6,"mp_decode(mp_encode(0xfffffffeU)) == 0xfffffffeU");
                        _ok(1,"(d1 - data) == (5)",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a6,"len(mp_encode_map(0xfffffffeU)");
                        _ok(iVar6,"d1 == d2",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a6,"len(mp_decode_map(0xfffffffeU))");
                        _ok(1,"mp_sizeof_map(0xfffffffeU) == 5",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a6,"mp_sizeof_map(0xfffffffeU)");
                        _ok((uint)(buf[5] == -2 &&
                                  CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == -0x21
                                  ),"memcmp(data, (\"\\xdf\\xff\\xff\\xff\\xfe\"), (5)) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a6,"mp_encode(0xfffffffeU) == \"\\xdf\\xff\\xff\\xff\\xfe\"");
                        buf[1] = -0x21;
                        buf[2] = -1;
                        buf[3] = -1;
                        buf[4] = -1;
                        buf[5] = -1;
                        _space((FILE *)_stdout);
                        fwrite("# ",2,1,_stdout);
                        fwrite("map 0xffffffffU",0xf,1,_stdout);
                        fputc(10,_stdout);
                        uVar7 = (uint)(byte)buf[1];
                        if (mp_type_hint[uVar7] != MP_MAP) {
LAB_001125a0:
                          __assert_fail("mp_typeof(*cur) == MP_MAP",
                                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                                        ,0x7e5,"ptrdiff_t mp_check_map(const char *, const char *)")
                          ;
                        }
                        if ((uVar7 & 0xfffffff0) != 0x80) {
                          if ((buf[1] & 0xfeU) != 0xde) {
LAB_001127d1:
                            __assert_fail("c >= 0xde && c <= 0xdf",
                                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                                          ,0x7ea,
                                          "ptrdiff_t mp_check_map(const char *, const char *)");
                          }
                          uVar20 = uVar7 & 1;
                        }
                        iVar6 = 0;
                        _ok(uVar20,"mp_check_map(data, d1) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x1a7,"mp_check_map(0xffffffffU) == 0");
                        if (buf[1] == -0x22) {
                          uVar7 = 0;
LAB_0010f034:
                          lVar17 = 0;
                          _ok(uVar7,"mp_decode_map(&d2 COMPLEX(COMMA &ext_type)) == (0xffffffffU)",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x1a7,"mp_decode(mp_encode(0xffffffffU)) == 0xffffffffU");
                          _ok(1,"(d1 - data) == (5)",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x1a7,"len(mp_encode_map(0xffffffffU)");
                          _ok(iVar6,"d1 == d2",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x1a7,"len(mp_decode_map(0xffffffffU))");
                          _ok(1,"mp_sizeof_map(0xffffffffU) == 5",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x1a7,"mp_sizeof_map(0xffffffffU)");
                          _ok((uint)(buf[5] == -1 &&
                                    CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) ==
                                    -0x21),"memcmp(data, (\"\\xdf\\xff\\xff\\xff\\xff\"), (5)) == 0"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x1a7,"mp_encode(0xffffffffU) == \"\\xdf\\xff\\xff\\xff\\xff\"");
                          _space((FILE *)_stdout);
                          fwrite("# ",2,1,_stdout);
                          fwrite("map_safe",8,1,_stdout);
                          fputc(10,_stdout);
                          _ok(1,"-sz == (5)",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x1a9,"size after mp_encode_map_safe(NULL, &sz)");
                          _ok(1,"d == NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x1a9,"mp_encode_map_safe(NULL, &sz)");
                          buf[1] = -0x21;
                          buf[2] = -1;
                          buf[3] = -1;
                          buf[4] = -1;
                          buf[5] = -2;
                          _ok(1,"sz == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x1a9,"size after mp_encode_map_safe(buf, &sz)");
                          _ok(1,"(d - data) == (5)",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x1a9,"len of mp_encode_map_safe(buf, &sz)");
                          _ok((uint)(buf[5] == -2 &&
                                    CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) ==
                                    -0x21),"memcmp(data, (\"\\xdf\\xff\\xff\\xff\\xfe\"), (5)) == 0"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x1a9,"mp_encode_map_safe(buf, &sz)");
                          _ok(1,"sz == -1",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x1a9,"size after mp_encode_map_safe(buf, &sz) overflow");
                          _ok(1,"d == data",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x1a9,"mp_encode_map_safe(buf, &sz) overflow");
                          buf[1] = -0x21;
                          buf[2] = -1;
                          buf[3] = -1;
                          buf[4] = -1;
                          buf[5] = -2;
                          _ok(1,"(d - data) == (5)",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x1a9,"len of mp_encode_map_safe(buf, NULL)");
                          _ok((uint)(buf[5] == -2 &&
                                    CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) ==
                                    -0x21),"memcmp(data, (\"\\xdf\\xff\\xff\\xff\\xfe\"), (5)) == 0"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x1a9,"mp_encode_map_safe(buf, NULL)");
                          _space((FILE *)_stdout);
                          printf("# *** %s: done ***\n","test_maps");
                          check_plan();
                          _plan(0xb,true);
                          _space((FILE *)_stdout);
                          printf("# *** %s ***\n","test_memcpy");
                          auVar32 = _DAT_0013f1c0;
                          iVar6 = (int)DAT_0013f1d0;
                          iVar9 = DAT_0013f1d0._4_4_;
                          auVar31 = _DAT_0013f1b0;
                          do {
                            bVar30 = SUB164(auVar31 ^ auVar32,4) == iVar9 &&
                                     SUB164(auVar31 ^ auVar32,0) < iVar6;
                            if (bVar30) {
                              cVar19 = (char)lVar17 + 'a';
                              if (lVar17 == 0x1a) {
                                cVar19 = 'a';
                              }
                              str[lVar17] = cVar19;
                            }
                            if (bVar30) {
                              str[lVar17 + 1] = (char)lVar17 + 'b';
                            }
                            lVar17 = lVar17 + 2;
                            lVar18 = auVar31._8_8_;
                            auVar31._0_8_ = auVar31._0_8_ + 2;
                            auVar31._8_8_ = lVar18 + 2;
                          } while (lVar17 != 0x1c);
                          buf[0x12] = str[0x11];
                          buf[0x11] = str[0x10];
                          buf[0x13] = str[0x12];
                          buf[0x15] = str[0x14];
                          buf[0x14] = str[0x13];
                          buf[0x16] = str[0x15];
                          buf[0x17] = str[0x16];
                          buf[0x18] = str[0x17];
                          buf[0x19] = str[0x18];
                          buf[0x1a] = str[0x19];
                          buf[0x1b] = str[0x1a];
                          buf[1] = str[0];
                          buf[2] = str[1];
                          buf[3] = str[2];
                          buf[4] = str[3];
                          buf[5] = str[4];
                          buf[6] = str[5];
                          buf[7] = str[6];
                          buf[8] = str[7];
                          buf[9] = str[8];
                          buf[10] = str[9];
                          buf[0xb] = str[10];
                          buf[0xc] = str[0xb];
                          buf[0xd] = str[0xc];
                          buf[0xe] = str[0xd];
                          buf[0xf] = str[0xe];
                          buf[0x10] = str[0xf];
                          _ok(1,"d - data == len",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x282,"len of mp_memcpy()");
                          auVar35[0] = -(str[0xb] == buf[0xc]);
                          auVar35[1] = -(str[0xc] == buf[0xd]);
                          auVar35[2] = -(str[0xd] == buf[0xe]);
                          auVar35[3] = -(str[0xe] == buf[0xf]);
                          auVar35[4] = -(str[0xf] == buf[0x10]);
                          auVar35[5] = -(str[0x10] == SUB41(buf._16_4_,1));
                          auVar35[6] = -(str[0x11] == SUB41(buf._16_4_,2));
                          auVar35[7] = -(str[0x12] == SUB41(buf._16_4_,3));
                          auVar35[8] = -(str[0x13] == (char)buf._20_8_);
                          auVar35[9] = -(str[0x14] == SUB81(buf._20_8_,1));
                          auVar35[10] = -(str[0x15] == SUB81(buf._20_8_,2));
                          auVar35[0xb] = -(str[0x16] == SUB81(buf._20_8_,3));
                          auVar35[0xc] = -(str[0x17] == SUB81(buf._20_8_,4));
                          auVar35[0xd] = -(str[0x18] == SUB81(buf._20_8_,5));
                          auVar35[0xe] = -(str[0x19] == SUB81(buf._20_8_,6));
                          auVar35[0xf] = -(str[0x1a] == SUB81(buf._20_8_,7));
                          auVar32[0] = -(buf[1] == str[0]);
                          auVar32[1] = -(buf[2] == str[1]);
                          auVar32[2] = -(buf[3] == str[2]);
                          auVar32[3] = -(buf[4] == str[3]);
                          auVar32[4] = -(buf[5] == str[4]);
                          auVar32[5] = -(buf[6] == str[5]);
                          auVar32[6] = -(buf[7] == str[6]);
                          auVar32[7] = -(buf[8] == str[7]);
                          auVar32[8] = -(buf[9] == str[8]);
                          auVar32[9] = -(buf[10] == str[9]);
                          auVar32[10] = -(buf[0xb] == str[10]);
                          auVar32[0xb] = -(buf[0xc] == str[0xb]);
                          auVar32[0xc] = -(buf[0xd] == str[0xc]);
                          auVar32[0xd] = -(buf[0xe] == str[0xd]);
                          auVar32[0xe] = -(buf[0xf] == str[0xe]);
                          auVar32[0xf] = -(buf[0x10] == str[0xf]);
                          auVar32 = auVar32 & auVar35;
                          _ok((uint)((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                                              (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                                              (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                                              (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                                              (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                                              (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                                              (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                                              (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                                              (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                                              (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                                              (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                                              (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                                              (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                                              (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                                              (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                                             (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) == 0xffff),
                              "memcmp(data, str, len) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x283,"payload of mp_memcpy()");
                          _ok(1,"-sz == len",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x287,"size after mp_memcpy_safe(NULL, &sz)");
                          _ok(1,"d == NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x288,"mp_memcpy_safe(NULL, &sz)");
                          buf[0x12] = str[0x11];
                          buf[0x11] = str[0x10];
                          buf[0x13] = str[0x12];
                          buf[0x15] = str[0x14];
                          buf[0x14] = str[0x13];
                          buf[0x16] = str[0x15];
                          buf[0x17] = str[0x16];
                          buf[0x18] = str[0x17];
                          buf[0x19] = str[0x18];
                          buf[0x1a] = str[0x19];
                          buf[0x1b] = str[0x1a];
                          buf[1] = str[0];
                          buf[2] = str[1];
                          buf[3] = str[2];
                          buf[4] = str[3];
                          buf[5] = str[4];
                          buf[6] = str[5];
                          buf[7] = str[6];
                          buf[8] = str[7];
                          buf[9] = str[8];
                          buf[10] = str[9];
                          buf[0xb] = str[10];
                          buf[0xc] = str[0xb];
                          buf[0xd] = str[0xc];
                          buf[0xe] = str[0xd];
                          buf[0xf] = str[0xe];
                          buf[0x10] = str[0xf];
                          _ok(1,"sz == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x28c,"size after mp_memcpy_safe(buf, &sz)");
                          _ok(1,"d - data == len",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x28d,"len of mp_memcpy_safe(buf, &sz)");
                          auVar36[0] = -(str[0xb] == buf[0xc]);
                          auVar36[1] = -(str[0xc] == buf[0xd]);
                          auVar36[2] = -(str[0xd] == buf[0xe]);
                          auVar36[3] = -(str[0xe] == buf[0xf]);
                          auVar36[4] = -(str[0xf] == buf[0x10]);
                          auVar36[5] = -(str[0x10] == SUB41(buf._16_4_,1));
                          auVar36[6] = -(str[0x11] == SUB41(buf._16_4_,2));
                          auVar36[7] = -(str[0x12] == SUB41(buf._16_4_,3));
                          auVar36[8] = -(str[0x13] == (char)buf._20_8_);
                          auVar36[9] = -(str[0x14] == SUB81(buf._20_8_,1));
                          auVar36[10] = -(str[0x15] == SUB81(buf._20_8_,2));
                          auVar36[0xb] = -(str[0x16] == SUB81(buf._20_8_,3));
                          auVar36[0xc] = -(str[0x17] == SUB81(buf._20_8_,4));
                          auVar36[0xd] = -(str[0x18] == SUB81(buf._20_8_,5));
                          auVar36[0xe] = -(str[0x19] == SUB81(buf._20_8_,6));
                          auVar36[0xf] = -(str[0x1a] == SUB81(buf._20_8_,7));
                          auVar33[0] = -(buf[1] == str[0]);
                          auVar33[1] = -(buf[2] == str[1]);
                          auVar33[2] = -(buf[3] == str[2]);
                          auVar33[3] = -(buf[4] == str[3]);
                          auVar33[4] = -(buf[5] == str[4]);
                          auVar33[5] = -(buf[6] == str[5]);
                          auVar33[6] = -(buf[7] == str[6]);
                          auVar33[7] = -(buf[8] == str[7]);
                          auVar33[8] = -(buf[9] == str[8]);
                          auVar33[9] = -(buf[10] == str[9]);
                          auVar33[10] = -(buf[0xb] == str[10]);
                          auVar33[0xb] = -(buf[0xc] == str[0xb]);
                          auVar33[0xc] = -(buf[0xd] == str[0xc]);
                          auVar33[0xd] = -(buf[0xe] == str[0xd]);
                          auVar33[0xe] = -(buf[0xf] == str[0xe]);
                          auVar33[0xf] = -(buf[0x10] == str[0xf]);
                          auVar33 = auVar33 & auVar36;
                          _ok((uint)((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                                              (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                                              (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                                              (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                                              (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                                              (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                                              (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                                              (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                                              (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                                              (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                                              (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                                              (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                                              (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                                              (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                                              (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                                             (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) == 0xffff),
                              "memcmp(data, str, len) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x28e,"mp_memcpy_safe(buf, &sz)");
                          _ok(1,"sz == -1",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x292,"size after mp_memcpy_safe(buf, &sz) overflow");
                          _ok(1,"d == data",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x293,"mp_memcpy_safe(buf, &sz) overflow");
                          buf[0x12] = str[0x11];
                          buf[0x11] = str[0x10];
                          buf[0x13] = str[0x12];
                          buf[0x15] = str[0x14];
                          buf[0x14] = str[0x13];
                          buf[0x16] = str[0x15];
                          buf[0x17] = str[0x16];
                          buf[0x18] = str[0x17];
                          buf[0x19] = str[0x18];
                          buf[0x1a] = str[0x19];
                          buf[0x1b] = str[0x1a];
                          buf[1] = str[0];
                          buf[2] = str[1];
                          buf[3] = str[2];
                          buf[4] = str[3];
                          buf[5] = str[4];
                          buf[6] = str[5];
                          buf[7] = str[6];
                          buf[8] = str[7];
                          buf[9] = str[8];
                          buf[10] = str[9];
                          buf[0xb] = str[10];
                          buf[0xc] = str[0xb];
                          buf[0xd] = str[0xc];
                          buf[0xe] = str[0xd];
                          buf[0xf] = str[0xe];
                          buf[0x10] = str[0xf];
                          _ok(1,"d - data == len",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x296,"len of (buf, NULL)");
                          auVar37[0] = -(str[0xb] == buf[0xc]);
                          auVar37[1] = -(str[0xc] == buf[0xd]);
                          auVar37[2] = -(str[0xd] == buf[0xe]);
                          auVar37[3] = -(str[0xe] == buf[0xf]);
                          auVar37[4] = -(str[0xf] == buf[0x10]);
                          auVar37[5] = -(str[0x10] == SUB41(buf._16_4_,1));
                          auVar37[6] = -(str[0x11] == SUB41(buf._16_4_,2));
                          auVar37[7] = -(str[0x12] == SUB41(buf._16_4_,3));
                          auVar37[8] = -(str[0x13] == (char)buf._20_8_);
                          auVar37[9] = -(str[0x14] == SUB81(buf._20_8_,1));
                          auVar37[10] = -(str[0x15] == SUB81(buf._20_8_,2));
                          auVar37[0xb] = -(str[0x16] == SUB81(buf._20_8_,3));
                          auVar37[0xc] = -(str[0x17] == SUB81(buf._20_8_,4));
                          auVar37[0xd] = -(str[0x18] == SUB81(buf._20_8_,5));
                          auVar37[0xe] = -(str[0x19] == SUB81(buf._20_8_,6));
                          auVar37[0xf] = -(str[0x1a] == SUB81(buf._20_8_,7));
                          auVar34[0] = -(buf[1] == str[0]);
                          auVar34[1] = -(buf[2] == str[1]);
                          auVar34[2] = -(buf[3] == str[2]);
                          auVar34[3] = -(buf[4] == str[3]);
                          auVar34[4] = -(buf[5] == str[4]);
                          auVar34[5] = -(buf[6] == str[5]);
                          auVar34[6] = -(buf[7] == str[6]);
                          auVar34[7] = -(buf[8] == str[7]);
                          auVar34[8] = -(buf[9] == str[8]);
                          auVar34[9] = -(buf[10] == str[9]);
                          auVar34[10] = -(buf[0xb] == str[10]);
                          auVar34[0xb] = -(buf[0xc] == str[0xb]);
                          auVar34[0xc] = -(buf[0xd] == str[0xc]);
                          auVar34[0xd] = -(buf[0xe] == str[0xd]);
                          auVar34[0xe] = -(buf[0xf] == str[0xe]);
                          auVar34[0xf] = -(buf[0x10] == str[0xf]);
                          auVar34 = auVar34 & auVar37;
                          _ok((uint)((ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                                              (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                                              (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                                              (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                                              (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                                              (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                                              (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                                              (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                                              (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                                              (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                                              (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                                              (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                                              (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                                              (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                                              (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe |
                                             (ushort)(byte)(auVar34[0xf] >> 7) << 0xf) == 0xffff),
                              "memcmp(data, str, len) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x297,"mp_memcpy_safe(buf, NULL)");
                          _space((FILE *)_stdout);
                          printf("# *** %s: done ***\n","test_memcpy");
                          check_plan();
                          _plan(0x34,true);
                          _space((FILE *)_stdout);
                          printf("# *** %s ***\n","test_next_on_arrays");
                          test_next_on_array(0);
                          test_next_on_array(1);
                          test_next_on_array(0xf);
                          test_next_on_array(0x10);
                          test_next_on_array(0x11);
                          test_next_on_array(0xfe);
                          test_next_on_array(0xff);
                          test_next_on_array(0x100);
                          test_next_on_array(0x101);
                          test_next_on_array(0xfffe);
                          test_next_on_array(0xffff);
                          test_next_on_array(0x10000);
                          test_next_on_array(0x10001);
                          _space((FILE *)_stdout);
                          printf("# *** %s: done ***\n","test_next_on_arrays");
                          check_plan();
                          _plan(0x34,true);
                          _space((FILE *)_stdout);
                          printf("# *** %s ***\n","test_next_on_maps");
                          test_next_on_map(0);
                          test_next_on_map(1);
                          test_next_on_map(0xf);
                          test_next_on_map(0x10);
                          test_next_on_map(0x11);
                          test_next_on_map(0xfe);
                          test_next_on_map(0xff);
                          test_next_on_map(0x100);
                          test_next_on_map(0x101);
                          test_next_on_map(0xfffe);
                          test_next_on_map(0xffff);
                          test_next_on_map(0x10000);
                          test_next_on_map(0x10001);
                          _space((FILE *)_stdout);
                          printf("# *** %s: done ***\n","test_next_on_maps");
                          check_plan();
                          _plan(0x8a1,true);
                          _space((FILE *)_stdout);
                          printf("# *** %s ***\n","test_compare_uints");
                          local_580 = mp_nums_a[0];
                          lVar17 = 0;
                          do {
                            uVar28 = (&DAT_00140fd0)[lVar17];
                            lVar18 = 0;
                            local_570 = lVar17;
                            do {
                              val = (&DAT_00140fd0)[lVar18];
                              local_568 = lVar18;
                              uVar7 = test_encode_uint_all_sizes(mp_nums_a,uVar28);
                              uVar20 = test_encode_uint_all_sizes((char (*) [16])&d4,val);
                              local_578 = CONCAT44(local_578._4_4_,uVar20);
                              if (0 < (int)uVar7) {
                                local_588 = (char *)(ulong)uVar7;
                                local_560 = (ulong)uVar20;
                                pcVar26 = (char *)0x0;
                                do {
                                  if (0 < (int)local_578) {
                                    data_b = &d4;
                                    uVar11 = local_560;
                                    do {
                                      uVar7 = mp_compare_uint(mp_nums_a[(long)pcVar26],
                                                              (char *)data_b);
                                      if (uVar28 < val) {
                                        uVar7 = uVar7 >> 0x1f;
                                        pcVar27 = "r < 0";
                                        iVar6 = 0x373;
                                        pcVar25 = "mp_compare_uint(%lu, %lu) < 0";
                                      }
                                      else if (val < uVar28) {
                                        uVar7 = (uint)(0 < (int)uVar7);
                                        pcVar27 = "r > 0";
                                        iVar6 = 0x376;
                                        pcVar25 = "mp_compare_uint(%lu, %lu) > 0";
                                      }
                                      else {
                                        uVar7 = (uint)(uVar7 == 0);
                                        pcVar27 = "r == 0";
                                        iVar6 = 0x379;
                                        pcVar25 = "mp_compare_uint(%lu, %lu) == 0";
                                      }
                                      _ok(uVar7,pcVar27,
                                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                          ,iVar6,pcVar25,uVar28,val);
                                      data_b = data_b + 2;
                                      uVar11 = uVar11 - 1;
                                    } while (uVar11 != 0);
                                  }
                                  pcVar26 = pcVar26 + 1;
                                } while (pcVar26 != local_588);
                              }
                              lVar18 = local_568 + 1;
                            } while (lVar18 != 0xf);
                            lVar17 = local_570 + 1;
                          } while (lVar17 != 0xf);
                          _space((FILE *)_stdout);
                          printf("# *** %s: done ***\n","test_compare_uints");
                          check_plan();
                          _plan(0x11a,true);
                          _space((FILE *)_stdout);
                          printf("# *** %s ***\n","test_format");
                          mp_format(mp_nums_a[0],0x400,
                                    "%d %u %i  %ld %lu %li  %lld %llu %lli%hd %hu %hi  %hhd %hhu %hhi"
                                    ,1,2,3,4,5,6,7,8,9,10,0xb,0xc,0xd,0xe,0xf);
                          pcVar26 = (char *)0x0;
                          pcVar25 = (char *)(mp_type *)0x0;
                          do {
                            pcVar27 = local_580;
                            _ok((uint)(mp_type_hint[(byte)*local_580] == MP_UINT),
                                "mp_typeof(*p) == MP_UINT",
                                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                ,0x3b7,"Test type on step %d",(ulong)pcVar25 & 0xffffffff);
                            bVar5 = *pcVar27;
                            pmVar29 = (mp_type *)(ulong)bVar5;
                            switch(bVar5) {
                            case 0xcc:
                              pmVar29 = (mp_type *)(ulong)(byte)local_580[1];
                              local_580 = local_580 + 2;
                              break;
                            case 0xcd:
                              pcVar27 = local_580 + 1;
                              local_580 = local_580 + 3;
                              pmVar29 = (mp_type *)
                                        (ulong)(ushort)(*(ushort *)pcVar27 << 8 |
                                                       *(ushort *)pcVar27 >> 8);
                              break;
                            case 0xce:
                              uVar7 = *(uint *)(local_580 + 1);
                              pmVar29 = (mp_type *)
                                        (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                                (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
                              local_580 = local_580 + 5;
                              break;
                            case 0xcf:
                              uVar28 = *(ulong *)(local_580 + 1);
                              pmVar29 = (mp_type *)
                                        (uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                                         (uVar28 & 0xff0000000000) >> 0x18 |
                                         (uVar28 & 0xff00000000) >> 8 | (uVar28 & 0xff000000) << 8 |
                                         (uVar28 & 0xff0000) << 0x18 | (uVar28 & 0xff00) << 0x28 |
                                        uVar28 << 0x38);
                              local_580 = local_580 + 9;
                              break;
                            default:
                              if ((char)bVar5 < '\0') {
                                main_cold_24();
                                goto LAB_00112099;
                              }
                              local_580 = local_580 + 1;
                            }
                            pmVar23 = (mp_type *)((long)pcVar25 + 1);
                            _ok((uint)(pmVar29 == pmVar23),"mp_decode_uint(&p) == i + 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                ,0x3b8,"Test value on step %d",(ulong)pcVar25 & 0xffffffff);
                            pcVar25 = (char *)pmVar23;
                          } while (pmVar23 != (mp_type *)0xf);
                          mp_format(mp_nums_a[0],0x400,
                                    "%d %u %i  %ld %lu %li  %lld %llu %lli%hd %hu %hi  %hhd %hhu %hhi"
                                    ,0xffffffff,0xfffffffe,0xfffffffd,0xfffffffffffffffc,
                                    0xfffffffffffffffb,0xfffffffffffffffa,0xfffffffffffffff9,
                                    0xfffffffffffffff8,0xfffffffffffffff7,0xfffffffffffffff6,0xfff5,
                                    0xfffffffffffffff4,0xfffffffffffffff3,0xf2,0xfffffffffffffff1);
                          pcVar25 = "Test type on step %d";
                          uVar28 = 0;
                          pcVar27 = mp_nums_a[0];
                          do {
                            auVar1._8_8_ = 0;
                            auVar1._0_8_ = uVar28;
                            d4 = (char *)0xfffffffe;
                            local_550[0] = -5;
                            local_550[1] = -1;
                            local_550[2] = -1;
                            local_550[3] = -1;
                            local_550[4] = -1;
                            local_550[5] = -1;
                            local_550[6] = -1;
                            local_550[7] = -1;
                            local_550[8] = -8;
                            local_550[9] = -1;
                            local_550[10] = -1;
                            local_550[0xb] = -1;
                            local_550[0xc] = -1;
                            local_550[0xd] = -1;
                            local_550[0xe] = -1;
                            local_550[0xf] = -1;
                            local_550[0x10] = -0xb;
                            local_550[0x11] = -1;
                            local_550[0x12] = '\0';
                            local_550[0x13] = '\0';
                            local_550[0x14] = '\0';
                            local_550[0x15] = '\0';
                            local_550[0x16] = '\0';
                            local_550[0x17] = '\0';
                            local_550[0x18] = -0xe;
                            local_550[0x19] = '\0';
                            local_550[0x1a] = '\0';
                            local_550[0x1b] = '\0';
                            local_550[0x1c] = '\0';
                            local_550[0x1d] = '\0';
                            local_550[0x1e] = '\0';
                            local_550[0x1f] = '\0';
                            pcVar26 = pcVar27 + 1;
                            if ((char)((char)(SUB164(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) >> 1) *
                                       '\x03' + '\x01') == (char)uVar28) {
                              _ok((uint)(mp_type_hint[(byte)*pcVar27] == MP_UINT),
                                  "mp_typeof(*p) == MP_UINT",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x3c7,"Test type on step %d",uVar28 & 0xffffffff);
                              bVar5 = *pcVar27;
                              pcVar12 = (char *)(ulong)bVar5;
                              switch(bVar5) {
                              case 0xcc:
                                pcVar12 = (char *)(ulong)(byte)pcVar27[1];
                                pcVar26 = pcVar27 + 2;
                                break;
                              case 0xcd:
                                pcVar26 = pcVar27 + 3;
                                pcVar12 = (char *)(ulong)(ushort)(*(ushort *)(pcVar27 + 1) << 8 |
                                                                 *(ushort *)(pcVar27 + 1) >> 8);
                                break;
                              case 0xce:
                                uVar7 = *(uint *)(pcVar27 + 1);
                                pcVar12 = (char *)(ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                                          (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
                                pcVar26 = pcVar27 + 5;
                                break;
                              case 0xcf:
                                uVar11 = *(ulong *)(pcVar27 + 1);
                                pcVar12 = (char *)(uVar11 >> 0x38 |
                                                   (uVar11 & 0xff000000000000) >> 0x28 |
                                                   (uVar11 & 0xff0000000000) >> 0x18 |
                                                   (uVar11 & 0xff00000000) >> 8 |
                                                   (uVar11 & 0xff000000) << 8 |
                                                   (uVar11 & 0xff0000) << 0x18 |
                                                   (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38);
                                pcVar26 = pcVar27 + 9;
                                break;
                              default:
                                if ((char)bVar5 < '\0') goto LAB_00112099;
                              }
                              bVar30 = pcVar12 == (&d4)[((uint)uVar28 & 0xff) / 3];
                              pcVar27 = "mp_decode_uint(&p) == expects[i / 3]";
                              iVar6 = 0x3c9;
                            }
                            else {
                              _ok((uint)(mp_type_hint[(byte)*pcVar27] == MP_INT),
                                  "mp_typeof(*p) == MP_INT",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x3cb,"Test type on step %d",uVar28 & 0xffffffff);
                              bVar5 = *pcVar27;
                              switch(bVar5) {
                              case 0xd0:
                                uVar11 = (ulong)pcVar27[1];
                                pcVar26 = pcVar27 + 2;
                                break;
                              case 0xd1:
                                pcVar26 = pcVar27 + 3;
                                uVar11 = (ulong)(short)(*(ushort *)(pcVar27 + 1) << 8 |
                                                       *(ushort *)(pcVar27 + 1) >> 8);
                                break;
                              case 0xd2:
                                uVar7 = *(uint *)(pcVar27 + 1);
                                pcVar26 = pcVar27 + 5;
                                uVar11 = (ulong)(int)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                                      (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
                                break;
                              case 0xd3:
                                uVar11 = *(ulong *)(pcVar27 + 1);
                                uVar11 = uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                                         (uVar11 & 0xff0000000000) >> 0x18 |
                                         (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 |
                                         (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 |
                                         uVar11 << 0x38;
                                pcVar26 = pcVar27 + 9;
                                break;
                              default:
                                if (bVar5 < 0xe0) goto LAB_0011209e;
                                uVar11 = (ulong)(char)bVar5;
                              }
                              bVar30 = (uVar11 ^ uVar28) == 0xffffffffffffffff;
                              pcVar27 = "mp_decode_int(&p) == - i - 1";
                              iVar6 = 0x3cd;
                            }
                            _ok((uint)bVar30,pcVar27,
                                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                ,iVar6,"Test value on step %d",uVar28 & 0xffffffff);
                            uVar28 = uVar28 + 1;
                            pcVar27 = pcVar26;
                            if (uVar28 == 0xf) {
                              d4 = (char *)CONCAT26(d4._6_2_,0xb434241a392);
                              local_458 = 0xd2;
                              local_457 = 0x2efd69b6;
                              local_453 = 0xab;
                              local_452 = 0x4a494847464544;
                              uStack_44b = 0x4e4d4c4b;
                              local_447 = 0xcd;
                              local_446 = 0x4101;
                              local_578 = mp_format(mp_nums_a[0],0x400,
                                                                                                        
                                                  "%d NIL [%d %b %b] this is test[%d %%%% [[ %d {%s %f %%  %.*s %lf %.*s NIL}%p %d %.*p ]] %d%d%d]"
                                                  ,0x3fb999999999999a,0x3fc999999999999a,0,1,1,0,
                                                  0xffffffffffffffff,2,"flt",6,"double#ignored",0,
                                                  "ignore",&d4,3,0x14,&local_458,4,5,6);
                              pcVar26 = mp_nums_a[0] + local_578;
                              local_590 = mp_nums_a[0];
                              iVar6 = mp_check(&local_590,pcVar26);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x3ec,"check");
                              _ok((uint)(mp_type_hint[(byte)mp_nums_a[0][0]] == MP_UINT),
                                  "mp_typeof(*p) == MP_UINT",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x3ed,"type");
                              uVar28 = (ulong)(byte)mp_nums_a[0][0];
                              switch(mp_nums_a[0][0]) {
                              case -0x34:
                                pcVar27 = mp_nums_a[0] + 2;
                                uVar28 = (ulong)(byte)mp_nums_a[0][1];
                                break;
                              case -0x33:
                                pcVar27 = mp_nums_a[0] + 3;
                                uVar28 = (ulong)(ushort)(CONCAT11(mp_nums_a[0][2],mp_nums_a[0][1])
                                                         << 8 | (ushort)(byte)mp_nums_a[0][2]);
                                break;
                              case -0x32:
                                pcVar27 = mp_nums_a[0] + 5;
                                uVar2 = CONCAT12(mp_nums_a[0][3],
                                                 CONCAT11(mp_nums_a[0][2],mp_nums_a[0][1]));
                                uVar28 = (ulong)(mp_nums_a[0]._4_4_ & 0xff | (uVar2 & 0xff0000) >> 8
                                                 | (uVar2 & 0xff00) << 8 | (uint)uVar2 << 0x18);
                                break;
                              case -0x31:
                                pcVar27 = mp_nums_a[0] + 9;
                                uVar3 = CONCAT43(mp_nums_a[0]._4_4_,
                                                 CONCAT12(mp_nums_a[0][3],
                                                          CONCAT11(mp_nums_a[0][2],mp_nums_a[0][1]))
                                                );
                                uVar28 = (ulong)(byte)mp_nums_a[0][8] |
                                         ((ulong)uVar3 & 0xff000000000000) >> 0x28 |
                                         ((ulong)uVar3 & 0xff0000000000) >> 0x18 |
                                         ((ulong)uVar3 & 0xff00000000) >> 8 |
                                         ((ulong)uVar3 & 0xff000000) << 8 |
                                         ((ulong)uVar3 & 0xff0000) << 0x18 |
                                         ((ulong)uVar3 & 0xff00) << 0x28 |
                                         CONCAT17(mp_nums_a[0][8],uVar3) << 0x38;
                                break;
                              default:
                                if (mp_nums_a[0][0] < '\0') goto LAB_001124d3;
                                pcVar27 = mp_nums_a[0] + 1;
                              }
                              _ok((uint)(uVar28 == 0),"mp_decode_uint(&p) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x3ee,"decode");
                              local_590 = pcVar27;
                              iVar6 = mp_check(&local_590,pcVar26);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x3f1,"check");
                              _ok((uint)(mp_type_hint[(byte)*pcVar27] == MP_NIL),
                                  "mp_typeof(*p) == MP_NIL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x3f2,"type");
                              if (*pcVar27 != 0xc0) goto LAB_0011265a;
                              local_590 = pcVar27 + 1;
                              iVar6 = mp_check(&local_590,pcVar26);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x3f6,"check");
                              _ok((uint)(mp_type_hint[(byte)pcVar27[1]] == MP_ARRAY),
                                  "mp_typeof(*p) == MP_ARRAY",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x3f7,"type");
                              bVar5 = pcVar27[1];
                              if ((bVar5 & 0x40) == 0) {
                                pcVar25 = pcVar27 + 2;
                                uVar7 = bVar5 & 0xf;
                              }
                              else if ((bVar5 & 1) == 0) {
                                pcVar25 = pcVar27 + 4;
                                uVar7 = (uint)(ushort)(*(ushort *)(pcVar27 + 2) << 8 |
                                                      *(ushort *)(pcVar27 + 2) >> 8);
                              }
                              else {
                                uVar7 = *(uint *)(pcVar27 + 2);
                                uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                        (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
                                pcVar25 = pcVar27 + 6;
                              }
                              _ok((uint)(uVar7 == 3),"mp_decode_array(&p) == 3",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x3f8,"decode");
                              local_590 = pcVar25;
                              iVar6 = mp_check(&local_590,pcVar26);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x3fb,"check");
                              _ok((uint)(mp_type_hint[(byte)*pcVar25] == MP_UINT),
                                  "mp_typeof(*p) == MP_UINT",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x3fc,"type");
                              bVar5 = *pcVar25;
                              uVar28 = (ulong)bVar5;
                              switch(bVar5) {
                              case 0xcc:
                                uVar28 = (ulong)(byte)pcVar25[1];
                                pcVar27 = pcVar25 + 2;
                                break;
                              case 0xcd:
                                pcVar27 = pcVar25 + 3;
                                uVar28 = (ulong)(ushort)(*(ushort *)(pcVar25 + 1) << 8 |
                                                        *(ushort *)(pcVar25 + 1) >> 8);
                                break;
                              case 0xce:
                                uVar7 = *(uint *)(pcVar25 + 1);
                                uVar28 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                                 (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
                                pcVar27 = pcVar25 + 5;
                                break;
                              case 0xcf:
                                uVar28 = *(ulong *)(pcVar25 + 1);
                                uVar28 = uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                                         (uVar28 & 0xff0000000000) >> 0x18 |
                                         (uVar28 & 0xff00000000) >> 8 | (uVar28 & 0xff000000) << 8 |
                                         (uVar28 & 0xff0000) << 0x18 | (uVar28 & 0xff00) << 0x28 |
                                         uVar28 << 0x38;
                                pcVar27 = pcVar25 + 9;
                                break;
                              default:
                                if ((char)bVar5 < '\0') goto LAB_001124d8;
                                pcVar27 = pcVar25 + 1;
                              }
                              iVar9 = 0;
                              _ok((uint)(uVar28 == 1),"mp_decode_uint(&p) == 1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x3fd,"decode");
                              local_590 = pcVar27;
                              iVar6 = mp_check(&local_590,pcVar26);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x400,"check");
                              _ok((uint)(mp_type_hint[(byte)*pcVar27] == MP_BOOL),
                                  "mp_typeof(*p) == MP_BOOL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x401,"type");
                              iVar6 = 1;
                              if (*pcVar27 != 0xc3) {
                                if (*pcVar27 != 0xc2) goto LAB_00112698;
                                iVar6 = 0;
                              }
                              _ok(iVar6,"mp_decode_bool(&p) == true",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x402,"decode");
                              local_590 = pcVar27 + 1;
                              iVar6 = mp_check(&local_590,pcVar26);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x405,"check");
                              _ok((uint)(mp_type_hint[(byte)pcVar27[1]] == MP_BOOL),
                                  "mp_typeof(*p) == MP_BOOL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x406,"type");
                              if (pcVar27[1] != 0xc3) {
                                if (pcVar27[1] != 0xc2) goto LAB_00112698;
                                iVar9 = 1;
                              }
                              _ok(iVar9,"mp_decode_bool(&p) == false",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x407,"decode");
                              local_590 = pcVar27 + 2;
                              iVar6 = mp_check(&local_590,pcVar26);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x40a,"check");
                              _ok((uint)(mp_type_hint[(byte)pcVar27[2]] == MP_ARRAY),
                                  "mp_typeof(*p) == MP_ARRAY",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x40b,"type");
                              bVar5 = pcVar27[2];
                              if ((bVar5 & 0x40) == 0) {
                                pcVar25 = pcVar27 + 3;
                                uVar7 = bVar5 & 0xf;
                              }
                              else if ((bVar5 & 1) == 0) {
                                pcVar25 = pcVar27 + 5;
                                uVar7 = (uint)(ushort)(*(ushort *)(pcVar27 + 3) << 8 |
                                                      *(ushort *)(pcVar27 + 3) >> 8);
                              }
                              else {
                                uVar7 = *(uint *)(pcVar27 + 3);
                                uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                        (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
                                pcVar25 = pcVar27 + 7;
                              }
                              _ok((uint)(uVar7 == 5),"mp_decode_array(&p) == 5",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x40c,"decode");
                              local_590 = pcVar25;
                              iVar6 = mp_check(&local_590,pcVar26);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x40f,"check");
                              _ok((uint)(mp_type_hint[(byte)*pcVar25] == MP_INT),
                                  "mp_typeof(*p) == MP_INT",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x410,"type");
                              bVar5 = *pcVar25;
                              switch(bVar5) {
                              case 0xd0:
                                uVar28 = (ulong)pcVar25[1];
                                pcVar27 = pcVar25 + 2;
                                break;
                              case 0xd1:
                                pcVar27 = pcVar25 + 3;
                                uVar28 = (ulong)(short)(*(ushort *)(pcVar25 + 1) << 8 |
                                                       *(ushort *)(pcVar25 + 1) >> 8);
                                break;
                              case 0xd2:
                                uVar7 = *(uint *)(pcVar25 + 1);
                                pcVar27 = pcVar25 + 5;
                                uVar28 = (ulong)(int)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                                      (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
                                break;
                              case 0xd3:
                                uVar28 = *(ulong *)(pcVar25 + 1);
                                uVar28 = uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                                         (uVar28 & 0xff0000000000) >> 0x18 |
                                         (uVar28 & 0xff00000000) >> 8 | (uVar28 & 0xff000000) << 8 |
                                         (uVar28 & 0xff0000) << 0x18 | (uVar28 & 0xff00) << 0x28 |
                                         uVar28 << 0x38;
                                pcVar27 = pcVar25 + 9;
                                break;
                              default:
                                if (bVar5 < 0xe0) goto LAB_001124dd;
                                uVar28 = (ulong)(char)bVar5;
                                pcVar27 = pcVar25 + 1;
                              }
                              _ok((uint)(uVar28 == 0xffffffffffffffff),"mp_decode_int(&p) == -1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x411,"decode");
                              local_590 = pcVar27;
                              iVar6 = mp_check(&local_590,pcVar26);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x414,"check");
                              _ok((uint)(mp_type_hint[(byte)*pcVar27] == MP_ARRAY),
                                  "mp_typeof(*p) == MP_ARRAY",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x415,"type");
                              bVar5 = *pcVar27;
                              if ((bVar5 & 0x40) == 0) {
                                pcVar25 = pcVar27 + 1;
                                uVar7 = bVar5 & 0xf;
                              }
                              else if ((bVar5 & 1) == 0) {
                                pcVar25 = pcVar27 + 3;
                                uVar7 = (uint)(ushort)(*(ushort *)(pcVar27 + 1) << 8 |
                                                      *(ushort *)(pcVar27 + 1) >> 8);
                              }
                              else {
                                uVar7 = *(uint *)(pcVar27 + 1);
                                uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                        (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
                                pcVar25 = pcVar27 + 5;
                              }
                              _ok((uint)(uVar7 == 1),"mp_decode_array(&p) == 1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x416,"decode");
                              local_590 = pcVar25;
                              iVar6 = mp_check(&local_590,pcVar26);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x419,"check");
                              _ok((uint)(mp_type_hint[(byte)*pcVar25] == MP_ARRAY),
                                  "mp_typeof(*p) == MP_ARRAY",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x41a,"type");
                              bVar5 = *pcVar25;
                              if ((bVar5 & 0x40) == 0) {
                                pcVar27 = pcVar25 + 1;
                                uVar7 = bVar5 & 0xf;
                              }
                              else if ((bVar5 & 1) == 0) {
                                pcVar27 = pcVar25 + 3;
                                uVar7 = (uint)(ushort)(*(ushort *)(pcVar25 + 1) << 8 |
                                                      *(ushort *)(pcVar25 + 1) >> 8);
                              }
                              else {
                                uVar7 = *(uint *)(pcVar25 + 1);
                                uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                        (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
                                pcVar27 = pcVar25 + 5;
                              }
                              _ok((uint)(uVar7 == 5),"mp_decode_array(&p) == 5",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x41b,"decode");
                              local_590 = pcVar27;
                              iVar6 = mp_check(&local_590,pcVar26);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x41e,"check");
                              _ok((uint)(mp_type_hint[(byte)*pcVar27] == MP_UINT),
                                  "mp_typeof(*p) == MP_UINT",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x41f,"type");
                              bVar5 = *pcVar27;
                              uVar28 = (ulong)bVar5;
                              switch(bVar5) {
                              case 0xcc:
                                uVar28 = (ulong)(byte)pcVar27[1];
                                pcVar25 = pcVar27 + 2;
                                break;
                              case 0xcd:
                                pcVar25 = pcVar27 + 3;
                                uVar28 = (ulong)(ushort)(*(ushort *)(pcVar27 + 1) << 8 |
                                                        *(ushort *)(pcVar27 + 1) >> 8);
                                break;
                              case 0xce:
                                uVar7 = *(uint *)(pcVar27 + 1);
                                uVar28 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                                 (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
                                pcVar25 = pcVar27 + 5;
                                break;
                              case 0xcf:
                                uVar28 = *(ulong *)(pcVar27 + 1);
                                uVar28 = uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                                         (uVar28 & 0xff0000000000) >> 0x18 |
                                         (uVar28 & 0xff00000000) >> 8 | (uVar28 & 0xff000000) << 8 |
                                         (uVar28 & 0xff0000) << 0x18 | (uVar28 & 0xff00) << 0x28 |
                                         uVar28 << 0x38;
                                pcVar25 = pcVar27 + 9;
                                break;
                              default:
                                if ((char)bVar5 < '\0') goto LAB_001124e2;
                                pcVar25 = pcVar27 + 1;
                              }
                              _ok((uint)(uVar28 == 2),"mp_decode_uint(&p) == 2",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x420,"decode");
                              local_590 = pcVar25;
                              iVar6 = mp_check(&local_590,pcVar26);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x423,"check");
                              _ok((uint)(mp_type_hint[(byte)*pcVar25] == MP_MAP),
                                  "mp_typeof(*p) == MP_MAP",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x424,"type");
                              bVar5 = *pcVar25;
                              if (bVar5 == 0xdf) {
                                uVar7 = *(uint *)(pcVar25 + 1);
                                uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                        (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
                                pcVar27 = pcVar25 + 5;
                              }
                              else if (bVar5 == 0xde) {
                                pcVar27 = pcVar25 + 3;
                                uVar7 = (uint)(ushort)(*(ushort *)(pcVar25 + 1) << 8 |
                                                      *(ushort *)(pcVar25 + 1) >> 8);
                              }
                              else {
                                if (-0x71 < (char)bVar5) goto LAB_00112479;
                                pcVar27 = pcVar25 + 1;
                                uVar7 = bVar5 & 0xf;
                              }
                              _ok((uint)(uVar7 == 3),"mp_decode_map(&p) == 3",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x425,"decode");
                              local_590 = pcVar27;
                              iVar6 = mp_check(&local_590,pcVar26);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x428,"check");
                              _ok((uint)(mp_type_hint[(byte)*pcVar27] == MP_STR),
                                  "mp_typeof(*p) == MP_STR",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x429,"type");
                              bVar5 = *pcVar27;
                              local_588 = pcVar26;
                              if (bVar5 == 0xdb) {
                                uVar7 = *(uint *)(pcVar27 + 1);
                                uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                        (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
                                pcVar26 = pcVar27 + 5;
                              }
                              else if (bVar5 == 0xda) {
                                pcVar26 = pcVar27 + 3;
                                uVar7 = (uint)(ushort)(*(ushort *)(pcVar27 + 1) << 8 |
                                                      *(ushort *)(pcVar27 + 1) >> 8);
                              }
                              else if (bVar5 == 0xd9) {
                                uVar7 = (uint)(byte)pcVar27[1];
                                pcVar26 = pcVar27 + 2;
                              }
                              else {
                                if ((byte)(bVar5 + 0x40) < 0xe0) goto LAB_001124bf;
                                pcVar26 = pcVar27 + 1;
                                uVar7 = bVar5 & 0x1f;
                              }
                              pcVar27 = pcVar26 + uVar7;
                              local_590 = pcVar26;
                              _ok((uint)(uVar7 == 3),"len == 3",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x42b,"decode");
                              _ok((uint)(local_590[2] == 0x74 && *(short *)local_590 == 0x6c66),
                                  "memcmp(c, \"flt\", 3) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x42c,"compare");
                              local_590 = pcVar27;
                              iVar6 = mp_check(&local_590,local_588);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x42f,"check");
                              _ok((uint)(mp_type_hint[(byte)pcVar26[uVar7]] == MP_FLOAT),
                                  "mp_typeof(*p) == MP_FLOAT",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x430,"type");
                              if (pcVar26[uVar7] != 0xca) goto LAB_001125de;
                              uVar7 = *(uint *)(pcVar27 + 1);
                              fVar8 = (float)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                              (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
                              _ok((uint)((float)(-(uint)(0.1 < fVar8) & (uint)(fVar8 + -0.1) |
                                                ~-(uint)(0.1 < fVar8) & (uint)(0.1 - fVar8)) < 1e-05
                                        ),"fequal(mp_decode_float(&p), 0.1)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x431,"decode");
                              local_590 = pcVar27 + 5;
                              iVar6 = mp_check(&local_590,local_588);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x434,"check");
                              _ok((uint)(mp_type_hint[(byte)pcVar27[5]] == MP_STR),
                                  "mp_typeof(*p) == MP_STR",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x435,"type");
                              bVar5 = pcVar27[5];
                              if (bVar5 == 0xdb) {
                                uVar7 = *(uint *)(pcVar27 + 6);
                                uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                        (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
                                pcVar26 = pcVar27 + 10;
                              }
                              else if (bVar5 == 0xda) {
                                pcVar26 = pcVar27 + 8;
                                uVar7 = (uint)(ushort)(*(ushort *)(pcVar27 + 6) << 8 |
                                                      *(ushort *)(pcVar27 + 6) >> 8);
                              }
                              else if (bVar5 == 0xd9) {
                                uVar7 = (uint)(byte)pcVar27[6];
                                pcVar26 = pcVar27 + 7;
                              }
                              else {
                                if ((byte)(bVar5 + 0x40) < 0xe0) goto LAB_001124c4;
                                pcVar26 = pcVar27 + 6;
                                uVar7 = bVar5 & 0x1f;
                              }
                              pcVar27 = pcVar26 + uVar7;
                              local_590 = pcVar26;
                              _ok((uint)(uVar7 == 6),"len == 6",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x437,"decode");
                              _ok((uint)(*(short *)(local_590 + 4) == 0x656c &&
                                        *(int *)local_590 == 0x62756f64),
                                  "memcmp(c, \"double\", 6) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x438,"compare");
                              pcVar25 = local_588;
                              local_590 = pcVar27;
                              iVar6 = mp_check(&local_590,local_588);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x43b,"check");
                              _ok((uint)(mp_type_hint[(byte)pcVar26[uVar7]] == MP_DOUBLE),
                                  "mp_typeof(*p) == MP_DOUBLE",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x43c,"type");
                              if (pcVar26[uVar7] != 0xcb) goto LAB_001125fd;
                              uVar28 = *(ulong *)(pcVar27 + 1);
                              dVar13 = (double)(uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28
                                                | (uVar28 & 0xff0000000000) >> 0x18 |
                                                (uVar28 & 0xff00000000) >> 8 |
                                                (uVar28 & 0xff000000) << 8 |
                                                (uVar28 & 0xff0000) << 0x18 |
                                                (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
                              _ok((uint)((double)(-(ulong)(0.2 < dVar13) & (ulong)(dVar13 + -0.2) |
                                                 ~-(ulong)(0.2 < dVar13) & (ulong)(0.2 - dVar13)) <
                                        1e-10),"dequal(mp_decode_double(&p), 0.2)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x43d,"decode");
                              local_590 = pcVar27 + 9;
                              iVar6 = mp_check(&local_590,pcVar25);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x440,"check");
                              _ok((uint)(mp_type_hint[(byte)pcVar27[9]] == MP_STR),
                                  "mp_typeof(*p) == MP_STR",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x441,"type");
                              bVar5 = pcVar27[9];
                              if (bVar5 == 0xdb) {
                                uVar7 = *(uint *)(pcVar27 + 10);
                                uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                        (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
                                pcVar26 = pcVar27 + 0xe;
                              }
                              else if (bVar5 == 0xda) {
                                pcVar26 = pcVar27 + 0xc;
                                uVar7 = (uint)(ushort)(*(ushort *)(pcVar27 + 10) << 8 |
                                                      *(ushort *)(pcVar27 + 10) >> 8);
                              }
                              else if (bVar5 == 0xd9) {
                                uVar7 = (uint)(byte)pcVar27[10];
                                pcVar26 = pcVar27 + 0xb;
                              }
                              else {
                                if ((byte)(bVar5 + 0x40) < 0xe0) goto LAB_001124c9;
                                pcVar26 = pcVar27 + 10;
                                uVar7 = bVar5 & 0x1f;
                              }
                              uVar20 = 0;
                              local_590 = pcVar26;
                              _ok((uint)(uVar7 == 0),"len == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x443,"decode");
                              pcVar27 = local_588;
                              local_590 = pcVar26 + uVar7;
                              iVar6 = mp_check(&local_590,local_588);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x446,"check");
                              _ok((uint)(mp_type_hint[(byte)pcVar26[uVar7]] == MP_NIL),
                                  "mp_typeof(*p) == MP_NIL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x447,"type");
                              if (pcVar26[uVar7] != 0xc0) goto LAB_0011265a;
                              pcVar26 = pcVar26 + (ulong)uVar7 + 1;
                              local_590 = pcVar26;
                              iVar6 = mp_check(&local_590,pcVar27);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,1099,"check");
                              if ((long)local_590 - (long)pcVar26 == 6) {
                                uVar20 = (uint)(*(short *)(pcVar26 + 4) == d4._4_2_ &&
                                               *(int *)pcVar26 == (int)d4);
                              }
                              _ok(uVar20,
                                  "((size_t)(c - p) == data1_len) && memcmp(p, data1, data1_len) == 0"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x44d,"compare");
                              pcVar26 = local_590;
                              iVar6 = mp_check(&local_590,pcVar27);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x451,"check");
                              _ok((uint)(mp_type_hint[(byte)*pcVar26] == MP_UINT),
                                  "mp_typeof(*p) == MP_UINT",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x452,"type");
                              bVar5 = *pcVar26;
                              uVar28 = (ulong)bVar5;
                              switch(bVar5) {
                              case 0xcc:
                                uVar28 = (ulong)(byte)pcVar26[1];
                                pcVar25 = pcVar26 + 2;
                                break;
                              case 0xcd:
                                pcVar25 = pcVar26 + 3;
                                uVar28 = (ulong)(ushort)(*(ushort *)(pcVar26 + 1) << 8 |
                                                        *(ushort *)(pcVar26 + 1) >> 8);
                                break;
                              case 0xce:
                                uVar7 = *(uint *)(pcVar26 + 1);
                                uVar28 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                                 (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
                                pcVar25 = pcVar26 + 5;
                                break;
                              case 0xcf:
                                uVar28 = *(ulong *)(pcVar26 + 1);
                                uVar28 = uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                                         (uVar28 & 0xff0000000000) >> 0x18 |
                                         (uVar28 & 0xff00000000) >> 8 | (uVar28 & 0xff000000) << 8 |
                                         (uVar28 & 0xff0000) << 0x18 | (uVar28 & 0xff00) << 0x28 |
                                         uVar28 << 0x38;
                                pcVar25 = pcVar26 + 9;
                                break;
                              default:
                                if ((char)bVar5 < '\0') goto LAB_001124e7;
                                pcVar25 = pcVar26 + 1;
                              }
                              _ok((uint)(uVar28 == 3),"mp_decode_uint(&p) == 3",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x453,"decode");
                              local_590 = pcVar25;
                              iVar6 = mp_check(&local_590,pcVar27);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x456,"check");
                              _ok((uint)(mp_type_hint[(byte)*pcVar25] == MP_INT),
                                  "mp_typeof(*p) == MP_INT",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x457,"type");
                              bVar5 = *pcVar25;
                              switch(bVar5) {
                              case 0xd0:
                                uVar28 = (ulong)pcVar25[1];
                                pcVar26 = pcVar25 + 2;
                                break;
                              case 0xd1:
                                pcVar26 = pcVar25 + 3;
                                uVar28 = (ulong)(short)(*(ushort *)(pcVar25 + 1) << 8 |
                                                       *(ushort *)(pcVar25 + 1) >> 8);
                                break;
                              case 0xd2:
                                uVar7 = *(uint *)(pcVar25 + 1);
                                pcVar26 = pcVar25 + 5;
                                uVar28 = (ulong)(int)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                                      (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
                                break;
                              case 0xd3:
                                uVar28 = *(ulong *)(pcVar25 + 1);
                                uVar28 = uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                                         (uVar28 & 0xff0000000000) >> 0x18 |
                                         (uVar28 & 0xff00000000) >> 8 | (uVar28 & 0xff000000) << 8 |
                                         (uVar28 & 0xff0000) << 0x18 | (uVar28 & 0xff00) << 0x28 |
                                         uVar28 << 0x38;
                                pcVar26 = pcVar25 + 9;
                                break;
                              default:
                                if (bVar5 < 0xe0) goto LAB_001124ec;
                                uVar28 = (ulong)(char)bVar5;
                                pcVar26 = pcVar25 + 1;
                              }
                              _ok((uint)(uVar28 == 0xffffffffb669fd2e),
                                  "mp_decode_int(&p) == -1234567890",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x458,"decode");
                              local_590 = pcVar26;
                              iVar6 = mp_check(&local_590,pcVar27);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x45b,"check");
                              _ok((uint)(mp_type_hint[(byte)*pcVar26] == MP_STR),
                                  "mp_typeof(*p) == MP_STR",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x45c,"type");
                              bVar5 = *pcVar26;
                              if (bVar5 == 0xdb) {
                                uVar7 = *(uint *)(pcVar26 + 1);
                                uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                        (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
                                pcVar27 = pcVar26 + 5;
                              }
                              else if (bVar5 == 0xda) {
                                pcVar27 = pcVar26 + 3;
                                uVar7 = (uint)(ushort)(*(ushort *)(pcVar26 + 1) << 8 |
                                                      *(ushort *)(pcVar26 + 1) >> 8);
                              }
                              else if (bVar5 == 0xd9) {
                                uVar7 = (uint)(byte)pcVar26[1];
                                pcVar27 = pcVar26 + 2;
                              }
                              else {
                                if ((byte)(bVar5 + 0x40) < 0xe0) goto LAB_001124ce;
                                pcVar27 = pcVar26 + 1;
                                uVar7 = bVar5 & 0x1f;
                              }
                              pcVar25 = pcVar27 + uVar7;
                              local_590 = pcVar27;
                              _ok((uint)(uVar7 == 0xb),"len == 11",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x45e,"decode");
                              _ok((uint)(*(long *)(local_590 + 3) == 0x4e4d4c4b4a494847 &&
                                        *(long *)local_590 == 0x4b4a494847464544),
                                  "memcmp(c, \"DEFGHIJKLMN\", 11) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x45f,"compare");
                              local_590 = pcVar25;
                              iVar6 = mp_check(&local_590,local_588);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x462,"check");
                              _ok((uint)(mp_type_hint[(byte)pcVar27[uVar7]] == MP_UINT),
                                  "mp_typeof(*p) == MP_UINT",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x463,"type");
                              pcVar26 = local_588;
                              bVar5 = pcVar27[uVar7];
                              uVar28 = (ulong)bVar5;
                              switch(bVar5) {
                              case 0xcc:
                                uVar28 = (ulong)(byte)pcVar25[1];
                                pcVar27 = pcVar25 + 2;
                                break;
                              case 0xcd:
                                pcVar27 = pcVar25 + 3;
                                uVar28 = (ulong)(ushort)(*(ushort *)(pcVar25 + 1) << 8 |
                                                        *(ushort *)(pcVar25 + 1) >> 8);
                                break;
                              case 0xce:
                                uVar7 = *(uint *)(pcVar25 + 1);
                                uVar28 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                                 (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
                                pcVar27 = pcVar25 + 5;
                                break;
                              case 0xcf:
                                uVar28 = *(ulong *)(pcVar25 + 1);
                                uVar28 = uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                                         (uVar28 & 0xff0000000000) >> 0x18 |
                                         (uVar28 & 0xff00000000) >> 8 | (uVar28 & 0xff000000) << 8 |
                                         (uVar28 & 0xff0000) << 0x18 | (uVar28 & 0xff00) << 0x28 |
                                         uVar28 << 0x38;
                                pcVar27 = pcVar25 + 9;
                                break;
                              default:
                                if ((char)bVar5 < '\0') goto LAB_001124f1;
                                pcVar27 = pcVar27 + (ulong)uVar7 + 1;
                              }
                              _ok((uint)(uVar28 == 0x141),"mp_decode_uint(&p) == 321",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x464,"decode");
                              local_590 = pcVar27;
                              iVar6 = mp_check(&local_590,pcVar26);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x467,"check");
                              _ok((uint)(mp_type_hint[(byte)*pcVar27] == MP_UINT),
                                  "mp_typeof(*p) == MP_UINT",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x468,"type");
                              bVar5 = *pcVar27;
                              uVar28 = (ulong)bVar5;
                              switch(bVar5) {
                              case 0xcc:
                                uVar28 = (ulong)(byte)pcVar27[1];
                                pcVar25 = pcVar27 + 2;
                                break;
                              case 0xcd:
                                pcVar25 = pcVar27 + 3;
                                uVar28 = (ulong)(ushort)(*(ushort *)(pcVar27 + 1) << 8 |
                                                        *(ushort *)(pcVar27 + 1) >> 8);
                                break;
                              case 0xce:
                                uVar7 = *(uint *)(pcVar27 + 1);
                                uVar28 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                                 (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
                                pcVar25 = pcVar27 + 5;
                                break;
                              case 0xcf:
                                uVar28 = *(ulong *)(pcVar27 + 1);
                                uVar28 = uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                                         (uVar28 & 0xff0000000000) >> 0x18 |
                                         (uVar28 & 0xff00000000) >> 8 | (uVar28 & 0xff000000) << 8 |
                                         (uVar28 & 0xff0000) << 0x18 | (uVar28 & 0xff00) << 0x28 |
                                         uVar28 << 0x38;
                                pcVar25 = pcVar27 + 9;
                                break;
                              default:
                                if ((char)bVar5 < '\0') goto LAB_001124f6;
                                pcVar25 = pcVar27 + 1;
                              }
                              _ok((uint)(uVar28 == 4),"mp_decode_uint(&p) == 4",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x469,"decode");
                              local_590 = pcVar25;
                              iVar6 = mp_check(&local_590,pcVar26);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x46c,"check");
                              _ok((uint)(mp_type_hint[(byte)*pcVar25] == MP_UINT),
                                  "mp_typeof(*p) == MP_UINT",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x46d,"type");
                              bVar5 = *pcVar25;
                              uVar28 = (ulong)bVar5;
                              switch(bVar5) {
                              case 0xcc:
                                uVar28 = (ulong)(byte)pcVar25[1];
                                pcVar27 = pcVar25 + 2;
                                break;
                              case 0xcd:
                                pcVar27 = pcVar25 + 3;
                                uVar28 = (ulong)(ushort)(*(ushort *)(pcVar25 + 1) << 8 |
                                                        *(ushort *)(pcVar25 + 1) >> 8);
                                break;
                              case 0xce:
                                uVar7 = *(uint *)(pcVar25 + 1);
                                uVar28 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                                 (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
                                pcVar27 = pcVar25 + 5;
                                break;
                              case 0xcf:
                                uVar28 = *(ulong *)(pcVar25 + 1);
                                uVar28 = uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                                         (uVar28 & 0xff0000000000) >> 0x18 |
                                         (uVar28 & 0xff00000000) >> 8 | (uVar28 & 0xff000000) << 8 |
                                         (uVar28 & 0xff0000) << 0x18 | (uVar28 & 0xff00) << 0x28 |
                                         uVar28 << 0x38;
                                pcVar27 = pcVar25 + 9;
                                break;
                              default:
                                if ((char)bVar5 < '\0') goto LAB_001124fb;
                                pcVar27 = pcVar25 + 1;
                              }
                              _ok((uint)(uVar28 == 5),"mp_decode_uint(&p) == 5",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x46e,"decode");
                              local_590 = pcVar27;
                              iVar6 = mp_check(&local_590,pcVar26);
                              _ok((uint)(iVar6 == 0),"mp_check(&c, e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x471,"check");
                              _ok((uint)(mp_type_hint[(byte)*pcVar27] == MP_UINT),
                                  "mp_typeof(*p) == MP_UINT",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x472,"type");
                              bVar5 = *pcVar27;
                              uVar28 = (ulong)bVar5;
                              switch(bVar5) {
                              case 0xcc:
                                uVar28 = (ulong)(byte)pcVar27[1];
                                pcVar25 = pcVar27 + 2;
                                break;
                              case 0xcd:
                                pcVar25 = pcVar27 + 3;
                                uVar28 = (ulong)(ushort)(*(ushort *)(pcVar27 + 1) << 8 |
                                                        *(ushort *)(pcVar27 + 1) >> 8);
                                break;
                              case 0xce:
                                uVar7 = *(uint *)(pcVar27 + 1);
                                uVar28 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                                 (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
                                pcVar25 = pcVar27 + 5;
                                break;
                              case 0xcf:
                                uVar28 = *(ulong *)(pcVar27 + 1);
                                uVar28 = uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                                         (uVar28 & 0xff0000000000) >> 0x18 |
                                         (uVar28 & 0xff00000000) >> 8 | (uVar28 & 0xff000000) << 8 |
                                         (uVar28 & 0xff0000) << 0x18 | (uVar28 & 0xff00) << 0x28 |
                                         uVar28 << 0x38;
                                pcVar25 = pcVar27 + 9;
                                break;
                              default:
                                if ((char)bVar5 < '\0') goto LAB_00112500;
                                pcVar25 = pcVar27 + 1;
                              }
                              _ok((uint)(uVar28 == 6),"mp_decode_uint(&p) == 6",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x473,"decode");
                              _ok((uint)(pcVar25 == pcVar26),"p == e",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x475,"nothing more");
                              _ok((uint)(local_578 < 0x46),"sz < 70",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x477,"no magic detected");
                              uVar28 = 0xffffffffffffffff;
                              uVar11 = 0;
                              do {
                                memset(mp_nums_a,0,0x400);
                                sVar14 = mp_format(mp_nums_a[0],uVar11,
                                                                                                      
                                                  "%d NIL [%d %b %b] this is test[%d %%%% [[ %d {%s %f %%  %.*s %lf %.*s NIL}%p %d %.*p ]] %d%d%d]"
                                                  ,0x3fb999999999999a,0x3fc999999999999a,0,1,1,0,
                                                  0xffffffffffffffff,2,"flt",6,"double#ignored",0,
                                                  "ignore",&d4,3,0x14,&local_458,4,5,6);
                                _ok((uint)(sVar14 == local_578),"test_sz == sz",
                                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                    ,0x47c,"return value on step %d",uVar11 & 0xffffffff);
                                bVar30 = true;
                                uVar15 = uVar28;
                                do {
                                  if (bVar30) {
                                    bVar30 = mp_nums_a[0][uVar15 + 1] == '\0';
                                  }
                                  else {
                                    bVar30 = false;
                                  }
                                  uVar15 = uVar15 + 1;
                                } while (uVar15 < 0x3ff);
                                _ok((uint)bVar30,"all_zero",
                                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                    ,0x480,"buffer overflow on step %d",uVar11 & 0xffffffff);
                                uVar11 = uVar11 + 1;
                                uVar28 = uVar28 + 1;
                              } while (uVar11 != 0x47);
                              _space((FILE *)_stdout);
                              printf("# *** %s: done ***\n","test_format");
                              check_plan();
                              test_mp_print();
                              _plan(5,true);
                              _space((FILE *)_stdout);
                              printf("# *** %s ***\n","test_mp_print_ext");
                              uVar4 = buf._16_4_;
                              buf[0xc] = 't';
                              buf[0xb] = 's';
                              buf[10] = '-';
                              buf[9] = 'n';
                              buf[8] = 'i';
                              buf[7] = 'a';
                              buf[6] = 'l';
                              buf[5] = 'p';
                              buf[0xe] = -0x39;
                              buf[0xf] = '\n';
                              buf[0xd] = 'r';
                              buf[4] = '\0';
                              buf[3] = '\t';
                              buf[2] = -0x39;
                              buf[1] = 'd';
                              buf[0] = -0x6c;
                              mp_snprint_ext = mp_snprint_ext_test;
                              mp_fprint_ext = mp_fprint_ext_test;
                              buf[0x10] = '\x01';
                              buf[0x11] = -0x57;
                              buf._16_4_ = uVar4;
                              buf[0x1a] = 'r';
                              iVar6 = mp_snprint((char *)0x0,0,buf);
                              iVar9 = mp_snprint(str,0x3fff5,buf);
                              _ok((uint)(iVar6 == iVar9),"size == real_size",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x537,"mp_snrpint size match");
                              iVar9 = bcmp(str,"[100, plain-str, \"plain-str\", 200]",0x23);
                              _ok((uint)(iVar9 == 0),"strcmp(str, expected) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x539,"str is correct");
                              __stream = tmpfile();
                              if (__stream == (FILE *)0x0) {
                                abort();
                              }
                              iVar9 = mp_fprint((FILE *)__stream,buf);
                              _ok((uint)(iVar6 == iVar9),"size == real_size",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x53f,"mp_fprint size match");
                              rewind(__stream);
                              sVar16 = fread(str,1,0x3fff5,__stream);
                              _ok((uint)(iVar6 == (int)sVar16),"real_size == size",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x542,"mp_fprint written correct number of bytes");
                              str[(int)sVar16] = '\0';
                              iVar6 = bcmp(str,"[100, plain-str, \"plain-str\", 200]",0x23);
                              _ok((uint)(iVar6 == 0),"strcmp(str, expected) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x544,"str is correct");
                              fclose(__stream);
                              mp_snprint_ext = mp_snprint_ext_default;
                              mp_fprint_ext = mp_fprint_ext_default;
                              _space((FILE *)_stdout);
                              printf("# *** %s: done ***\n","test_mp_print_ext");
                              check_plan();
                              test_mp_check();
                              _plan(0xb,true);
                              _space((FILE *)_stdout);
                              printf("# *** %s ***\n","test_mp_check_exact");
                              d4 = anon_var_dwarf_110a + 0x12;
                              iVar6 = mp_check(&d4,anon_var_dwarf_110a + 0x12);
                              iVar9 = 1;
                              if ((iVar6 == 0) && (iVar9 = 0, d4 != anon_var_dwarf_110a + 0x12)) {
                                mp_nums_a[0][0] = '\x03';
                                mp_nums_a[0][1] = '\0';
                                mp_nums_a[0][2] = '\0';
                                mp_nums_a[0][3] = '\0';
                                mp_nums_a[0][8] = -0x30;
                                mp_nums_a[0][9] = '/';
                                mp_nums_a[0][10] = '\x14';
                                mp_nums_a[0][0xb] = '\0';
                                mp_nums_a[0][0xc] = '\0';
                                mp_nums_a[0][0xd] = '\0';
                                mp_nums_a[0][0xe] = '\0';
                                mp_nums_a[0][0xf] = '\0';
                                mp_nums_a[1]._0_8_ = (long)anon_var_dwarf_110a + 0x12;
                                mp_nums_a[1]._8_8_ = d4;
                                (*mp_check_on_error)((mp_check_error *)mp_nums_a);
                                iVar9 = 1;
                              }
                              iVar21 = 0;
                              _ok(iVar9,"mp_check_exact(&p, p + sizeof(\"\") - 1) != 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x5f6,"empty");
                              d4 = anon_var_dwarf_7831;
                              iVar6 = mp_check(&d4,anon_var_dwarf_7831 + 3);
                              if (iVar6 == 0) {
                                if (d4 != anon_var_dwarf_7831 + 3) {
                                  mp_nums_a[0][0] = '\x03';
                                  mp_nums_a[0][1] = '\0';
                                  mp_nums_a[0][2] = '\0';
                                  mp_nums_a[0][3] = '\0';
                                  mp_nums_a[0][8] = -0x7f;
                                  mp_nums_a[0][9] = '!';
                                  mp_nums_a[0][10] = '\x15';
                                  mp_nums_a[0][0xb] = '\0';
                                  mp_nums_a[0][0xc] = '\0';
                                  mp_nums_a[0][0xd] = '\0';
                                  mp_nums_a[0][0xe] = '\0';
                                  mp_nums_a[0][0xf] = '\0';
                                  mp_nums_a[1]._0_8_ = (long)anon_var_dwarf_7831 + 3;
                                  mp_nums_a[1]._8_8_ = d4;
                                  (*mp_check_on_error)((mp_check_error *)mp_nums_a);
                                  goto LAB_001119c3;
                                }
                              }
                              else {
LAB_001119c3:
                                iVar21 = 1;
                              }
                              _ok(iVar21,
                                  "mp_check_exact(&p, p + sizeof(\"\\x92\\xc0\\xc1\") - 1) != 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x5f7,"ill");
                              d4 = anon_var_dwarf_8605 + 3;
                              iVar6 = mp_check(&d4,anon_var_dwarf_8605 + 4);
                              iVar9 = 1;
                              if ((iVar6 == 0) && (iVar9 = 0, d4 != anon_var_dwarf_8605 + 4)) {
                                mp_nums_a[0][0] = '\x03';
                                mp_nums_a[0][1] = '\0';
                                mp_nums_a[0][2] = '\0';
                                mp_nums_a[0][3] = '\0';
                                mp_nums_a[0][8] = -0x46;
                                mp_nums_a[0][9] = 'A';
                                mp_nums_a[0][10] = '\x15';
                                mp_nums_a[0][0xb] = '\0';
                                mp_nums_a[0][0xc] = '\0';
                                mp_nums_a[0][0xd] = '\0';
                                mp_nums_a[0][0xe] = '\0';
                                mp_nums_a[0][0xf] = '\0';
                                mp_nums_a[1]._0_8_ = (long)anon_var_dwarf_8605 + 4;
                                mp_nums_a[1]._8_8_ = d4;
                                (*mp_check_on_error)((mp_check_error *)mp_nums_a);
                                iVar9 = 1;
                              }
                              iVar21 = 0;
                              _ok(iVar9,"mp_check_exact(&p, p + sizeof(\"\\x92\") - 1) != 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x5f9,"trunc 1");
                              d4 = anon_var_dwarf_7879;
                              iVar6 = mp_check(&d4,anon_var_dwarf_7879 + 2);
                              if (iVar6 == 0) {
                                if (d4 != anon_var_dwarf_7879 + 2) {
                                  mp_nums_a[0][0] = '\x03';
                                  mp_nums_a[0][1] = '\0';
                                  mp_nums_a[0][2] = '\0';
                                  mp_nums_a[0][3] = '\0';
                                  mp_nums_a[0][8] = -0xb;
                                  mp_nums_a[0][9] = '!';
                                  mp_nums_a[0][10] = '\x15';
                                  mp_nums_a[0][0xb] = '\0';
                                  mp_nums_a[0][0xc] = '\0';
                                  mp_nums_a[0][0xd] = '\0';
                                  mp_nums_a[0][0xe] = '\0';
                                  mp_nums_a[0][0xf] = '\0';
                                  mp_nums_a[1]._0_8_ = (long)anon_var_dwarf_7879 + 2;
                                  mp_nums_a[1]._8_8_ = d4;
                                  (*mp_check_on_error)((mp_check_error *)mp_nums_a);
                                  goto LAB_00111abb;
                                }
                              }
                              else {
LAB_00111abb:
                                iVar21 = 1;
                              }
                              _ok(iVar21,"mp_check_exact(&p, p + sizeof(\"\\x92\\xc0\") - 1) != 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x5fa,"trunc 2");
                              d4 = anon_var_dwarf_789d;
                              iVar6 = mp_check(&d4,anon_var_dwarf_789d + 3);
                              iVar9 = 1;
                              if ((iVar6 == 0) && (iVar9 = 0, d4 != anon_var_dwarf_789d + 3)) {
                                mp_nums_a[0][0] = '\x03';
                                mp_nums_a[0][1] = '\0';
                                mp_nums_a[0][2] = '\0';
                                mp_nums_a[0][3] = '\0';
                                builtin_strncpy(mp_nums_a[0],"4\"\x15",4);
                                mp_nums_a[0][0xc] = '\0';
                                mp_nums_a[0][0xd] = '\0';
                                mp_nums_a[0][0xe] = '\0';
                                mp_nums_a[0][0xf] = '\0';
                                mp_nums_a[1]._0_8_ = (long)anon_var_dwarf_789d + 3;
                                mp_nums_a[1]._8_8_ = d4;
                                (*mp_check_on_error)((mp_check_error *)mp_nums_a);
                                iVar9 = 1;
                              }
                              iVar21 = 0;
                              _ok(iVar9,
                                  "mp_check_exact(&p, p + sizeof(\"\\x93\\xc0\\xc0\") - 1) != 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x5fb,"trunc 3");
                              d4 = anon_var_dwarf_7915 + 3;
                              iVar6 = mp_check(&d4,anon_var_dwarf_7915 + 5);
                              if (iVar6 == 0) {
                                if (d4 == anon_var_dwarf_7915 + 5) goto LAB_00111bb8;
                                mp_nums_a[0][0] = '\x03';
                                mp_nums_a[0][1] = '\0';
                                mp_nums_a[0][2] = '\0';
                                mp_nums_a[0][3] = '\0';
                                mp_nums_a[0][8] = -2;
                                mp_nums_a[0][9] = '\"';
                                mp_nums_a[0][10] = '\x15';
                                mp_nums_a[0][0xb] = '\0';
                                mp_nums_a[0][0xc] = '\0';
                                mp_nums_a[0][0xd] = '\0';
                                mp_nums_a[0][0xe] = '\0';
                                mp_nums_a[0][0xf] = '\0';
                                mp_nums_a[1]._0_8_ = (long)anon_var_dwarf_7915 + 5;
                                mp_nums_a[1]._8_8_ = d4;
                                (*mp_check_on_error)((mp_check_error *)mp_nums_a);
                              }
                              iVar21 = 1;
LAB_00111bb8:
                              _ok(iVar21,"mp_check_exact(&p, p + sizeof(\"\\xc0\\xc0\") - 1) != 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x5fd,"junk 1");
                              d4 = anon_var_dwarf_78e5;
                              iVar6 = mp_check(&d4,anon_var_dwarf_78e5 + 4);
                              iVar9 = 1;
                              iVar21 = 1;
                              if ((iVar6 == 0) && (iVar21 = 0, d4 != anon_var_dwarf_78e5 + 4)) {
                                mp_nums_a[0][0] = '\x03';
                                mp_nums_a[0][1] = '\0';
                                mp_nums_a[0][2] = '\0';
                                mp_nums_a[0][3] = '\0';
                                mp_nums_a[0][8] = -0x4d;
                                mp_nums_a[0][9] = '\"';
                                mp_nums_a[0][10] = '\x15';
                                mp_nums_a[0][0xb] = '\0';
                                mp_nums_a[0][0xc] = '\0';
                                mp_nums_a[0][0xd] = '\0';
                                mp_nums_a[0][0xe] = '\0';
                                mp_nums_a[0][0xf] = '\0';
                                mp_nums_a[1]._0_8_ = (long)anon_var_dwarf_78e5 + 4;
                                mp_nums_a[1]._8_8_ = d4;
                                (*mp_check_on_error)((mp_check_error *)mp_nums_a);
                                iVar21 = 1;
                              }
                              _ok(iVar21,
                                  "mp_check_exact(&p, p + sizeof(\"\\x92\\xc0\\xc0\\xc0\") - 1) != 0"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x5fe,"junk 2");
                              d4 = anon_var_dwarf_7915;
                              iVar6 = mp_check(&d4,anon_var_dwarf_7915 + 5);
                              if (iVar6 == 0) {
                                if (d4 == anon_var_dwarf_7915 + 5) {
                                  iVar9 = 0;
                                }
                                else {
                                  mp_nums_a[0][0] = '\x03';
                                  mp_nums_a[0][1] = '\0';
                                  mp_nums_a[0][2] = '\0';
                                  mp_nums_a[0][3] = '\0';
                                  mp_nums_a[0][8] = -5;
                                  mp_nums_a[0][9] = '\"';
                                  mp_nums_a[0][10] = '\x15';
                                  mp_nums_a[0][0xb] = '\0';
                                  mp_nums_a[0][0xc] = '\0';
                                  mp_nums_a[0][0xd] = '\0';
                                  mp_nums_a[0][0xe] = '\0';
                                  mp_nums_a[0][0xf] = '\0';
                                  mp_nums_a[1]._0_8_ = (long)anon_var_dwarf_7915 + 5;
                                  mp_nums_a[1]._8_8_ = d4;
                                  (*mp_check_on_error)((mp_check_error *)mp_nums_a);
                                }
                              }
                              _ok(iVar9,
                                  "mp_check_exact(&p, p + sizeof(\"\\x92\\xc0\\x91\\xc0\\xc0\") - 1) != 0"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x5ff,"junk 3");
                              d4 = anon_var_dwarf_8599 + 2;
                              iVar9 = mp_check(&d4,anon_var_dwarf_8599 + 3);
                              iVar6 = 0;
                              if (iVar9 == 0) {
                                if (d4 == anon_var_dwarf_8599 + 3) {
                                  iVar6 = 1;
                                }
                                else {
                                  mp_nums_a[0][0] = '\x03';
                                  mp_nums_a[0][1] = '\0';
                                  mp_nums_a[0][2] = '\0';
                                  mp_nums_a[0][3] = '\0';
                                  mp_nums_a[0][8] = -0x34;
                                  mp_nums_a[0][9] = '@';
                                  mp_nums_a[0][10] = '\x15';
                                  mp_nums_a[0][0xb] = '\0';
                                  mp_nums_a[0][0xc] = '\0';
                                  mp_nums_a[0][0xd] = '\0';
                                  mp_nums_a[0][0xe] = '\0';
                                  mp_nums_a[0][0xf] = '\0';
                                  mp_nums_a[1]._0_8_ = (long)anon_var_dwarf_8599 + 3;
                                  mp_nums_a[1]._8_8_ = d4;
                                  (*mp_check_on_error)((mp_check_error *)mp_nums_a);
                                  iVar6 = 0;
                                }
                              }
                              iVar9 = 0;
                              _ok(iVar6,"mp_check_exact(&p, p + sizeof(\"\\xc0\") - 1) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x601,"valid 1");
                              d4 = anon_var_dwarf_798d + 2;
                              iVar6 = mp_check(&d4,anon_var_dwarf_798d + 4);
                              iVar21 = 0;
                              if (iVar6 == 0) {
                                if (d4 == anon_var_dwarf_798d + 4) {
                                  iVar21 = 1;
                                }
                                else {
                                  mp_nums_a[0][0] = '\x03';
                                  mp_nums_a[0][1] = '\0';
                                  mp_nums_a[0][2] = '\0';
                                  mp_nums_a[0][3] = '\0';
                                  mp_nums_a[0][8] = -0x42;
                                  mp_nums_a[0][9] = '#';
                                  mp_nums_a[0][10] = '\x15';
                                  mp_nums_a[0][0xb] = '\0';
                                  mp_nums_a[0][0xc] = '\0';
                                  mp_nums_a[0][0xd] = '\0';
                                  mp_nums_a[0][0xe] = '\0';
                                  mp_nums_a[0][0xf] = '\0';
                                  mp_nums_a[1]._0_8_ = (long)anon_var_dwarf_798d + 4;
                                  mp_nums_a[1]._8_8_ = d4;
                                  (*mp_check_on_error)((mp_check_error *)mp_nums_a);
                                  iVar21 = 0;
                                }
                              }
                              _ok(iVar21,"mp_check_exact(&p, p + sizeof(\"\\x91\\xc0\") - 1) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x602,"valid 2");
                              d4 = anon_var_dwarf_798d;
                              iVar6 = mp_check(&d4,anon_var_dwarf_798d + 4);
                              if (iVar6 == 0) {
                                if (d4 == anon_var_dwarf_798d + 4) {
                                  iVar9 = 1;
                                }
                                else {
                                  mp_nums_a[0][0] = '\x03';
                                  mp_nums_a[0][1] = '\0';
                                  mp_nums_a[0][2] = '\0';
                                  mp_nums_a[0][3] = '\0';
                                  mp_nums_a[0][8] = -0x44;
                                  mp_nums_a[0][9] = '#';
                                  mp_nums_a[0][10] = '\x15';
                                  mp_nums_a[0][0xb] = '\0';
                                  mp_nums_a[0][0xc] = '\0';
                                  mp_nums_a[0][0xd] = '\0';
                                  mp_nums_a[0][0xe] = '\0';
                                  mp_nums_a[0][0xf] = '\0';
                                  mp_nums_a[1]._0_8_ = (long)anon_var_dwarf_798d + 4;
                                  mp_nums_a[1]._8_8_ = d4;
                                  (*mp_check_on_error)((mp_check_error *)mp_nums_a);
                                }
                              }
                              _ok(iVar9,
                                  "mp_check_exact(&p, p + sizeof(\"\\x92\\xc0\\x91\\xc0\") - 1) == 0"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x603,"valid 3");
                              _space((FILE *)_stdout);
                              printf("# *** %s: done ***\n","test_mp_check_exact");
                              check_plan();
                              test_mp_check_ext_data();
                              test_mp_check_error();
                              test_mp_read_typed();
                              _plan(5,true);
                              _space((FILE *)_stdout);
                              printf("# *** %s ***\n","test_overflow");
                              mp_nums_a[0][0] = '!';
                              mp_nums_a[0][1] = -0x4f;
                              mp_nums_a[0][2] = '\x15';
                              mp_nums_a[0][3] = '\0';
                              mp_nums_a[0][4] = '\0';
                              mp_nums_a[0][5] = '\0';
                              mp_nums_a[0][6] = '\0';
                              mp_nums_a[0][7] = '\0';
                              buf[1] = -0x6f;
                              buf[2] = -0x23;
                              buf[3] = -1;
                              buf[4] = -1;
                              buf[5] = -1;
                              buf[6] = -1;
                              iVar6 = mp_check((char **)mp_nums_a,buf + 7);
                              _ok((uint)(iVar6 == 1),"mp_check(&chk, d) == 1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x7de,"mp_check array overflow");
                              mp_nums_a[0][0] = '!';
                              mp_nums_a[0][1] = -0x4f;
                              mp_nums_a[0][2] = '\x15';
                              mp_nums_a[0][3] = '\0';
                              mp_nums_a[0][4] = '\0';
                              mp_nums_a[0][5] = '\0';
                              mp_nums_a[0][6] = '\0';
                              mp_nums_a[0][7] = '\0';
                              buf[1] = -0x6f;
                              buf[2] = -0x21;
                              buf[3] = -1;
                              buf[4] = -1;
                              buf[5] = -1;
                              buf[6] = -1;
                              iVar6 = mp_check((char **)mp_nums_a,buf + 7);
                              _ok((uint)(iVar6 == 1),"mp_check(&chk, d) == 1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x7e4,"mp_check map overflow");
                              mp_nums_a[0][0] = '!';
                              mp_nums_a[0][1] = -0x4f;
                              mp_nums_a[0][2] = '\x15';
                              mp_nums_a[0][3] = '\0';
                              mp_nums_a[0][4] = '\0';
                              mp_nums_a[0][5] = '\0';
                              mp_nums_a[0][6] = '\0';
                              mp_nums_a[0][7] = '\0';
                              buf[1] = -0x6e;
                              buf[2] = -0x60;
                              buf[3] = -0x25;
                              buf[4] = -1;
                              buf[5] = -1;
                              buf[6] = -1;
                              buf[7] = -1;
                              iVar6 = mp_check((char **)mp_nums_a,buf + 8);
                              _ok((uint)(iVar6 == 1),"mp_check(&chk, d) == 1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x7eb,"mp_check str overflow");
                              mp_nums_a[0][0] = '!';
                              mp_nums_a[0][1] = -0x4f;
                              mp_nums_a[0][2] = '\x15';
                              mp_nums_a[0][3] = '\0';
                              mp_nums_a[0][4] = '\0';
                              mp_nums_a[0][5] = '\0';
                              mp_nums_a[0][6] = '\0';
                              mp_nums_a[0][7] = '\0';
                              buf[1] = -0x6e;
                              buf[2] = -0x3c;
                              buf[3] = '\0';
                              buf[4] = -0x3a;
                              buf[5] = -1;
                              buf[6] = -1;
                              buf[7] = -1;
                              buf[8] = -1;
                              iVar6 = mp_check((char **)mp_nums_a,buf + 9);
                              _ok((uint)(iVar6 == 1),"mp_check(&chk, d) == 1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x7f2,"mp_check bin overflow");
                              mp_nums_a[0][0] = '!';
                              mp_nums_a[0][1] = -0x4f;
                              mp_nums_a[0][2] = '\x15';
                              mp_nums_a[0][3] = '\0';
                              mp_nums_a[0][4] = '\0';
                              mp_nums_a[0][5] = '\0';
                              mp_nums_a[0][6] = '\0';
                              mp_nums_a[0][7] = '\0';
                              buf[1] = -0x6e;
                              buf[2] = -0x60;
                              buf[3] = -0x25;
                              buf[4] = -1;
                              buf[5] = -1;
                              buf[6] = -1;
                              buf[7] = -1;
                              iVar6 = mp_check((char **)mp_nums_a,buf + 8);
                              _ok((uint)(iVar6 == 1),"mp_check(&chk, d) == 1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x7f9,"mp_check str overflow");
                              _space((FILE *)_stdout);
                              printf("# *** %s: done ***\n","test_overflow");
                              check_plan();
                              _space((FILE *)_stdout);
                              printf("# *** %s: done ***\n","main");
                              iVar6 = check_plan();
                              return iVar6;
                            }
                          } while( true );
                        }
                        if (buf[1] == -0x21) {
                          uVar7 = (uint)(CONCAT13(buf[5],CONCAT12(buf[4],CONCAT11(buf[3],buf[2])))
                                        == -1);
                          iVar6 = 1;
                          goto LAB_0010f034;
                        }
                        uVar7 = 0;
                        if (buf[1] < -0x70) goto LAB_0010f034;
                      }
                      else {
                        if (uVar7 == 0xde) {
                          uVar7 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]
                                                );
                          iVar6 = 0;
                          goto LAB_0010e305;
                        }
                        if (buf[1] < -0x70) {
                          uVar7 = uVar7 & 0xf;
                          iVar6 = 1;
                          goto LAB_0010e305;
                        }
                        main_cold_33();
LAB_00112451:
                        main_cold_32();
LAB_00112456:
                        main_cold_31();
LAB_0011245b:
                        main_cold_30();
LAB_00112460:
                        main_cold_29();
LAB_00112465:
                        main_cold_28();
LAB_0011246a:
                        main_cold_27();
LAB_0011246f:
                        main_cold_26();
                      }
                      main_cold_25();
LAB_00112479:
                      main_cold_18();
                      goto LAB_0011247e;
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_00112581;
    }
  }
LAB_00112562:
  __assert_fail("c >= 0xc4 && c <= 0xc6",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                ,0xa42,"ptrdiff_t mp_check_binl(const char *, const char *)");
}

Assistant:

int main()
{
	plan(27);
	header();

	test_uints();
	test_ints();
	test_bools();
	test_floats();
	test_doubles();
	test_nils();
	test_strls();
	test_binls();
	test_extls();
	test_strs();
	test_bins();
	test_exts();
	test_arrays();
	test_maps();
	test_memcpy();
	test_next_on_arrays();
	test_next_on_maps();
	test_compare_uints();
	test_format();
	test_mp_print();
	test_mp_print_ext();
	test_mp_check();
	test_mp_check_exact();
	test_mp_check_ext_data();
	test_mp_check_error();
	test_mp_read_typed();
	test_overflow();

	footer();
	return check_plan();
}